

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined4 uVar10;
  Primitive PVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  long lVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  uint uVar130;
  int iVar131;
  ulong uVar132;
  RTCIntersectArguments *pRVar133;
  uint uVar134;
  long lVar135;
  bool bVar136;
  long lVar137;
  ulong uVar138;
  Geometry *geometry;
  long lVar139;
  float fVar158;
  float fVar159;
  vint4 bi_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar160;
  float fVar164;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  float fVar165;
  float fVar180;
  float fVar181;
  vint4 bi_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar182;
  undefined1 auVar179 [64];
  float fVar183;
  float fVar197;
  float fVar198;
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  float fVar199;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar200;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar201;
  float fVar217;
  float fVar219;
  vint4 ai_1;
  undefined1 auVar202 [16];
  float fVar221;
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar218;
  float fVar223;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar204 [16];
  float fVar224;
  float fVar226;
  float fVar228;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar220;
  float fVar222;
  float fVar225;
  float fVar227;
  float fVar229;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  float fVar230;
  float fVar243;
  float fVar246;
  vint4 ai_2;
  undefined1 auVar233 [16];
  float fVar249;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar236 [16];
  float fVar244;
  float fVar245;
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar251;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar252;
  undefined1 auVar242 [64];
  float fVar253;
  float fVar261;
  float fVar262;
  undefined1 auVar254 [16];
  float fVar263;
  undefined1 auVar255 [32];
  float fVar264;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar272;
  undefined1 auVar271 [32];
  float fVar273;
  float fVar282;
  float fVar283;
  vint4 ai;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar284;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar289;
  float fVar290;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar287 [32];
  float fVar291;
  float fVar292;
  float fVar295;
  float fVar299;
  undefined1 auVar288 [32];
  float fVar300;
  float fVar307;
  float fVar308;
  undefined1 auVar301 [16];
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar302 [32];
  float fVar315;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar309;
  undefined1 auVar306 [64];
  float fVar316;
  float fVar322;
  float fVar323;
  undefined1 auVar317 [16];
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar318 [32];
  float fVar324;
  float fVar325;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar329;
  float fVar333;
  undefined1 auVar330 [16];
  float fVar334;
  undefined1 auVar331 [32];
  undefined1 auVar332 [64];
  float fVar335;
  float fVar345;
  float fVar346;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar347;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [64];
  float fVar348;
  float fVar349;
  float fVar353;
  float fVar355;
  undefined1 auVar350 [16];
  float fVar354;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 auVar363 [32];
  float fVar368;
  float fVar371;
  float fVar372;
  float fVar373;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_92d;
  uint local_900;
  uint uStack_8fc;
  uint uStack_8f8;
  uint uStack_8f4;
  uint uStack_8f0;
  uint uStack_8ec;
  uint uStack_8e8;
  uint uStack_8e4;
  uint local_8e0;
  undefined4 uStack_8dc;
  undefined1 local_8a0 [8];
  undefined8 uStack_898;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880;
  undefined1 auStack_87c [8];
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  undefined8 uStack_838;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  ulong local_800;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 *local_750;
  undefined1 (*local_748) [16];
  undefined1 (*local_740) [32];
  Precalculations *local_738;
  RTCFilterFunctionNArguments local_730;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 auStack_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  LinearSpace3fa *local_630;
  Primitive *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined1 local_340 [32];
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  RTCHitN local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar362 [16];
  
  PVar11 = prim[1];
  uVar132 = (ulong)(byte)PVar11;
  lVar19 = uVar132 * 0x25;
  auVar190 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar190 = vinsertps_avx(auVar190,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar207 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar207 = vinsertps_avx(auVar207,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar329 = *(float *)(prim + lVar19 + 0x12);
  auVar190 = vsubps_avx(auVar190,*(undefined1 (*) [16])(prim + lVar19 + 6));
  auVar166._0_4_ = fVar329 * auVar190._0_4_;
  auVar166._4_4_ = fVar329 * auVar190._4_4_;
  auVar166._8_4_ = fVar329 * auVar190._8_4_;
  auVar166._12_4_ = fVar329 * auVar190._12_4_;
  auVar274._0_4_ = fVar329 * auVar207._0_4_;
  auVar274._4_4_ = fVar329 * auVar207._4_4_;
  auVar274._8_4_ = fVar329 * auVar207._8_4_;
  auVar274._12_4_ = fVar329 * auVar207._12_4_;
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 * 4 + 6)));
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 * 5 + 6)));
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 * 6 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 * 0xf + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar206 = vcvtdq2ps_avx(auVar206);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar132 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 * 0x1a + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 * 0x1b + 6)));
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vshufps_avx(auVar274,auVar274,0);
  auVar25 = vshufps_avx(auVar274,auVar274,0x55);
  auVar26 = vshufps_avx(auVar274,auVar274,0xaa);
  fVar329 = auVar26._0_4_;
  fVar218 = auVar26._4_4_;
  fVar333 = auVar26._8_4_;
  fVar223 = auVar26._12_4_;
  fVar230 = auVar25._0_4_;
  fVar243 = auVar25._4_4_;
  fVar246 = auVar25._8_4_;
  fVar249 = auVar25._12_4_;
  fVar201 = auVar24._0_4_;
  fVar217 = auVar24._4_4_;
  fVar219 = auVar24._8_4_;
  fVar221 = auVar24._12_4_;
  auVar336._0_4_ = fVar201 * auVar190._0_4_ + fVar230 * auVar207._0_4_ + fVar329 * auVar21._0_4_;
  auVar336._4_4_ = fVar217 * auVar190._4_4_ + fVar243 * auVar207._4_4_ + fVar218 * auVar21._4_4_;
  auVar336._8_4_ = fVar219 * auVar190._8_4_ + fVar246 * auVar207._8_4_ + fVar333 * auVar21._8_4_;
  auVar336._12_4_ = fVar221 * auVar190._12_4_ + fVar249 * auVar207._12_4_ + fVar223 * auVar21._12_4_
  ;
  auVar350._0_4_ = fVar201 * auVar188._0_4_ + fVar230 * auVar206._0_4_ + auVar208._0_4_ * fVar329;
  auVar350._4_4_ = fVar217 * auVar188._4_4_ + fVar243 * auVar206._4_4_ + auVar208._4_4_ * fVar218;
  auVar350._8_4_ = fVar219 * auVar188._8_4_ + fVar246 * auVar206._8_4_ + auVar208._8_4_ * fVar333;
  auVar350._12_4_ =
       fVar221 * auVar188._12_4_ + fVar249 * auVar206._12_4_ + auVar208._12_4_ * fVar223;
  auVar275._0_4_ = fVar201 * auVar209._0_4_ + fVar230 * auVar22._0_4_ + auVar23._0_4_ * fVar329;
  auVar275._4_4_ = fVar217 * auVar209._4_4_ + fVar243 * auVar22._4_4_ + auVar23._4_4_ * fVar218;
  auVar275._8_4_ = fVar219 * auVar209._8_4_ + fVar246 * auVar22._8_4_ + auVar23._8_4_ * fVar333;
  auVar275._12_4_ = fVar221 * auVar209._12_4_ + fVar249 * auVar22._12_4_ + auVar23._12_4_ * fVar223;
  auVar24 = vshufps_avx(auVar166,auVar166,0);
  auVar25 = vshufps_avx(auVar166,auVar166,0x55);
  auVar26 = vshufps_avx(auVar166,auVar166,0xaa);
  fVar329 = auVar26._0_4_;
  fVar218 = auVar26._4_4_;
  fVar333 = auVar26._8_4_;
  fVar223 = auVar26._12_4_;
  fVar230 = auVar25._0_4_;
  fVar243 = auVar25._4_4_;
  fVar246 = auVar25._8_4_;
  fVar249 = auVar25._12_4_;
  fVar201 = auVar24._0_4_;
  fVar217 = auVar24._4_4_;
  fVar219 = auVar24._8_4_;
  fVar221 = auVar24._12_4_;
  auVar184._0_4_ = fVar201 * auVar190._0_4_ + fVar230 * auVar207._0_4_ + fVar329 * auVar21._0_4_;
  auVar184._4_4_ = fVar217 * auVar190._4_4_ + fVar243 * auVar207._4_4_ + fVar218 * auVar21._4_4_;
  auVar184._8_4_ = fVar219 * auVar190._8_4_ + fVar246 * auVar207._8_4_ + fVar333 * auVar21._8_4_;
  auVar184._12_4_ = fVar221 * auVar190._12_4_ + fVar249 * auVar207._12_4_ + fVar223 * auVar21._12_4_
  ;
  auVar167._0_4_ = fVar201 * auVar188._0_4_ + auVar208._0_4_ * fVar329 + fVar230 * auVar206._0_4_;
  auVar167._4_4_ = fVar217 * auVar188._4_4_ + auVar208._4_4_ * fVar218 + fVar243 * auVar206._4_4_;
  auVar167._8_4_ = fVar219 * auVar188._8_4_ + auVar208._8_4_ * fVar333 + fVar246 * auVar206._8_4_;
  auVar167._12_4_ =
       fVar221 * auVar188._12_4_ + auVar208._12_4_ * fVar223 + fVar249 * auVar206._12_4_;
  auVar140._0_4_ = fVar201 * auVar209._0_4_ + fVar230 * auVar22._0_4_ + auVar23._0_4_ * fVar329;
  auVar140._4_4_ = fVar217 * auVar209._4_4_ + fVar243 * auVar22._4_4_ + auVar23._4_4_ * fVar218;
  auVar140._8_4_ = fVar219 * auVar209._8_4_ + fVar246 * auVar22._8_4_ + auVar23._8_4_ * fVar333;
  auVar140._12_4_ = fVar221 * auVar209._12_4_ + fVar249 * auVar22._12_4_ + auVar23._12_4_ * fVar223;
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar190 = vandps_avx(auVar336,auVar265);
  auVar233._8_4_ = 0x219392ef;
  auVar233._0_8_ = 0x219392ef219392ef;
  auVar233._12_4_ = 0x219392ef;
  auVar190 = vcmpps_avx(auVar190,auVar233,1);
  auVar207 = vblendvps_avx(auVar336,auVar233,auVar190);
  auVar190 = vandps_avx(auVar350,auVar265);
  auVar190 = vcmpps_avx(auVar190,auVar233,1);
  auVar21 = vblendvps_avx(auVar350,auVar233,auVar190);
  auVar190 = vandps_avx(auVar275,auVar265);
  auVar190 = vcmpps_avx(auVar190,auVar233,1);
  auVar190 = vblendvps_avx(auVar275,auVar233,auVar190);
  auVar188 = vrcpps_avx(auVar207);
  fVar201 = auVar188._0_4_;
  auVar202._0_4_ = fVar201 * auVar207._0_4_;
  fVar217 = auVar188._4_4_;
  auVar202._4_4_ = fVar217 * auVar207._4_4_;
  fVar219 = auVar188._8_4_;
  auVar202._8_4_ = fVar219 * auVar207._8_4_;
  fVar221 = auVar188._12_4_;
  auVar202._12_4_ = fVar221 * auVar207._12_4_;
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = &DAT_3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar207 = vsubps_avx(auVar276,auVar202);
  fVar201 = fVar201 + fVar201 * auVar207._0_4_;
  fVar217 = fVar217 + fVar217 * auVar207._4_4_;
  fVar219 = fVar219 + fVar219 * auVar207._8_4_;
  fVar221 = fVar221 + fVar221 * auVar207._12_4_;
  auVar207 = vrcpps_avx(auVar21);
  fVar230 = auVar207._0_4_;
  auVar254._0_4_ = fVar230 * auVar21._0_4_;
  fVar243 = auVar207._4_4_;
  auVar254._4_4_ = fVar243 * auVar21._4_4_;
  fVar246 = auVar207._8_4_;
  auVar254._8_4_ = fVar246 * auVar21._8_4_;
  fVar249 = auVar207._12_4_;
  auVar254._12_4_ = fVar249 * auVar21._12_4_;
  auVar207 = vsubps_avx(auVar276,auVar254);
  fVar230 = fVar230 + fVar230 * auVar207._0_4_;
  fVar243 = fVar243 + fVar243 * auVar207._4_4_;
  fVar246 = fVar246 + fVar246 * auVar207._8_4_;
  fVar249 = fVar249 + fVar249 * auVar207._12_4_;
  auVar207 = vrcpps_avx(auVar190);
  fVar253 = auVar207._0_4_;
  auVar266._0_4_ = fVar253 * auVar190._0_4_;
  fVar261 = auVar207._4_4_;
  auVar266._4_4_ = fVar261 * auVar190._4_4_;
  fVar262 = auVar207._8_4_;
  auVar266._8_4_ = fVar262 * auVar190._8_4_;
  fVar263 = auVar207._12_4_;
  auVar266._12_4_ = fVar263 * auVar190._12_4_;
  auVar190 = vsubps_avx(auVar276,auVar266);
  fVar253 = fVar253 + fVar253 * auVar190._0_4_;
  fVar261 = fVar261 + fVar261 * auVar190._4_4_;
  fVar262 = fVar262 + fVar262 * auVar190._8_4_;
  fVar263 = fVar263 + fVar263 * auVar190._12_4_;
  auVar190 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar19 + 0x16)) *
                           *(float *)(prim + lVar19 + 0x1a)));
  auVar21 = vshufps_avx(auVar190,auVar190,0);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar132 * 7 + 6);
  auVar190 = vpmovsxwd_avx(auVar190);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar132 * 0xb + 6);
  auVar207 = vpmovsxwd_avx(auVar207);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar190);
  fVar329 = auVar21._0_4_;
  fVar218 = auVar21._4_4_;
  fVar333 = auVar21._8_4_;
  fVar223 = auVar21._12_4_;
  auVar277._0_4_ = auVar207._0_4_ * fVar329 + auVar190._0_4_;
  auVar277._4_4_ = auVar207._4_4_ * fVar218 + auVar190._4_4_;
  auVar277._8_4_ = auVar207._8_4_ * fVar333 + auVar190._8_4_;
  auVar277._12_4_ = auVar207._12_4_ * fVar223 + auVar190._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar132 * 9 + 6);
  auVar190 = vpmovsxwd_avx(auVar21);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar132 * 0xd + 6);
  auVar207 = vpmovsxwd_avx(auVar188);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar190);
  auVar285._0_4_ = auVar207._0_4_ * fVar329 + auVar190._0_4_;
  auVar285._4_4_ = auVar207._4_4_ * fVar218 + auVar190._4_4_;
  auVar285._8_4_ = auVar207._8_4_ * fVar333 + auVar190._8_4_;
  auVar285._12_4_ = auVar207._12_4_ * fVar223 + auVar190._12_4_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar132 * 0x12 + 6);
  auVar190 = vpmovsxwd_avx(auVar206);
  auVar190 = vcvtdq2ps_avx(auVar190);
  uVar138 = (ulong)(uint)((int)(uVar132 * 5) << 2);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar132 * 2 + uVar138 + 6);
  auVar207 = vpmovsxwd_avx(auVar208);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar190);
  auVar301._0_4_ = auVar207._0_4_ * fVar329 + auVar190._0_4_;
  auVar301._4_4_ = auVar207._4_4_ * fVar218 + auVar190._4_4_;
  auVar301._8_4_ = auVar207._8_4_ * fVar333 + auVar190._8_4_;
  auVar301._12_4_ = auVar207._12_4_ * fVar223 + auVar190._12_4_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar138 + 6);
  auVar190 = vpmovsxwd_avx(auVar209);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar132 * 0x18 + 6);
  auVar207 = vpmovsxwd_avx(auVar22);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar190);
  auVar317._0_4_ = auVar207._0_4_ * fVar329 + auVar190._0_4_;
  auVar317._4_4_ = auVar207._4_4_ * fVar218 + auVar190._4_4_;
  auVar317._8_4_ = auVar207._8_4_ * fVar333 + auVar190._8_4_;
  auVar317._12_4_ = auVar207._12_4_ * fVar223 + auVar190._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar132 * 0x1d + 6);
  auVar190 = vpmovsxwd_avx(auVar23);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar132 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar207 = vpmovsxwd_avx(auVar24);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar21 = vsubps_avx(auVar207,auVar190);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar132) + 6);
  auVar207 = vpmovsxwd_avx(auVar25);
  auVar330._0_4_ = auVar21._0_4_ * fVar329 + auVar190._0_4_;
  auVar330._4_4_ = auVar21._4_4_ * fVar218 + auVar190._4_4_;
  auVar330._8_4_ = auVar21._8_4_ * fVar333 + auVar190._8_4_;
  auVar330._12_4_ = auVar21._12_4_ * fVar223 + auVar190._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar132 * 0x23 + 6);
  auVar21 = vpmovsxwd_avx(auVar26);
  auVar190 = vcvtdq2ps_avx(auVar207);
  auVar207 = vcvtdq2ps_avx(auVar21);
  auVar207 = vsubps_avx(auVar207,auVar190);
  auVar267._0_4_ = auVar190._0_4_ + auVar207._0_4_ * fVar329;
  auVar267._4_4_ = auVar190._4_4_ + auVar207._4_4_ * fVar218;
  auVar267._8_4_ = auVar190._8_4_ + auVar207._8_4_ * fVar333;
  auVar267._12_4_ = auVar190._12_4_ + auVar207._12_4_ * fVar223;
  auVar190 = vsubps_avx(auVar277,auVar184);
  auVar278._0_4_ = fVar201 * auVar190._0_4_;
  auVar278._4_4_ = fVar217 * auVar190._4_4_;
  auVar278._8_4_ = fVar219 * auVar190._8_4_;
  auVar278._12_4_ = fVar221 * auVar190._12_4_;
  auVar190 = vsubps_avx(auVar285,auVar184);
  auVar185._0_4_ = fVar201 * auVar190._0_4_;
  auVar185._4_4_ = fVar217 * auVar190._4_4_;
  auVar185._8_4_ = fVar219 * auVar190._8_4_;
  auVar185._12_4_ = fVar221 * auVar190._12_4_;
  auVar190 = vsubps_avx(auVar301,auVar167);
  auVar203._0_4_ = fVar230 * auVar190._0_4_;
  auVar203._4_4_ = fVar243 * auVar190._4_4_;
  auVar203._8_4_ = fVar246 * auVar190._8_4_;
  auVar203._12_4_ = fVar249 * auVar190._12_4_;
  auVar190 = vsubps_avx(auVar317,auVar167);
  auVar168._0_4_ = fVar230 * auVar190._0_4_;
  auVar168._4_4_ = fVar243 * auVar190._4_4_;
  auVar168._8_4_ = fVar246 * auVar190._8_4_;
  auVar168._12_4_ = fVar249 * auVar190._12_4_;
  auVar190 = vsubps_avx(auVar330,auVar140);
  auVar234._0_4_ = fVar253 * auVar190._0_4_;
  auVar234._4_4_ = fVar261 * auVar190._4_4_;
  auVar234._8_4_ = fVar262 * auVar190._8_4_;
  auVar234._12_4_ = fVar263 * auVar190._12_4_;
  auVar190 = vsubps_avx(auVar267,auVar140);
  auVar141._0_4_ = fVar253 * auVar190._0_4_;
  auVar141._4_4_ = fVar261 * auVar190._4_4_;
  auVar141._8_4_ = fVar262 * auVar190._8_4_;
  auVar141._12_4_ = fVar263 * auVar190._12_4_;
  auVar190 = vpminsd_avx(auVar278,auVar185);
  auVar207 = vpminsd_avx(auVar203,auVar168);
  auVar190 = vmaxps_avx(auVar190,auVar207);
  auVar207 = vpminsd_avx(auVar234,auVar141);
  uVar10 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar286._4_4_ = uVar10;
  auVar286._0_4_ = uVar10;
  auVar286._8_4_ = uVar10;
  auVar286._12_4_ = uVar10;
  auVar207 = vmaxps_avx(auVar207,auVar286);
  auVar190 = vmaxps_avx(auVar190,auVar207);
  local_410._0_4_ = auVar190._0_4_ * 0.99999964;
  local_410._4_4_ = auVar190._4_4_ * 0.99999964;
  local_410._8_4_ = auVar190._8_4_ * 0.99999964;
  local_410._12_4_ = auVar190._12_4_ * 0.99999964;
  auVar190 = vpmaxsd_avx(auVar278,auVar185);
  auVar207 = vpmaxsd_avx(auVar203,auVar168);
  auVar190 = vminps_avx(auVar190,auVar207);
  auVar207 = vpmaxsd_avx(auVar234,auVar141);
  uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar186._4_4_ = uVar10;
  auVar186._0_4_ = uVar10;
  auVar186._8_4_ = uVar10;
  auVar186._12_4_ = uVar10;
  auVar207 = vminps_avx(auVar207,auVar186);
  auVar190 = vminps_avx(auVar190,auVar207);
  auVar142._0_4_ = auVar190._0_4_ * 1.0000004;
  auVar142._4_4_ = auVar190._4_4_ * 1.0000004;
  auVar142._8_4_ = auVar190._8_4_ * 1.0000004;
  auVar142._12_4_ = auVar190._12_4_ * 1.0000004;
  auVar190 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar207 = vpcmpgtd_avx(auVar190,_DAT_01ff0cf0);
  auVar190 = vcmpps_avx(local_410,auVar142,2);
  auVar190 = vandps_avx(auVar190,auVar207);
  uVar130 = vmovmskps_avx(auVar190);
  local_92d = uVar130 != 0;
  if (local_92d) {
    uVar130 = uVar130 & 0xff;
    local_630 = pre->ray_space + k;
    local_620 = mm_lookupmask_ps._16_8_;
    uStack_618 = mm_lookupmask_ps._24_8_;
    uStack_610 = mm_lookupmask_ps._16_8_;
    uStack_608 = mm_lookupmask_ps._24_8_;
    local_740 = (undefined1 (*) [32])&local_120;
    uVar134 = 1 << ((byte)k & 0x1f);
    local_748 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar134 & 0xf) << 4));
    local_750 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar134 >> 4) * 0x10);
    local_738 = pre;
    local_628 = prim;
    do {
      lVar19 = 0;
      if (uVar130 != 0) {
        for (; (uVar130 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      uVar12 = *(uint *)(local_628 + 2);
      uVar13 = *(uint *)(local_628 + lVar19 * 4 + 6);
      pGVar15 = (context->scene->geometries).items[uVar12].ptr;
      local_520._0_8_ = CONCAT44(0,uVar13);
      uVar132 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                                CONCAT44(0,uVar13) *
                                pGVar15[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar329 = (pGVar15->time_range).lower;
      fVar329 = pGVar15->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar329) /
                ((pGVar15->time_range).upper - fVar329));
      auVar190 = vroundss_avx(ZEXT416((uint)fVar329),ZEXT416((uint)fVar329),9);
      auVar190 = vminss_avx(auVar190,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
      auVar190 = vmaxss_avx(ZEXT816(0) << 0x20,auVar190);
      fVar329 = fVar329 - auVar190._0_4_;
      _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar135 = (long)(int)auVar190._0_4_ * 0x38;
      lVar19 = *(long *)(_Var16 + 0x10 + lVar135);
      lVar139 = *(long *)(_Var16 + 0x38 + lVar135);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar135);
      auVar190 = vshufps_avx(ZEXT416((uint)fVar329),ZEXT416((uint)fVar329),0);
      pfVar1 = (float *)(lVar139 + uVar132 * lVar17);
      fVar218 = auVar190._0_4_;
      fVar333 = auVar190._4_4_;
      fVar223 = auVar190._8_4_;
      fVar201 = auVar190._12_4_;
      pfVar2 = (float *)(lVar139 + (uVar132 + 1) * lVar17);
      lVar137 = (uVar132 + 2) * lVar17;
      pfVar3 = (float *)(lVar139 + lVar137);
      pfVar4 = (float *)(lVar139 + lVar17 * (uVar132 + 3));
      lVar139 = *(long *)(_Var16 + lVar135);
      auVar190 = vshufps_avx(ZEXT416((uint)(1.0 - fVar329)),ZEXT416((uint)(1.0 - fVar329)),0);
      pfVar5 = (float *)(lVar139 + lVar19 * uVar132);
      fVar329 = auVar190._0_4_;
      fVar217 = auVar190._4_4_;
      fVar219 = auVar190._8_4_;
      fVar221 = auVar190._12_4_;
      pfVar6 = (float *)(lVar139 + lVar19 * (uVar132 + 1));
      pfVar7 = (float *)(lVar139 + lVar19 * (uVar132 + 2));
      pfVar8 = (float *)(lVar139 + lVar19 * (uVar132 + 3));
      uVar14 = (uint)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar19 = (long)(int)uVar14 * 0x44;
      local_760 = (undefined1  [8])
                  CONCAT44(fVar333 * pfVar1[1] + fVar217 * pfVar5[1],
                           fVar218 * *pfVar1 + fVar329 * *pfVar5);
      uStack_758._0_4_ = fVar223 * pfVar1[2] + fVar219 * pfVar5[2];
      uStack_758._4_4_ = fVar201 * pfVar1[3] + fVar221 * pfVar5[3];
      fVar359 = fVar329 * *pfVar6 + fVar218 * *pfVar2;
      fVar364 = fVar217 * pfVar6[1] + fVar333 * pfVar2[1];
      auVar362._0_8_ = CONCAT44(fVar364,fVar359);
      auVar362._8_4_ = fVar219 * pfVar6[2] + fVar223 * pfVar2[2];
      auVar362._12_4_ = fVar221 * pfVar6[3] + fVar201 * pfVar2[3];
      local_560._0_8_ =
           CONCAT44(fVar217 * pfVar7[1] + fVar333 * pfVar3[1],fVar329 * *pfVar7 + fVar218 * *pfVar3)
      ;
      local_560._8_4_ = fVar219 * pfVar7[2] + fVar223 * pfVar3[2];
      local_560._12_4_ = fVar221 * pfVar7[3] + fVar201 * pfVar3[3];
      local_700 = fVar329 * *pfVar8 + fVar218 * *pfVar4;
      fStack_6fc = fVar217 * pfVar8[1] + fVar333 * pfVar4[1];
      auVar337._0_8_ = CONCAT44(fStack_6fc,local_700);
      auVar337._8_4_ = fVar219 * pfVar8[2] + fVar223 * pfVar4[2];
      auVar337._12_4_ = fVar221 * pfVar8[3] + fVar201 * pfVar4[3];
      auVar190 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar188 = vinsertps_avx(auVar190,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar21 = vsubps_avx(_local_760,auVar188);
      auVar190 = vshufps_avx(auVar21,auVar21,0);
      auVar207 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      fVar329 = (local_630->vx).field_0.m128[0];
      fVar218 = (local_630->vx).field_0.m128[1];
      fVar333 = (local_630->vx).field_0.m128[2];
      fVar223 = (local_630->vx).field_0.m128[3];
      fVar201 = (local_630->vy).field_0.m128[0];
      fVar217 = (local_630->vy).field_0.m128[1];
      fVar219 = (local_630->vy).field_0.m128[2];
      fVar221 = (local_630->vy).field_0.m128[3];
      fVar230 = (local_630->vz).field_0.m128[0];
      fVar243 = (local_630->vz).field_0.m128[1];
      fVar246 = (local_630->vz).field_0.m128[2];
      fVar249 = (local_630->vz).field_0.m128[3];
      auVar204._0_8_ =
           CONCAT44(auVar190._4_4_ * fVar218 + auVar207._4_4_ * fVar217 + fVar243 * auVar21._4_4_,
                    auVar190._0_4_ * fVar329 + auVar207._0_4_ * fVar201 + fVar230 * auVar21._0_4_);
      auVar204._8_4_ = auVar190._8_4_ * fVar333 + auVar207._8_4_ * fVar219 + fVar246 * auVar21._8_4_
      ;
      auVar204._12_4_ =
           auVar190._12_4_ * fVar223 + auVar207._12_4_ * fVar221 + fVar249 * auVar21._12_4_;
      auVar190 = vblendps_avx(auVar204,_local_760,8);
      auVar206 = vsubps_avx(auVar362,auVar188);
      auVar207 = vshufps_avx(auVar206,auVar206,0);
      auVar21 = vshufps_avx(auVar206,auVar206,0x55);
      auVar206 = vshufps_avx(auVar206,auVar206,0xaa);
      auVar235._0_4_ = auVar207._0_4_ * fVar329 + auVar21._0_4_ * fVar201 + fVar230 * auVar206._0_4_
      ;
      auVar235._4_4_ = auVar207._4_4_ * fVar218 + auVar21._4_4_ * fVar217 + fVar243 * auVar206._4_4_
      ;
      auVar235._8_4_ = auVar207._8_4_ * fVar333 + auVar21._8_4_ * fVar219 + fVar246 * auVar206._8_4_
      ;
      auVar235._12_4_ =
           auVar207._12_4_ * fVar223 + auVar21._12_4_ * fVar221 + fVar249 * auVar206._12_4_;
      auVar207 = vblendps_avx(auVar235,auVar362,8);
      auVar208 = vsubps_avx(local_560,auVar188);
      auVar21 = vshufps_avx(auVar208,auVar208,0);
      auVar206 = vshufps_avx(auVar208,auVar208,0x55);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      auVar279._0_4_ = auVar21._0_4_ * fVar329 + auVar206._0_4_ * fVar201 + auVar208._0_4_ * fVar230
      ;
      auVar279._4_4_ = auVar21._4_4_ * fVar218 + auVar206._4_4_ * fVar217 + auVar208._4_4_ * fVar243
      ;
      auVar279._8_4_ = auVar21._8_4_ * fVar333 + auVar206._8_4_ * fVar219 + auVar208._8_4_ * fVar246
      ;
      auVar279._12_4_ =
           auVar21._12_4_ * fVar223 + auVar206._12_4_ * fVar221 + auVar208._12_4_ * fVar249;
      auVar21 = vblendps_avx(auVar279,local_560,8);
      auVar208 = vsubps_avx(auVar337,auVar188);
      auVar188 = vshufps_avx(auVar208,auVar208,0);
      auVar206 = vshufps_avx(auVar208,auVar208,0x55);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      auVar169._0_4_ =
           auVar188._0_4_ * fVar329 + auVar206._0_4_ * fVar201 + fVar230 * auVar208._0_4_;
      auVar169._4_4_ =
           auVar188._4_4_ * fVar218 + auVar206._4_4_ * fVar217 + fVar243 * auVar208._4_4_;
      auVar169._8_4_ =
           auVar188._8_4_ * fVar333 + auVar206._8_4_ * fVar219 + fVar246 * auVar208._8_4_;
      auVar169._12_4_ =
           auVar188._12_4_ * fVar223 + auVar206._12_4_ * fVar221 + fVar249 * auVar208._12_4_;
      auVar188 = vblendps_avx(auVar169,auVar337,8);
      auVar236._8_4_ = 0x7fffffff;
      auVar236._0_8_ = 0x7fffffff7fffffff;
      auVar236._12_4_ = 0x7fffffff;
      auVar190 = vandps_avx(auVar190,auVar236);
      auVar207 = vandps_avx(auVar207,auVar236);
      auVar206 = vmaxps_avx(auVar190,auVar207);
      auVar190 = vandps_avx(auVar21,auVar236);
      auVar207 = vandps_avx(auVar188,auVar236);
      auVar190 = vmaxps_avx(auVar190,auVar207);
      auVar190 = vmaxps_avx(auVar206,auVar190);
      auVar207 = vmovshdup_avx(auVar190);
      auVar207 = vmaxss_avx(auVar207,auVar190);
      auVar190 = vshufpd_avx(auVar190,auVar190,1);
      auVar190 = vmaxss_avx(auVar190,auVar207);
      fVar246 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar19 + 0x908);
      fVar249 = *(float *)(catmullrom_basis0 + lVar19 + 0x90c);
      fVar262 = *(float *)(catmullrom_basis0 + lVar19 + 0x910);
      fVar263 = *(float *)(catmullrom_basis0 + lVar19 + 0x914);
      fVar326 = *(float *)(catmullrom_basis0 + lVar19 + 0x918);
      fVar289 = *(float *)(catmullrom_basis0 + lVar19 + 0x91c);
      fVar291 = *(float *)(catmullrom_basis0 + lVar19 + 0x920);
      auVar124 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar19 + 0x908);
      fVar225 = *(float *)(catmullrom_basis0 + lVar19 + 0x924);
      auVar207 = vshufps_avx(auVar279,auVar279,0);
      register0x00001250 = auVar207;
      _local_5a0 = auVar207;
      auVar21 = vshufps_avx(auVar279,auVar279,0x55);
      auVar192._16_16_ = auVar21;
      auVar192._0_16_ = auVar21;
      fVar327 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar19 + 0xd8c);
      fVar293 = *(float *)(catmullrom_basis0 + lVar19 + 0xd90);
      fVar295 = *(float *)(catmullrom_basis0 + lVar19 + 0xd94);
      fVar227 = *(float *)(catmullrom_basis0 + lVar19 + 0xd98);
      fVar328 = *(float *)(catmullrom_basis0 + lVar19 + 0xd9c);
      fVar297 = *(float *)(catmullrom_basis0 + lVar19 + 0xda0);
      fVar299 = *(float *)(catmullrom_basis0 + lVar19 + 0xda4);
      auVar123 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar19 + 0xd8c);
      auVar188 = vshufps_avx(auVar169,auVar169,0);
      register0x00001210 = auVar188;
      _local_5c0 = auVar188;
      fVar329 = auVar188._0_4_;
      fVar201 = auVar188._4_4_;
      fVar230 = auVar188._8_4_;
      fVar253 = auVar188._12_4_;
      fVar165 = auVar207._0_4_;
      fVar180 = auVar207._4_4_;
      fVar181 = auVar207._8_4_;
      fVar182 = auVar207._12_4_;
      auVar207 = vshufps_avx(auVar169,auVar169,0x55);
      fVar348 = auVar207._0_4_;
      fVar353 = auVar207._4_4_;
      fVar355 = auVar207._8_4_;
      fVar357 = auVar207._12_4_;
      fVar183 = auVar21._0_4_;
      fVar197 = auVar21._4_4_;
      fVar198 = auVar21._8_4_;
      fVar199 = auVar21._12_4_;
      auVar207 = vshufps_avx(local_560,local_560,0xff);
      register0x000014d0 = auVar207;
      _local_80 = auVar207;
      auVar21 = vshufps_avx(auVar337,auVar337,0xff);
      register0x00001390 = auVar21;
      _local_a0 = auVar21;
      fVar218 = auVar21._0_4_;
      fVar223 = auVar21._4_4_;
      fVar219 = auVar21._8_4_;
      fVar221 = auVar21._12_4_;
      fVar232 = auVar207._0_4_;
      fVar245 = auVar207._4_4_;
      fVar248 = auVar207._8_4_;
      auVar21 = vshufps_avx(auVar235,auVar235,0);
      local_6c0._16_16_ = auVar21;
      local_6c0._0_16_ = auVar21;
      fVar229 = *(float *)(catmullrom_basis0 + lVar19 + 0x484);
      fVar200 = *(float *)(catmullrom_basis0 + lVar19 + 0x488);
      fVar158 = *(float *)(catmullrom_basis0 + lVar19 + 0x48c);
      fVar159 = *(float *)(catmullrom_basis0 + lVar19 + 0x490);
      fStack_6f0 = *(float *)(catmullrom_basis0 + lVar19 + 0x494);
      fStack_6ec = *(float *)(catmullrom_basis0 + lVar19 + 0x498);
      fStack_6e8 = *(float *)(catmullrom_basis0 + lVar19 + 0x49c);
      fStack_6e4 = *(float *)(catmullrom_basis0 + lVar19 + 0x4a0);
      fVar333 = auVar21._0_4_;
      fVar217 = auVar21._4_4_;
      fVar243 = auVar21._8_4_;
      fVar261 = auVar21._12_4_;
      auVar21 = vshufps_avx(auVar235,auVar235,0x55);
      register0x00001510 = auVar21;
      _local_280 = auVar21;
      fVar335 = auVar21._0_4_;
      fVar345 = auVar21._4_4_;
      fVar346 = auVar21._8_4_;
      fVar347 = auVar21._12_4_;
      auVar188 = vshufps_avx(auVar362,auVar362,0xff);
      register0x00001590 = auVar188;
      _local_240 = auVar188;
      fVar251 = auVar188._0_4_;
      fVar315 = auVar188._4_4_;
      fVar316 = auVar188._8_4_;
      fVar322 = auVar188._12_4_;
      auVar106._8_4_ = auVar204._8_4_;
      auVar106._0_8_ = auVar204._0_8_;
      auVar106._12_4_ = auVar204._12_4_;
      auVar188 = vshufps_avx(auVar106,auVar106,0);
      register0x00001310 = auVar188;
      _local_220 = auVar188;
      fVar160 = *(float *)(catmullrom_basis0 + lVar19);
      fVar161 = *(float *)(catmullrom_basis0 + lVar19 + 4);
      fVar162 = *(float *)(catmullrom_basis0 + lVar19 + 8);
      fVar163 = *(float *)(catmullrom_basis0 + lVar19 + 0xc);
      fVar164 = *(float *)(catmullrom_basis0 + lVar19 + 0x10);
      fVar252 = *(float *)(catmullrom_basis0 + lVar19 + 0x14);
      fVar272 = *(float *)(catmullrom_basis0 + lVar19 + 0x18);
      fVar231 = auVar188._0_4_;
      fVar244 = auVar188._4_4_;
      fVar247 = auVar188._8_4_;
      fVar250 = auVar188._12_4_;
      auVar302._0_4_ = fVar231 * fVar160 + fVar229 * fVar333 + fVar165 * fVar246 + fVar327 * fVar329
      ;
      auVar302._4_4_ = fVar244 * fVar161 + fVar200 * fVar217 + fVar180 * fVar249 + fVar293 * fVar201
      ;
      auVar302._8_4_ = fVar247 * fVar162 + fVar158 * fVar243 + fVar181 * fVar262 + fVar295 * fVar230
      ;
      auVar302._12_4_ =
           fVar250 * fVar163 + fVar159 * fVar261 + fVar182 * fVar263 + fVar227 * fVar253;
      auVar302._16_4_ =
           fVar231 * fVar164 + fStack_6f0 * fVar333 + fVar165 * fVar326 + fVar328 * fVar329;
      auVar302._20_4_ =
           fVar244 * fVar252 + fStack_6ec * fVar217 + fVar180 * fVar289 + fVar297 * fVar201;
      auVar302._24_4_ =
           fVar247 * fVar272 + fStack_6e8 * fVar243 + fVar181 * fVar291 + fVar299 * fVar230;
      auVar302._28_4_ = fVar225 + fVar261 + fVar182 + fVar253;
      auVar188 = vshufps_avx(auVar106,auVar106,0x55);
      register0x000015d0 = auVar188;
      _local_480 = auVar188;
      fVar368 = auVar188._0_4_;
      fVar371 = auVar188._4_4_;
      fVar372 = auVar188._8_4_;
      fVar373 = auVar188._12_4_;
      auVar287._0_4_ = fVar368 * fVar160 + fVar335 * fVar229 + fVar183 * fVar246 + fVar348 * fVar327
      ;
      auVar287._4_4_ = fVar371 * fVar161 + fVar345 * fVar200 + fVar197 * fVar249 + fVar353 * fVar293
      ;
      auVar287._8_4_ = fVar372 * fVar162 + fVar346 * fVar158 + fVar198 * fVar262 + fVar355 * fVar295
      ;
      auVar287._12_4_ =
           fVar373 * fVar163 + fVar347 * fVar159 + fVar199 * fVar263 + fVar357 * fVar227;
      auVar287._16_4_ =
           fVar368 * fVar164 + fVar335 * fStack_6f0 + fVar183 * fVar326 + fVar348 * fVar328;
      auVar287._20_4_ =
           fVar371 * fVar252 + fVar345 * fStack_6ec + fVar197 * fVar289 + fVar353 * fVar297;
      auVar287._24_4_ =
           fVar372 * fVar272 + fVar346 * fStack_6e8 + fVar198 * fVar291 + fVar355 * fVar299;
      auVar287._28_4_ = fVar199 + 0.0 + 0.0 + 0.0;
      auVar188 = vpermilps_avx(_local_760,0xff);
      register0x00001490 = auVar188;
      _local_260 = auVar188;
      fVar312 = auVar188._0_4_;
      fVar314 = auVar188._4_4_;
      fVar323 = auVar188._8_4_;
      auVar145._0_4_ = fVar312 * fVar160 + fVar251 * fVar229 + fVar232 * fVar246 + fVar327 * fVar218
      ;
      auVar145._4_4_ = fVar314 * fVar161 + fVar315 * fVar200 + fVar245 * fVar249 + fVar293 * fVar223
      ;
      auVar145._8_4_ = fVar323 * fVar162 + fVar316 * fVar158 + fVar248 * fVar262 + fVar295 * fVar219
      ;
      auVar145._12_4_ =
           auVar188._12_4_ * fVar163 +
           fVar322 * fVar159 + auVar207._12_4_ * fVar263 + fVar227 * fVar221;
      auVar145._16_4_ =
           fVar312 * fVar164 + fVar251 * fStack_6f0 + fVar232 * fVar326 + fVar328 * fVar218;
      auVar145._20_4_ =
           fVar314 * fVar252 + fVar315 * fStack_6ec + fVar245 * fVar289 + fVar297 * fVar223;
      auVar145._24_4_ =
           fVar323 * fVar272 + fVar316 * fStack_6e8 + fVar248 * fVar291 + fVar299 * fVar219;
      auVar145._28_4_ = 0;
      fVar295 = *(float *)(catmullrom_basis1 + lVar19 + 0x908);
      fVar227 = *(float *)(catmullrom_basis1 + lVar19 + 0x90c);
      fVar328 = *(float *)(catmullrom_basis1 + lVar19 + 0x910);
      fVar297 = *(float *)(catmullrom_basis1 + lVar19 + 0x914);
      fVar299 = *(float *)(catmullrom_basis1 + lVar19 + 0x918);
      fVar220 = *(float *)(catmullrom_basis1 + lVar19 + 0x91c);
      fVar222 = *(float *)(catmullrom_basis1 + lVar19 + 0x920);
      fVar224 = *(float *)(catmullrom_basis1 + lVar19 + 0xd8c);
      fVar226 = *(float *)(catmullrom_basis1 + lVar19 + 0xd90);
      fVar228 = *(float *)(catmullrom_basis1 + lVar19 + 0xd94);
      fVar264 = *(float *)(catmullrom_basis1 + lVar19 + 0xd98);
      fVar290 = *(float *)(catmullrom_basis1 + lVar19 + 0xd9c);
      fVar292 = *(float *)(catmullrom_basis1 + lVar19 + 0xda0);
      fVar294 = *(float *)(catmullrom_basis1 + lVar19 + 0xda4);
      fVar296 = *(float *)(catmullrom_basis1 + lVar19 + 0x484);
      fVar298 = *(float *)(catmullrom_basis1 + lVar19 + 0x488);
      fVar300 = *(float *)(catmullrom_basis1 + lVar19 + 0x48c);
      fVar307 = *(float *)(catmullrom_basis1 + lVar19 + 0x490);
      fVar308 = *(float *)(catmullrom_basis1 + lVar19 + 0x494);
      fVar309 = *(float *)(catmullrom_basis1 + lVar19 + 0x498);
      fVar310 = *(float *)(catmullrom_basis1 + lVar19 + 0x49c);
      fVar249 = fVar261 + 0.0;
      fVar311 = *(float *)(catmullrom_basis1 + lVar19);
      fVar313 = *(float *)(catmullrom_basis1 + lVar19 + 4);
      fVar361 = *(float *)(catmullrom_basis1 + lVar19 + 8);
      fVar273 = *(float *)(catmullrom_basis1 + lVar19 + 0xc);
      fVar282 = *(float *)(catmullrom_basis1 + lVar19 + 0x10);
      fVar283 = *(float *)(catmullrom_basis1 + lVar19 + 0x14);
      fVar284 = *(float *)(catmullrom_basis1 + lVar19 + 0x18);
      auVar146._0_4_ = fVar231 * fVar311 + fVar333 * fVar296 + fVar295 * fVar165 + fVar224 * fVar329
      ;
      auVar146._4_4_ = fVar244 * fVar313 + fVar217 * fVar298 + fVar227 * fVar180 + fVar226 * fVar201
      ;
      auVar146._8_4_ = fVar247 * fVar361 + fVar243 * fVar300 + fVar328 * fVar181 + fVar228 * fVar230
      ;
      auVar146._12_4_ =
           fVar250 * fVar273 + fVar261 * fVar307 + fVar297 * fVar182 + fVar264 * fVar253;
      auVar146._16_4_ =
           fVar231 * fVar282 + fVar333 * fVar308 + fVar299 * fVar165 + fVar290 * fVar329;
      auVar146._20_4_ =
           fVar244 * fVar283 + fVar217 * fVar309 + fVar220 * fVar180 + fVar292 * fVar201;
      auVar146._24_4_ =
           fVar247 * fVar284 + fVar243 * fVar310 + fVar222 * fVar181 + fVar294 * fVar230;
      auVar146._28_4_ = fVar322 + fVar249;
      auVar210._0_4_ = fVar368 * fVar311 + fVar335 * fVar296 + fVar295 * fVar183 + fVar348 * fVar224
      ;
      auVar210._4_4_ = fVar371 * fVar313 + fVar345 * fVar298 + fVar227 * fVar197 + fVar353 * fVar226
      ;
      auVar210._8_4_ = fVar372 * fVar361 + fVar346 * fVar300 + fVar328 * fVar198 + fVar355 * fVar228
      ;
      auVar210._12_4_ =
           fVar373 * fVar273 + fVar347 * fVar307 + fVar297 * fVar199 + fVar357 * fVar264;
      auVar210._16_4_ =
           fVar368 * fVar282 + fVar335 * fVar308 + fVar299 * fVar183 + fVar348 * fVar290;
      auVar210._20_4_ =
           fVar371 * fVar283 + fVar345 * fVar309 + fVar220 * fVar197 + fVar353 * fVar292;
      auVar210._24_4_ =
           fVar372 * fVar284 + fVar346 * fVar310 + fVar222 * fVar198 + fVar355 * fVar294;
      auVar210._28_4_ = fVar249 + fVar261 + fVar225 + 0.0;
      auVar318._0_4_ = fVar251 * fVar296 + fVar232 * fVar295 + fVar218 * fVar224 + fVar312 * fVar311
      ;
      auVar318._4_4_ = fVar315 * fVar298 + fVar245 * fVar227 + fVar223 * fVar226 + fVar314 * fVar313
      ;
      auVar318._8_4_ = fVar316 * fVar300 + fVar248 * fVar328 + fVar219 * fVar228 + fVar323 * fVar361
      ;
      auVar318._12_4_ =
           fVar322 * fVar307 + auVar207._12_4_ * fVar297 + fVar221 * fVar264 +
           auVar188._12_4_ * fVar273;
      auVar318._16_4_ =
           fVar251 * fVar308 + fVar232 * fVar299 + fVar218 * fVar290 + fVar312 * fVar282;
      auVar318._20_4_ =
           fVar315 * fVar309 + fVar245 * fVar220 + fVar223 * fVar292 + fVar314 * fVar283;
      auVar318._24_4_ =
           fVar316 * fVar310 + fVar248 * fVar222 + fVar219 * fVar294 + fVar323 * fVar284;
      auVar318._28_4_ = fVar261 + fVar221 + fVar225 + fVar249;
      auVar27 = vsubps_avx(auVar146,auVar302);
      auVar28 = vsubps_avx(auVar210,auVar287);
      fVar218 = auVar27._0_4_;
      fVar219 = auVar27._4_4_;
      auVar177._4_4_ = auVar287._4_4_ * fVar219;
      auVar177._0_4_ = auVar287._0_4_ * fVar218;
      fVar246 = auVar27._8_4_;
      auVar177._8_4_ = auVar287._8_4_ * fVar246;
      fVar262 = auVar27._12_4_;
      auVar177._12_4_ = auVar287._12_4_ * fVar262;
      fVar326 = auVar27._16_4_;
      auVar177._16_4_ = auVar287._16_4_ * fVar326;
      fVar291 = auVar27._20_4_;
      auVar177._20_4_ = auVar287._20_4_ * fVar291;
      fVar327 = auVar27._24_4_;
      auVar177._24_4_ = auVar287._24_4_ * fVar327;
      auVar177._28_4_ = fVar249;
      fVar223 = auVar28._0_4_;
      fVar221 = auVar28._4_4_;
      auVar258._4_4_ = auVar302._4_4_ * fVar221;
      auVar258._0_4_ = auVar302._0_4_ * fVar223;
      fVar249 = auVar28._8_4_;
      auVar258._8_4_ = auVar302._8_4_ * fVar249;
      fVar263 = auVar28._12_4_;
      auVar258._12_4_ = auVar302._12_4_ * fVar263;
      fVar289 = auVar28._16_4_;
      auVar258._16_4_ = auVar302._16_4_ * fVar289;
      fVar225 = auVar28._20_4_;
      auVar258._20_4_ = auVar302._20_4_ * fVar225;
      fVar293 = auVar28._24_4_;
      auVar258._24_4_ = auVar302._24_4_ * fVar293;
      auVar258._28_4_ = auVar210._28_4_;
      auVar258 = vsubps_avx(auVar177,auVar258);
      auVar177 = vmaxps_avx(auVar145,auVar318);
      auVar239._4_4_ = auVar177._4_4_ * auVar177._4_4_ * (fVar219 * fVar219 + fVar221 * fVar221);
      auVar239._0_4_ = auVar177._0_4_ * auVar177._0_4_ * (fVar218 * fVar218 + fVar223 * fVar223);
      auVar239._8_4_ = auVar177._8_4_ * auVar177._8_4_ * (fVar246 * fVar246 + fVar249 * fVar249);
      auVar239._12_4_ = auVar177._12_4_ * auVar177._12_4_ * (fVar262 * fVar262 + fVar263 * fVar263);
      auVar239._16_4_ = auVar177._16_4_ * auVar177._16_4_ * (fVar326 * fVar326 + fVar289 * fVar289);
      auVar239._20_4_ = auVar177._20_4_ * auVar177._20_4_ * (fVar291 * fVar291 + fVar225 * fVar225);
      auVar239._24_4_ = auVar177._24_4_ * auVar177._24_4_ * (fVar327 * fVar327 + fVar293 * fVar293);
      auVar239._28_4_ = fVar250 + auVar210._28_4_;
      auVar20._4_4_ = auVar258._4_4_ * auVar258._4_4_;
      auVar20._0_4_ = auVar258._0_4_ * auVar258._0_4_;
      auVar20._8_4_ = auVar258._8_4_ * auVar258._8_4_;
      auVar20._12_4_ = auVar258._12_4_ * auVar258._12_4_;
      auVar20._16_4_ = auVar258._16_4_ * auVar258._16_4_;
      auVar20._20_4_ = auVar258._20_4_ * auVar258._20_4_;
      auVar20._24_4_ = auVar258._24_4_ * auVar258._24_4_;
      auVar20._28_4_ = auVar258._28_4_;
      auVar177 = vcmpps_avx(auVar20,auVar239,2);
      auVar205._0_4_ = (float)(int)uVar14;
      auVar205._4_12_ = auVar21._4_12_;
      local_500._0_16_ = auVar205;
      auVar207 = vshufps_avx(auVar205,auVar205,0);
      auVar211._16_16_ = auVar207;
      auVar211._0_16_ = auVar207;
      auVar258 = vcmpps_avx(_DAT_02020f40,auVar211,1);
      auVar216 = ZEXT3264(auVar258);
      auVar107._8_4_ = auVar204._8_4_;
      auVar107._0_8_ = auVar204._0_8_;
      auVar107._12_4_ = auVar204._12_4_;
      auVar207 = vpermilps_avx(auVar107,0xaa);
      register0x00001490 = auVar207;
      _local_2a0 = auVar207;
      auVar21 = vpermilps_avx(auVar235,0xaa);
      register0x00001550 = auVar21;
      _local_5e0 = auVar21;
      auVar188 = vpermilps_avx(auVar279,0xaa);
      register0x00001590 = auVar188;
      _local_440 = auVar188;
      auVar206 = vpermilps_avx(auVar169,0xaa);
      register0x00001310 = auVar206;
      _local_460 = auVar206;
      auVar239 = auVar258 & auVar177;
      uVar134 = *(uint *)(ray + k * 4 + 0x60);
      auVar190 = ZEXT416((uint)(auVar190._0_4_ * 4.7683716e-07));
      local_570 = auVar337;
      local_550 = auVar362;
      if ((((((((auVar239 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar239 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar239 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar239 >> 0x7f,0) == '\0') &&
            (auVar239 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar239 >> 0xbf,0) == '\0') &&
          (auVar239 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar239[0x1f]) {
        bVar136 = false;
        auVar177 = local_660;
      }
      else {
        local_4a0 = vandps_avx(auVar177,auVar258);
        fVar316 = auVar207._0_4_;
        fVar322 = auVar207._4_4_;
        fVar324 = auVar207._8_4_;
        fVar325 = auVar207._12_4_;
        fVar349 = auVar21._0_4_;
        fVar354 = auVar21._4_4_;
        fVar356 = auVar21._8_4_;
        fVar358 = auVar21._12_4_;
        fVar360 = auVar188._0_4_;
        fVar365 = auVar188._4_4_;
        fVar366 = auVar188._8_4_;
        fVar367 = auVar188._12_4_;
        fVar232 = auVar206._0_4_;
        fVar245 = auVar206._4_4_;
        fVar248 = auVar206._8_4_;
        fVar251 = auVar206._12_4_;
        fVar218 = auVar258._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar19 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar19 + 0x4a0);
        local_600 = fVar316 * fVar311 + fVar349 * fVar296 + fVar360 * fVar295 + fVar232 * fVar224;
        fStack_5fc = fVar322 * fVar313 + fVar354 * fVar298 + fVar365 * fVar227 + fVar245 * fVar226;
        fStack_5f8 = fVar324 * fVar361 + fVar356 * fVar300 + fVar366 * fVar328 + fVar248 * fVar228;
        fStack_5f4 = fVar325 * fVar273 + fVar358 * fVar307 + fVar367 * fVar297 + fVar251 * fVar264;
        fStack_5f0 = fVar316 * fVar282 + fVar349 * fVar308 + fVar360 * fVar299 + fVar232 * fVar290;
        fStack_5ec = fVar322 * fVar283 + fVar354 * fVar309 + fVar365 * fVar220 + fVar245 * fVar292;
        fStack_5e8 = fVar324 * fVar284 + fVar356 * fVar310 + fVar366 * fVar222 + fVar248 * fVar294;
        fStack_5e4 = local_4a0._28_4_ + fVar218;
        local_840._0_4_ = auVar124._0_4_;
        local_840._4_4_ = auVar124._4_4_;
        uStack_838._0_4_ = auVar124._8_4_;
        uStack_838._4_4_ = auVar124._12_4_;
        fStack_830 = auVar124._16_4_;
        fStack_82c = auVar124._20_4_;
        fStack_828 = auVar124._24_4_;
        local_8a0._0_4_ = auVar123._0_4_;
        local_8a0._4_4_ = auVar123._4_4_;
        uStack_898._0_4_ = auVar123._8_4_;
        uStack_898._4_4_ = auVar123._12_4_;
        fStack_890 = auVar123._16_4_;
        fStack_88c = auVar123._20_4_;
        fStack_888 = auVar123._24_4_;
        local_840._0_4_ =
             fVar316 * fVar160 +
             fVar349 * fVar229 + fVar360 * (float)local_840._0_4_ + fVar232 * (float)local_8a0._0_4_
        ;
        local_840._4_4_ =
             fVar322 * fVar161 +
             fVar354 * fVar200 + fVar365 * (float)local_840._4_4_ + fVar245 * (float)local_8a0._4_4_
        ;
        uStack_838._0_4_ =
             fVar324 * fVar162 +
             fVar356 * fVar158 + fVar366 * (float)uStack_838 + fVar248 * (float)uStack_898;
        uStack_838._4_4_ =
             fVar325 * fVar163 +
             fVar358 * fVar159 + fVar367 * uStack_838._4_4_ + fVar251 * uStack_898._4_4_;
        fStack_830 = fVar316 * fVar164 +
                     fVar349 * fStack_6f0 + fVar360 * fStack_830 + fVar232 * fStack_890;
        fStack_82c = fVar322 * fVar252 +
                     fVar354 * fStack_6ec + fVar365 * fStack_82c + fVar245 * fStack_88c;
        fStack_828 = fVar324 * fVar272 +
                     fVar356 * fStack_6e8 + fVar366 * fStack_828 + fVar248 * fStack_888;
        fStack_824 = fStack_5e4 + fVar218 + local_4a0._28_4_ + auVar258._28_4_;
        fVar218 = *(float *)(catmullrom_basis0 + lVar19 + 0x1210);
        fVar223 = *(float *)(catmullrom_basis0 + lVar19 + 0x1214);
        fVar219 = *(float *)(catmullrom_basis0 + lVar19 + 0x1218);
        fVar221 = *(float *)(catmullrom_basis0 + lVar19 + 0x121c);
        fVar246 = *(float *)(catmullrom_basis0 + lVar19 + 0x1220);
        fVar249 = *(float *)(catmullrom_basis0 + lVar19 + 0x1224);
        fVar262 = *(float *)(catmullrom_basis0 + lVar19 + 0x1228);
        fVar263 = *(float *)(catmullrom_basis0 + lVar19 + 0x1694);
        fVar326 = *(float *)(catmullrom_basis0 + lVar19 + 0x1698);
        fVar289 = *(float *)(catmullrom_basis0 + lVar19 + 0x169c);
        fVar291 = *(float *)(catmullrom_basis0 + lVar19 + 0x16a0);
        fVar225 = *(float *)(catmullrom_basis0 + lVar19 + 0x16a4);
        fVar327 = *(float *)(catmullrom_basis0 + lVar19 + 0x16a8);
        fVar293 = *(float *)(catmullrom_basis0 + lVar19 + 0x16ac);
        fVar295 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b18);
        fVar227 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b1c);
        fVar328 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b20);
        fVar297 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b24);
        fVar299 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b28);
        fVar229 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b2c);
        fVar200 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b30);
        fVar158 = *(float *)(catmullrom_basis0 + lVar19 + 0x1f9c);
        fVar159 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fa0);
        fVar160 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fa4);
        fVar161 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fa8);
        fVar162 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fac);
        fVar163 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fb0);
        fVar164 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fb4);
        fVar272 = *(float *)(catmullrom_basis1 + lVar19 + 0x4a0) + 0.0;
        fVar252 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar19 + 0x1fb8);
        fVar315 = *(float *)(catmullrom_basis1 + lVar19 + 0x1c) + 0.0 + fVar272;
        fVar334 = *(float *)(catmullrom_basis0 + lVar19 + 0x16b0) + fVar252;
        fStack_6f0 = fVar231 * fVar246 + fVar333 * fVar225 + fVar165 * fVar299 + fVar329 * fVar162;
        fStack_6ec = fVar244 * fVar249 + fVar217 * fVar327 + fVar180 * fVar229 + fVar201 * fVar163;
        fStack_6e8 = fVar247 * fVar262 + fVar243 * fVar293 + fVar181 * fVar200 + fVar230 * fVar164;
        fStack_6e4 = *(float *)(catmullrom_basis0 + lVar19 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar19 + 0x1fb8) + fVar272;
        auVar171._0_4_ =
             fVar183 * fVar295 + fVar348 * fVar158 + fVar335 * fVar263 + fVar368 * fVar218;
        auVar171._4_4_ =
             fVar197 * fVar227 + fVar353 * fVar159 + fVar345 * fVar326 + fVar371 * fVar223;
        auVar171._8_4_ =
             fVar198 * fVar328 + fVar355 * fVar160 + fVar346 * fVar289 + fVar372 * fVar219;
        auVar171._12_4_ =
             fVar199 * fVar297 + fVar357 * fVar161 + fVar347 * fVar291 + fVar373 * fVar221;
        auVar171._16_4_ =
             fVar183 * fVar299 + fVar348 * fVar162 + fVar335 * fVar225 + fVar368 * fVar246;
        auVar171._20_4_ =
             fVar197 * fVar229 + fVar353 * fVar163 + fVar345 * fVar327 + fVar371 * fVar249;
        auVar171._24_4_ =
             fVar198 * fVar200 + fVar355 * fVar164 + fVar346 * fVar293 + fVar372 * fVar262;
        auVar171._28_4_ = fVar315 + fVar252;
        fVar252 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b18);
        fVar272 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b1c);
        fVar220 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b20);
        fVar222 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b24);
        fVar224 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b28);
        fVar226 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b2c);
        fVar228 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b30);
        fVar264 = *(float *)(catmullrom_basis1 + lVar19 + 0x1f9c);
        fVar290 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fa0);
        fVar292 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fa4);
        fVar294 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fa8);
        fVar296 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fac);
        fVar298 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fb0);
        fVar300 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fb4);
        fVar307 = *(float *)(catmullrom_basis1 + lVar19 + 0x1694);
        fVar308 = *(float *)(catmullrom_basis1 + lVar19 + 0x1698);
        fVar309 = *(float *)(catmullrom_basis1 + lVar19 + 0x169c);
        fVar310 = *(float *)(catmullrom_basis1 + lVar19 + 0x16a0);
        fVar311 = *(float *)(catmullrom_basis1 + lVar19 + 0x16a4);
        fVar313 = *(float *)(catmullrom_basis1 + lVar19 + 0x16a8);
        fVar361 = *(float *)(catmullrom_basis1 + lVar19 + 0x16ac);
        fVar273 = *(float *)(catmullrom_basis1 + lVar19 + 0x1210);
        fVar282 = *(float *)(catmullrom_basis1 + lVar19 + 0x1214);
        fVar283 = *(float *)(catmullrom_basis1 + lVar19 + 0x1218);
        fVar284 = *(float *)(catmullrom_basis1 + lVar19 + 0x121c);
        fVar312 = *(float *)(catmullrom_basis1 + lVar19 + 0x1220);
        fVar314 = *(float *)(catmullrom_basis1 + lVar19 + 0x1224);
        fVar323 = *(float *)(catmullrom_basis1 + lVar19 + 0x1228);
        auVar268._0_4_ =
             fVar231 * fVar273 + fVar307 * fVar333 + fVar165 * fVar252 + fVar329 * fVar264;
        auVar268._4_4_ =
             fVar244 * fVar282 + fVar308 * fVar217 + fVar180 * fVar272 + fVar201 * fVar290;
        auVar268._8_4_ =
             fVar247 * fVar283 + fVar309 * fVar243 + fVar181 * fVar220 + fVar230 * fVar292;
        auVar268._12_4_ =
             fVar250 * fVar284 + fVar310 * fVar261 + fVar182 * fVar222 + fVar253 * fVar294;
        auVar268._16_4_ =
             fVar231 * fVar312 + fVar311 * fVar333 + fVar165 * fVar224 + fVar329 * fVar296;
        auVar268._20_4_ =
             fVar244 * fVar314 + fVar313 * fVar217 + fVar180 * fVar226 + fVar201 * fVar298;
        auVar268._24_4_ =
             fVar247 * fVar323 + fVar361 * fVar243 + fVar181 * fVar228 + fVar230 * fVar300;
        auVar268._28_4_ = fVar325 + fVar325 + fVar315 + fVar334;
        auVar303._0_4_ =
             fVar368 * fVar273 + fVar335 * fVar307 + fVar183 * fVar252 + fVar348 * fVar264;
        auVar303._4_4_ =
             fVar371 * fVar282 + fVar345 * fVar308 + fVar197 * fVar272 + fVar353 * fVar290;
        auVar303._8_4_ =
             fVar372 * fVar283 + fVar346 * fVar309 + fVar198 * fVar220 + fVar355 * fVar292;
        auVar303._12_4_ =
             fVar373 * fVar284 + fVar347 * fVar310 + fVar199 * fVar222 + fVar357 * fVar294;
        auVar303._16_4_ =
             fVar368 * fVar312 + fVar335 * fVar311 + fVar183 * fVar224 + fVar348 * fVar296;
        auVar303._20_4_ =
             fVar371 * fVar314 + fVar345 * fVar313 + fVar197 * fVar226 + fVar353 * fVar298;
        auVar303._24_4_ =
             fVar372 * fVar323 + fVar346 * fVar361 + fVar198 * fVar228 + fVar355 * fVar300;
        auVar303._28_4_ = fVar325 + fVar325 + fVar325 + fVar315;
        auVar193._0_4_ =
             fVar316 * fVar273 + fVar349 * fVar307 + fVar360 * fVar252 + fVar232 * fVar264;
        auVar193._4_4_ =
             fVar322 * fVar282 + fVar354 * fVar308 + fVar365 * fVar272 + fVar245 * fVar290;
        auVar193._8_4_ =
             fVar324 * fVar283 + fVar356 * fVar309 + fVar366 * fVar220 + fVar248 * fVar292;
        auVar193._12_4_ =
             fVar325 * fVar284 + fVar358 * fVar310 + fVar367 * fVar222 + fVar251 * fVar294;
        auVar193._16_4_ =
             fVar316 * fVar312 + fVar349 * fVar311 + fVar360 * fVar224 + fVar232 * fVar296;
        auVar193._20_4_ =
             fVar322 * fVar314 + fVar354 * fVar313 + fVar365 * fVar226 + fVar245 * fVar298;
        auVar193._24_4_ =
             fVar324 * fVar323 + fVar356 * fVar361 + fVar366 * fVar228 + fVar248 * fVar300;
        auVar193._28_4_ =
             *(float *)(catmullrom_basis1 + lVar19 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar19 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar19 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar19 + 0x1fb8);
        auVar237._8_4_ = 0x7fffffff;
        auVar237._0_8_ = 0x7fffffff7fffffff;
        auVar237._12_4_ = 0x7fffffff;
        auVar237._16_4_ = 0x7fffffff;
        auVar237._20_4_ = 0x7fffffff;
        auVar237._24_4_ = 0x7fffffff;
        auVar237._28_4_ = 0x7fffffff;
        auVar118._4_4_ =
             fVar244 * fVar223 + fVar217 * fVar326 + fVar180 * fVar227 + fVar201 * fVar159;
        auVar118._0_4_ =
             fVar231 * fVar218 + fVar333 * fVar263 + fVar165 * fVar295 + fVar329 * fVar158;
        auVar118._8_4_ =
             fVar247 * fVar219 + fVar243 * fVar289 + fVar181 * fVar328 + fVar230 * fVar160;
        auVar118._12_4_ =
             fVar250 * fVar221 + fVar261 * fVar291 + fVar182 * fVar297 + fVar253 * fVar161;
        auVar118._16_4_ = fStack_6f0;
        auVar118._20_4_ = fStack_6ec;
        auVar118._24_4_ = fStack_6e8;
        auVar118._28_4_ = fStack_6e4;
        auVar177 = vandps_avx(auVar118,auVar237);
        auVar258 = vandps_avx(auVar171,auVar237);
        auVar258 = vmaxps_avx(auVar177,auVar258);
        auVar119._4_4_ =
             fVar354 * fVar326 + fVar365 * fVar227 + fVar245 * fVar159 + fVar322 * fVar223;
        auVar119._0_4_ =
             fVar349 * fVar263 + fVar360 * fVar295 + fVar232 * fVar158 + fVar316 * fVar218;
        auVar119._8_4_ =
             fVar356 * fVar289 + fVar366 * fVar328 + fVar248 * fVar160 + fVar324 * fVar219;
        auVar119._12_4_ =
             fVar358 * fVar291 + fVar367 * fVar297 + fVar251 * fVar161 + fVar325 * fVar221;
        auVar119._16_4_ =
             fVar349 * fVar225 + fVar360 * fVar299 + fVar232 * fVar162 + fVar316 * fVar246;
        auVar119._20_4_ =
             fVar354 * fVar327 + fVar365 * fVar229 + fVar245 * fVar163 + fVar322 * fVar249;
        auVar119._24_4_ =
             fVar356 * fVar293 + fVar366 * fVar200 + fVar248 * fVar164 + fVar324 * fVar262;
        auVar119._28_4_ = fVar334 + *(float *)(catmullrom_basis0 + lVar19 + 0x122c);
        auVar177 = vandps_avx(auVar237,auVar119);
        auVar177 = vmaxps_avx(auVar258,auVar177);
        auVar207 = vpermilps_avx(auVar190,0);
        auVar255._16_16_ = auVar207;
        auVar255._0_16_ = auVar207;
        auVar177 = vcmpps_avx(auVar177,auVar255,1);
        auVar239 = vblendvps_avx(auVar118,auVar27,auVar177);
        auVar20 = vblendvps_avx(auVar171,auVar28,auVar177);
        auVar177 = vandps_avx(auVar268,auVar237);
        auVar258 = vandps_avx(auVar303,auVar237);
        auVar211 = vmaxps_avx(auVar177,auVar258);
        auVar177 = vandps_avx(auVar193,auVar237);
        auVar177 = vmaxps_avx(auVar211,auVar177);
        auVar211 = vcmpps_avx(auVar177,auVar255,1);
        auVar177 = vblendvps_avx(auVar268,auVar27,auVar211);
        auVar27 = vblendvps_avx(auVar303,auVar28,auVar211);
        fVar158 = auVar239._0_4_;
        fVar159 = auVar239._4_4_;
        fVar160 = auVar239._8_4_;
        fVar161 = auVar239._12_4_;
        fVar162 = auVar239._16_4_;
        fVar163 = auVar239._20_4_;
        fVar164 = auVar239._24_4_;
        fVar264 = -auVar239._28_4_;
        fVar252 = auVar177._0_4_;
        fVar272 = auVar177._4_4_;
        fVar220 = auVar177._8_4_;
        fVar222 = auVar177._12_4_;
        fVar224 = auVar177._16_4_;
        fVar226 = auVar177._20_4_;
        fVar228 = auVar177._24_4_;
        fVar329 = auVar20._0_4_;
        fVar201 = auVar20._4_4_;
        fVar230 = auVar20._8_4_;
        fVar253 = auVar20._12_4_;
        fVar326 = auVar20._16_4_;
        fVar327 = auVar20._20_4_;
        fVar328 = auVar20._24_4_;
        auVar147._0_4_ = fVar329 * fVar329 + fVar158 * fVar158;
        auVar147._4_4_ = fVar201 * fVar201 + fVar159 * fVar159;
        auVar147._8_4_ = fVar230 * fVar230 + fVar160 * fVar160;
        auVar147._12_4_ = fVar253 * fVar253 + fVar161 * fVar161;
        auVar147._16_4_ = fVar326 * fVar326 + fVar162 * fVar162;
        auVar147._20_4_ = fVar327 * fVar327 + fVar163 * fVar163;
        auVar147._24_4_ = fVar328 * fVar328 + fVar164 * fVar164;
        auVar147._28_4_ = auVar303._28_4_ + auVar239._28_4_;
        auVar28 = vrsqrtps_avx(auVar147);
        fVar218 = auVar28._0_4_;
        fVar333 = auVar28._4_4_;
        auVar29._4_4_ = fVar333 * 1.5;
        auVar29._0_4_ = fVar218 * 1.5;
        fVar223 = auVar28._8_4_;
        auVar29._8_4_ = fVar223 * 1.5;
        fVar217 = auVar28._12_4_;
        auVar29._12_4_ = fVar217 * 1.5;
        fVar219 = auVar28._16_4_;
        auVar29._16_4_ = fVar219 * 1.5;
        fVar221 = auVar28._20_4_;
        auVar29._20_4_ = fVar221 * 1.5;
        fVar243 = auVar28._24_4_;
        fVar200 = auVar258._28_4_;
        auVar29._24_4_ = fVar243 * 1.5;
        auVar29._28_4_ = fVar200;
        auVar28._4_4_ = fVar333 * fVar333 * fVar333 * auVar147._4_4_ * 0.5;
        auVar28._0_4_ = fVar218 * fVar218 * fVar218 * auVar147._0_4_ * 0.5;
        auVar28._8_4_ = fVar223 * fVar223 * fVar223 * auVar147._8_4_ * 0.5;
        auVar28._12_4_ = fVar217 * fVar217 * fVar217 * auVar147._12_4_ * 0.5;
        auVar28._16_4_ = fVar219 * fVar219 * fVar219 * auVar147._16_4_ * 0.5;
        auVar28._20_4_ = fVar221 * fVar221 * fVar221 * auVar147._20_4_ * 0.5;
        auVar28._24_4_ = fVar243 * fVar243 * fVar243 * auVar147._24_4_ * 0.5;
        auVar28._28_4_ = auVar147._28_4_;
        auVar258 = vsubps_avx(auVar29,auVar28);
        fVar218 = auVar258._0_4_;
        fVar217 = auVar258._4_4_;
        fVar243 = auVar258._8_4_;
        fVar261 = auVar258._12_4_;
        fVar289 = auVar258._16_4_;
        fVar293 = auVar258._20_4_;
        fVar297 = auVar258._24_4_;
        fVar333 = auVar27._0_4_;
        fVar219 = auVar27._4_4_;
        fVar246 = auVar27._8_4_;
        fVar262 = auVar27._12_4_;
        fVar291 = auVar27._16_4_;
        fVar295 = auVar27._20_4_;
        fVar299 = auVar27._24_4_;
        auVar148._0_4_ = fVar333 * fVar333 + fVar252 * fVar252;
        auVar148._4_4_ = fVar219 * fVar219 + fVar272 * fVar272;
        auVar148._8_4_ = fVar246 * fVar246 + fVar220 * fVar220;
        auVar148._12_4_ = fVar262 * fVar262 + fVar222 * fVar222;
        auVar148._16_4_ = fVar291 * fVar291 + fVar224 * fVar224;
        auVar148._20_4_ = fVar295 * fVar295 + fVar226 * fVar226;
        auVar148._24_4_ = fVar299 * fVar299 + fVar228 * fVar228;
        auVar148._28_4_ = auVar177._28_4_ + auVar258._28_4_;
        auVar177 = vrsqrtps_avx(auVar148);
        fVar223 = auVar177._0_4_;
        fVar221 = auVar177._4_4_;
        auVar30._4_4_ = fVar221 * 1.5;
        auVar30._0_4_ = fVar223 * 1.5;
        fVar249 = auVar177._8_4_;
        auVar30._8_4_ = fVar249 * 1.5;
        fVar263 = auVar177._12_4_;
        auVar30._12_4_ = fVar263 * 1.5;
        fVar225 = auVar177._16_4_;
        auVar30._16_4_ = fVar225 * 1.5;
        fVar227 = auVar177._20_4_;
        auVar30._20_4_ = fVar227 * 1.5;
        fVar229 = auVar177._24_4_;
        auVar30._24_4_ = fVar229 * 1.5;
        auVar30._28_4_ = fVar200;
        auVar31._4_4_ = fVar221 * fVar221 * fVar221 * auVar148._4_4_ * 0.5;
        auVar31._0_4_ = fVar223 * fVar223 * fVar223 * auVar148._0_4_ * 0.5;
        auVar31._8_4_ = fVar249 * fVar249 * fVar249 * auVar148._8_4_ * 0.5;
        auVar31._12_4_ = fVar263 * fVar263 * fVar263 * auVar148._12_4_ * 0.5;
        auVar31._16_4_ = fVar225 * fVar225 * fVar225 * auVar148._16_4_ * 0.5;
        auVar31._20_4_ = fVar227 * fVar227 * fVar227 * auVar148._20_4_ * 0.5;
        auVar31._24_4_ = fVar229 * fVar229 * fVar229 * auVar148._24_4_ * 0.5;
        auVar31._28_4_ = auVar148._28_4_;
        auVar177 = vsubps_avx(auVar30,auVar31);
        fVar223 = auVar177._0_4_;
        fVar221 = auVar177._4_4_;
        fVar249 = auVar177._8_4_;
        fVar263 = auVar177._12_4_;
        fVar225 = auVar177._16_4_;
        fVar227 = auVar177._20_4_;
        fVar229 = auVar177._24_4_;
        fVar329 = auVar145._0_4_ * fVar329 * fVar218;
        fVar201 = auVar145._4_4_ * fVar201 * fVar217;
        auVar32._4_4_ = fVar201;
        auVar32._0_4_ = fVar329;
        fVar230 = auVar145._8_4_ * fVar230 * fVar243;
        auVar32._8_4_ = fVar230;
        fVar253 = auVar145._12_4_ * fVar253 * fVar261;
        auVar32._12_4_ = fVar253;
        fVar326 = auVar145._16_4_ * fVar326 * fVar289;
        auVar32._16_4_ = fVar326;
        fVar327 = auVar145._20_4_ * fVar327 * fVar293;
        auVar32._20_4_ = fVar327;
        fVar328 = auVar145._24_4_ * fVar328 * fVar297;
        auVar32._24_4_ = fVar328;
        auVar32._28_4_ = fVar200;
        local_8a0._4_4_ = fVar201 + auVar302._4_4_;
        local_8a0._0_4_ = fVar329 + auVar302._0_4_;
        uStack_898._0_4_ = fVar230 + auVar302._8_4_;
        uStack_898._4_4_ = fVar253 + auVar302._12_4_;
        fStack_890 = fVar326 + auVar302._16_4_;
        fStack_88c = fVar327 + auVar302._20_4_;
        fStack_888 = fVar328 + auVar302._24_4_;
        fStack_884 = fVar200 + auVar302._28_4_;
        fVar329 = auVar145._0_4_ * fVar218 * -fVar158;
        fVar201 = auVar145._4_4_ * fVar217 * -fVar159;
        auVar33._4_4_ = fVar201;
        auVar33._0_4_ = fVar329;
        fVar230 = auVar145._8_4_ * fVar243 * -fVar160;
        auVar33._8_4_ = fVar230;
        fVar253 = auVar145._12_4_ * fVar261 * -fVar161;
        auVar33._12_4_ = fVar253;
        fVar326 = auVar145._16_4_ * fVar289 * -fVar162;
        auVar33._16_4_ = fVar326;
        fVar327 = auVar145._20_4_ * fVar293 * -fVar163;
        auVar33._20_4_ = fVar327;
        fVar328 = auVar145._24_4_ * fVar297 * -fVar164;
        auVar33._24_4_ = fVar328;
        auVar33._28_4_ = fVar264;
        local_7c0._4_4_ = auVar287._4_4_ + fVar201;
        local_7c0._0_4_ = auVar287._0_4_ + fVar329;
        fStack_7b8 = auVar287._8_4_ + fVar230;
        fStack_7b4 = auVar287._12_4_ + fVar253;
        fStack_7b0 = auVar287._16_4_ + fVar326;
        fStack_7ac = auVar287._20_4_ + fVar327;
        fStack_7a8 = auVar287._24_4_ + fVar328;
        fStack_7a4 = auVar287._28_4_ + fVar264;
        fVar329 = fVar218 * 0.0 * auVar145._0_4_;
        fVar218 = fVar217 * 0.0 * auVar145._4_4_;
        auVar34._4_4_ = fVar218;
        auVar34._0_4_ = fVar329;
        fVar201 = fVar243 * 0.0 * auVar145._8_4_;
        auVar34._8_4_ = fVar201;
        fVar217 = fVar261 * 0.0 * auVar145._12_4_;
        auVar34._12_4_ = fVar217;
        fVar230 = fVar289 * 0.0 * auVar145._16_4_;
        auVar34._16_4_ = fVar230;
        fVar243 = fVar293 * 0.0 * auVar145._20_4_;
        auVar34._20_4_ = fVar243;
        fVar253 = fVar297 * 0.0 * auVar145._24_4_;
        auVar34._24_4_ = fVar253;
        auVar34._28_4_ = fVar358;
        auVar269._0_4_ = (float)local_840._0_4_ + fVar329;
        auVar269._4_4_ = (float)local_840._4_4_ + fVar218;
        auVar269._8_4_ = (float)uStack_838 + fVar201;
        auVar269._12_4_ = uStack_838._4_4_ + fVar217;
        auVar269._16_4_ = fStack_830 + fVar230;
        auVar269._20_4_ = fStack_82c + fVar243;
        auVar269._24_4_ = fStack_828 + fVar253;
        auVar269._28_4_ = fStack_824 + fVar358;
        fVar329 = auVar318._0_4_ * fVar333 * fVar223;
        fVar218 = auVar318._4_4_ * fVar219 * fVar221;
        auVar35._4_4_ = fVar218;
        auVar35._0_4_ = fVar329;
        fVar333 = auVar318._8_4_ * fVar246 * fVar249;
        auVar35._8_4_ = fVar333;
        fVar201 = auVar318._12_4_ * fVar262 * fVar263;
        auVar35._12_4_ = fVar201;
        fVar217 = auVar318._16_4_ * fVar291 * fVar225;
        auVar35._16_4_ = fVar217;
        fVar219 = auVar318._20_4_ * fVar295 * fVar227;
        auVar35._20_4_ = fVar219;
        fVar230 = auVar318._24_4_ * fVar299 * fVar229;
        auVar35._24_4_ = fVar230;
        auVar35._28_4_ = auVar27._28_4_;
        auVar211 = vsubps_avx(auVar302,auVar32);
        auVar319._0_4_ = auVar146._0_4_ + fVar329;
        auVar319._4_4_ = auVar146._4_4_ + fVar218;
        auVar319._8_4_ = auVar146._8_4_ + fVar333;
        auVar319._12_4_ = auVar146._12_4_ + fVar201;
        auVar319._16_4_ = auVar146._16_4_ + fVar217;
        auVar319._20_4_ = auVar146._20_4_ + fVar219;
        auVar319._24_4_ = auVar146._24_4_ + fVar230;
        auVar319._28_4_ = auVar146._28_4_ + auVar27._28_4_;
        fVar329 = auVar318._0_4_ * fVar223 * -fVar252;
        fVar218 = auVar318._4_4_ * fVar221 * -fVar272;
        auVar27._4_4_ = fVar218;
        auVar27._0_4_ = fVar329;
        fVar333 = auVar318._8_4_ * fVar249 * -fVar220;
        auVar27._8_4_ = fVar333;
        fVar201 = auVar318._12_4_ * fVar263 * -fVar222;
        auVar27._12_4_ = fVar201;
        fVar217 = auVar318._16_4_ * fVar225 * -fVar224;
        auVar27._16_4_ = fVar217;
        fVar219 = auVar318._20_4_ * fVar227 * -fVar226;
        auVar27._20_4_ = fVar219;
        fVar230 = auVar318._24_4_ * fVar229 * -fVar228;
        auVar27._24_4_ = fVar230;
        auVar27._28_4_ = fVar367;
        auVar287 = vsubps_avx(auVar287,auVar33);
        auVar331._0_4_ = fVar329 + auVar210._0_4_;
        auVar331._4_4_ = fVar218 + auVar210._4_4_;
        auVar331._8_4_ = fVar333 + auVar210._8_4_;
        auVar331._12_4_ = fVar201 + auVar210._12_4_;
        auVar331._16_4_ = fVar217 + auVar210._16_4_;
        auVar331._20_4_ = fVar219 + auVar210._20_4_;
        auVar331._24_4_ = fVar230 + auVar210._24_4_;
        auVar331._28_4_ = fVar367 + auVar210._28_4_;
        fVar329 = fVar223 * 0.0 * auVar318._0_4_;
        fVar218 = fVar221 * 0.0 * auVar318._4_4_;
        auVar36._4_4_ = fVar218;
        auVar36._0_4_ = fVar329;
        fVar333 = fVar249 * 0.0 * auVar318._8_4_;
        auVar36._8_4_ = fVar333;
        fVar223 = fVar263 * 0.0 * auVar318._12_4_;
        auVar36._12_4_ = fVar223;
        fVar201 = fVar225 * 0.0 * auVar318._16_4_;
        auVar36._16_4_ = fVar201;
        fVar217 = fVar227 * 0.0 * auVar318._20_4_;
        auVar36._20_4_ = fVar217;
        fVar219 = fVar229 * 0.0 * auVar318._24_4_;
        auVar36._24_4_ = fVar219;
        auVar36._28_4_ = fVar264;
        auVar29 = vsubps_avx(_local_840,auVar34);
        auVar121._4_4_ = fStack_5fc;
        auVar121._0_4_ = local_600;
        auVar121._8_4_ = fStack_5f8;
        auVar121._12_4_ = fStack_5f4;
        auVar121._16_4_ = fStack_5f0;
        auVar121._20_4_ = fStack_5ec;
        auVar121._24_4_ = fStack_5e8;
        auVar121._28_4_ = fStack_5e4;
        auVar369._0_4_ = local_600 + fVar329;
        auVar369._4_4_ = fStack_5fc + fVar218;
        auVar369._8_4_ = fStack_5f8 + fVar333;
        auVar369._12_4_ = fStack_5f4 + fVar223;
        auVar369._16_4_ = fStack_5f0 + fVar201;
        auVar369._20_4_ = fStack_5ec + fVar217;
        auVar369._24_4_ = fStack_5e8 + fVar219;
        auVar369._28_4_ = fStack_5e4 + fVar264;
        auVar177 = vsubps_avx(auVar146,auVar35);
        auVar258 = vsubps_avx(auVar210,auVar27);
        auVar27 = vsubps_avx(auVar121,auVar36);
        auVar28 = vsubps_avx(auVar331,auVar287);
        auVar239 = vsubps_avx(auVar369,auVar29);
        auVar37._4_4_ = auVar29._4_4_ * auVar28._4_4_;
        auVar37._0_4_ = auVar29._0_4_ * auVar28._0_4_;
        auVar37._8_4_ = auVar29._8_4_ * auVar28._8_4_;
        auVar37._12_4_ = auVar29._12_4_ * auVar28._12_4_;
        auVar37._16_4_ = auVar29._16_4_ * auVar28._16_4_;
        auVar37._20_4_ = auVar29._20_4_ * auVar28._20_4_;
        auVar37._24_4_ = auVar29._24_4_ * auVar28._24_4_;
        auVar37._28_4_ = fVar367;
        auVar38._4_4_ = auVar287._4_4_ * auVar239._4_4_;
        auVar38._0_4_ = auVar287._0_4_ * auVar239._0_4_;
        auVar38._8_4_ = auVar287._8_4_ * auVar239._8_4_;
        auVar38._12_4_ = auVar287._12_4_ * auVar239._12_4_;
        auVar38._16_4_ = auVar287._16_4_ * auVar239._16_4_;
        auVar38._20_4_ = auVar287._20_4_ * auVar239._20_4_;
        auVar38._24_4_ = auVar287._24_4_ * auVar239._24_4_;
        auVar38._28_4_ = fStack_5e4;
        auVar20 = vsubps_avx(auVar38,auVar37);
        auVar39._4_4_ = auVar211._4_4_ * auVar239._4_4_;
        auVar39._0_4_ = auVar211._0_4_ * auVar239._0_4_;
        auVar39._8_4_ = auVar211._8_4_ * auVar239._8_4_;
        auVar39._12_4_ = auVar211._12_4_ * auVar239._12_4_;
        auVar39._16_4_ = auVar211._16_4_ * auVar239._16_4_;
        auVar39._20_4_ = auVar211._20_4_ * auVar239._20_4_;
        auVar39._24_4_ = auVar211._24_4_ * auVar239._24_4_;
        auVar39._28_4_ = auVar239._28_4_;
        auVar302 = vsubps_avx(auVar319,auVar211);
        auVar40._4_4_ = auVar29._4_4_ * auVar302._4_4_;
        auVar40._0_4_ = auVar29._0_4_ * auVar302._0_4_;
        auVar40._8_4_ = auVar29._8_4_ * auVar302._8_4_;
        auVar40._12_4_ = auVar29._12_4_ * auVar302._12_4_;
        auVar40._16_4_ = auVar29._16_4_ * auVar302._16_4_;
        auVar40._20_4_ = auVar29._20_4_ * auVar302._20_4_;
        auVar40._24_4_ = auVar29._24_4_ * auVar302._24_4_;
        auVar40._28_4_ = auVar210._28_4_;
        auVar210 = vsubps_avx(auVar40,auVar39);
        auVar41._4_4_ = auVar302._4_4_ * auVar287._4_4_;
        auVar41._0_4_ = auVar302._0_4_ * auVar287._0_4_;
        auVar41._8_4_ = auVar302._8_4_ * auVar287._8_4_;
        auVar41._12_4_ = auVar302._12_4_ * auVar287._12_4_;
        auVar41._16_4_ = auVar302._16_4_ * auVar287._16_4_;
        auVar41._20_4_ = auVar302._20_4_ * auVar287._20_4_;
        auVar41._24_4_ = auVar302._24_4_ * auVar287._24_4_;
        auVar41._28_4_ = auVar239._28_4_;
        auVar42._4_4_ = auVar211._4_4_ * auVar28._4_4_;
        auVar42._0_4_ = auVar211._0_4_ * auVar28._0_4_;
        auVar42._8_4_ = auVar211._8_4_ * auVar28._8_4_;
        auVar42._12_4_ = auVar211._12_4_ * auVar28._12_4_;
        auVar42._16_4_ = auVar211._16_4_ * auVar28._16_4_;
        auVar42._20_4_ = auVar211._20_4_ * auVar28._20_4_;
        auVar42._24_4_ = auVar211._24_4_ * auVar28._24_4_;
        auVar42._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar42,auVar41);
        auVar149._0_4_ = auVar20._0_4_ * 0.0 + auVar28._0_4_ + auVar210._0_4_ * 0.0;
        auVar149._4_4_ = auVar20._4_4_ * 0.0 + auVar28._4_4_ + auVar210._4_4_ * 0.0;
        auVar149._8_4_ = auVar20._8_4_ * 0.0 + auVar28._8_4_ + auVar210._8_4_ * 0.0;
        auVar149._12_4_ = auVar20._12_4_ * 0.0 + auVar28._12_4_ + auVar210._12_4_ * 0.0;
        auVar149._16_4_ = auVar20._16_4_ * 0.0 + auVar28._16_4_ + auVar210._16_4_ * 0.0;
        auVar149._20_4_ = auVar20._20_4_ * 0.0 + auVar28._20_4_ + auVar210._20_4_ * 0.0;
        auVar149._24_4_ = auVar20._24_4_ * 0.0 + auVar28._24_4_ + auVar210._24_4_ * 0.0;
        auVar149._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar210._28_4_;
        auVar302 = vcmpps_avx(auVar149,ZEXT832(0) << 0x20,2);
        auVar177 = vblendvps_avx(auVar177,_local_8a0,auVar302);
        auVar258 = vblendvps_avx(auVar258,_local_7c0,auVar302);
        auVar27 = vblendvps_avx(auVar27,auVar269,auVar302);
        auVar28 = vblendvps_avx(auVar211,auVar319,auVar302);
        auVar239 = vblendvps_avx(auVar287,auVar331,auVar302);
        auVar20 = vblendvps_avx(auVar29,auVar369,auVar302);
        auVar210 = vblendvps_avx(auVar319,auVar211,auVar302);
        auVar211 = vblendvps_avx(auVar331,auVar287,auVar302);
        auVar207 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
        auVar287 = vblendvps_avx(auVar369,auVar29,auVar302);
        auVar210 = vsubps_avx(auVar210,auVar177);
        auVar29 = vsubps_avx(auVar211,auVar258);
        auVar287 = vsubps_avx(auVar287,auVar27);
        auVar30 = vsubps_avx(auVar258,auVar239);
        fVar329 = auVar29._0_4_;
        fVar164 = auVar27._0_4_;
        fVar217 = auVar29._4_4_;
        fVar252 = auVar27._4_4_;
        auVar43._4_4_ = fVar252 * fVar217;
        auVar43._0_4_ = fVar164 * fVar329;
        fVar246 = auVar29._8_4_;
        fVar272 = auVar27._8_4_;
        auVar43._8_4_ = fVar272 * fVar246;
        fVar263 = auVar29._12_4_;
        fVar220 = auVar27._12_4_;
        auVar43._12_4_ = fVar220 * fVar263;
        fVar327 = auVar29._16_4_;
        fVar222 = auVar27._16_4_;
        auVar43._16_4_ = fVar222 * fVar327;
        fVar297 = auVar29._20_4_;
        fVar224 = auVar27._20_4_;
        auVar43._20_4_ = fVar224 * fVar297;
        fVar159 = auVar29._24_4_;
        fVar226 = auVar27._24_4_;
        auVar43._24_4_ = fVar226 * fVar159;
        auVar43._28_4_ = auVar211._28_4_;
        fVar218 = auVar258._0_4_;
        fVar300 = auVar287._0_4_;
        fVar219 = auVar258._4_4_;
        fVar307 = auVar287._4_4_;
        auVar44._4_4_ = fVar307 * fVar219;
        auVar44._0_4_ = fVar300 * fVar218;
        fVar249 = auVar258._8_4_;
        fVar308 = auVar287._8_4_;
        auVar44._8_4_ = fVar308 * fVar249;
        fVar326 = auVar258._12_4_;
        fVar309 = auVar287._12_4_;
        auVar44._12_4_ = fVar309 * fVar326;
        fVar293 = auVar258._16_4_;
        fVar310 = auVar287._16_4_;
        auVar44._16_4_ = fVar310 * fVar293;
        fVar299 = auVar258._20_4_;
        fVar311 = auVar287._20_4_;
        auVar44._20_4_ = fVar311 * fVar299;
        fVar160 = auVar258._24_4_;
        fVar313 = auVar287._24_4_;
        auVar44._24_4_ = fVar313 * fVar160;
        auVar44._28_4_ = auVar331._28_4_;
        auVar258 = vsubps_avx(auVar44,auVar43);
        fVar333 = auVar177._0_4_;
        fVar221 = auVar177._4_4_;
        auVar45._4_4_ = fVar307 * fVar221;
        auVar45._0_4_ = fVar300 * fVar333;
        fVar253 = auVar177._8_4_;
        auVar45._8_4_ = fVar308 * fVar253;
        fVar289 = auVar177._12_4_;
        auVar45._12_4_ = fVar309 * fVar289;
        fVar295 = auVar177._16_4_;
        auVar45._16_4_ = fVar310 * fVar295;
        fVar229 = auVar177._20_4_;
        auVar45._20_4_ = fVar311 * fVar229;
        fVar161 = auVar177._24_4_;
        auVar45._24_4_ = fVar313 * fVar161;
        auVar45._28_4_ = auVar331._28_4_;
        fVar223 = auVar210._0_4_;
        auVar363._0_4_ = fVar164 * fVar223;
        fVar230 = auVar210._4_4_;
        auVar363._4_4_ = fVar252 * fVar230;
        fVar261 = auVar210._8_4_;
        auVar363._8_4_ = fVar272 * fVar261;
        fVar291 = auVar210._12_4_;
        auVar363._12_4_ = fVar220 * fVar291;
        fVar227 = auVar210._16_4_;
        auVar363._16_4_ = fVar222 * fVar227;
        fVar200 = auVar210._20_4_;
        auVar363._20_4_ = fVar224 * fVar200;
        fVar162 = auVar210._24_4_;
        auVar363._24_4_ = fVar226 * fVar162;
        auVar363._28_4_ = 0;
        auVar211 = vsubps_avx(auVar363,auVar45);
        auVar46._4_4_ = fVar219 * fVar230;
        auVar46._0_4_ = fVar218 * fVar223;
        auVar46._8_4_ = fVar249 * fVar261;
        auVar46._12_4_ = fVar326 * fVar291;
        auVar46._16_4_ = fVar293 * fVar227;
        auVar46._20_4_ = fVar299 * fVar200;
        auVar46._24_4_ = fVar160 * fVar162;
        auVar46._28_4_ = auVar331._28_4_;
        auVar47._4_4_ = fVar221 * fVar217;
        auVar47._0_4_ = fVar333 * fVar329;
        auVar47._8_4_ = fVar253 * fVar246;
        auVar47._12_4_ = fVar289 * fVar263;
        auVar47._16_4_ = fVar295 * fVar327;
        auVar47._20_4_ = fVar229 * fVar297;
        auVar47._24_4_ = fVar161 * fVar159;
        auVar47._28_4_ = auVar369._28_4_;
        auVar31 = vsubps_avx(auVar47,auVar46);
        auVar32 = vsubps_avx(auVar27,auVar20);
        fVar201 = auVar31._28_4_ + auVar211._28_4_;
        auVar172._0_4_ = auVar31._0_4_ + auVar211._0_4_ * 0.0 + auVar258._0_4_ * 0.0;
        auVar172._4_4_ = auVar31._4_4_ + auVar211._4_4_ * 0.0 + auVar258._4_4_ * 0.0;
        auVar172._8_4_ = auVar31._8_4_ + auVar211._8_4_ * 0.0 + auVar258._8_4_ * 0.0;
        auVar172._12_4_ = auVar31._12_4_ + auVar211._12_4_ * 0.0 + auVar258._12_4_ * 0.0;
        auVar172._16_4_ = auVar31._16_4_ + auVar211._16_4_ * 0.0 + auVar258._16_4_ * 0.0;
        auVar172._20_4_ = auVar31._20_4_ + auVar211._20_4_ * 0.0 + auVar258._20_4_ * 0.0;
        auVar172._24_4_ = auVar31._24_4_ + auVar211._24_4_ * 0.0 + auVar258._24_4_ * 0.0;
        auVar172._28_4_ = fVar201 + auVar258._28_4_;
        fVar228 = auVar30._0_4_;
        fVar264 = auVar30._4_4_;
        auVar48._4_4_ = fVar264 * auVar20._4_4_;
        auVar48._0_4_ = fVar228 * auVar20._0_4_;
        fVar290 = auVar30._8_4_;
        auVar48._8_4_ = fVar290 * auVar20._8_4_;
        fVar292 = auVar30._12_4_;
        auVar48._12_4_ = fVar292 * auVar20._12_4_;
        fVar294 = auVar30._16_4_;
        auVar48._16_4_ = fVar294 * auVar20._16_4_;
        fVar296 = auVar30._20_4_;
        auVar48._20_4_ = fVar296 * auVar20._20_4_;
        fVar298 = auVar30._24_4_;
        auVar48._24_4_ = fVar298 * auVar20._24_4_;
        auVar48._28_4_ = fVar201;
        fVar201 = auVar32._0_4_;
        fVar243 = auVar32._4_4_;
        auVar49._4_4_ = auVar239._4_4_ * fVar243;
        auVar49._0_4_ = auVar239._0_4_ * fVar201;
        fVar262 = auVar32._8_4_;
        auVar49._8_4_ = auVar239._8_4_ * fVar262;
        fVar225 = auVar32._12_4_;
        auVar49._12_4_ = auVar239._12_4_ * fVar225;
        fVar328 = auVar32._16_4_;
        auVar49._16_4_ = auVar239._16_4_ * fVar328;
        fVar158 = auVar32._20_4_;
        auVar49._20_4_ = auVar239._20_4_ * fVar158;
        fVar163 = auVar32._24_4_;
        auVar49._24_4_ = auVar239._24_4_ * fVar163;
        auVar49._28_4_ = auVar31._28_4_;
        auVar211 = vsubps_avx(auVar49,auVar48);
        auVar30 = vsubps_avx(auVar177,auVar28);
        fVar361 = auVar30._0_4_;
        fVar273 = auVar30._4_4_;
        auVar50._4_4_ = fVar273 * auVar20._4_4_;
        auVar50._0_4_ = fVar361 * auVar20._0_4_;
        fVar282 = auVar30._8_4_;
        auVar50._8_4_ = fVar282 * auVar20._8_4_;
        fVar283 = auVar30._12_4_;
        auVar50._12_4_ = fVar283 * auVar20._12_4_;
        fVar284 = auVar30._16_4_;
        auVar50._16_4_ = fVar284 * auVar20._16_4_;
        fVar165 = auVar30._20_4_;
        auVar50._20_4_ = fVar165 * auVar20._20_4_;
        fVar180 = auVar30._24_4_;
        auVar50._24_4_ = fVar180 * auVar20._24_4_;
        auVar50._28_4_ = auVar20._28_4_;
        auVar51._4_4_ = auVar28._4_4_ * fVar243;
        auVar51._0_4_ = auVar28._0_4_ * fVar201;
        auVar51._8_4_ = auVar28._8_4_ * fVar262;
        auVar51._12_4_ = auVar28._12_4_ * fVar225;
        auVar51._16_4_ = auVar28._16_4_ * fVar328;
        auVar51._20_4_ = auVar28._20_4_ * fVar158;
        auVar51._24_4_ = auVar28._24_4_ * fVar163;
        auVar51._28_4_ = auVar258._28_4_;
        auVar258 = vsubps_avx(auVar50,auVar51);
        auVar52._4_4_ = auVar239._4_4_ * fVar273;
        auVar52._0_4_ = auVar239._0_4_ * fVar361;
        auVar52._8_4_ = auVar239._8_4_ * fVar282;
        auVar52._12_4_ = auVar239._12_4_ * fVar283;
        auVar52._16_4_ = auVar239._16_4_ * fVar284;
        auVar52._20_4_ = auVar239._20_4_ * fVar165;
        auVar52._24_4_ = auVar239._24_4_ * fVar180;
        auVar52._28_4_ = auVar20._28_4_;
        auVar53._4_4_ = auVar28._4_4_ * fVar264;
        auVar53._0_4_ = auVar28._0_4_ * fVar228;
        auVar53._8_4_ = auVar28._8_4_ * fVar290;
        auVar53._12_4_ = auVar28._12_4_ * fVar292;
        auVar53._16_4_ = auVar28._16_4_ * fVar294;
        auVar53._20_4_ = auVar28._20_4_ * fVar296;
        auVar53._24_4_ = auVar28._24_4_ * fVar298;
        auVar53._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar53,auVar52);
        auVar179 = ZEXT864(0) << 0x20;
        auVar238._0_4_ = auVar211._0_4_ * 0.0 + auVar28._0_4_ + auVar258._0_4_ * 0.0;
        auVar238._4_4_ = auVar211._4_4_ * 0.0 + auVar28._4_4_ + auVar258._4_4_ * 0.0;
        auVar238._8_4_ = auVar211._8_4_ * 0.0 + auVar28._8_4_ + auVar258._8_4_ * 0.0;
        auVar238._12_4_ = auVar211._12_4_ * 0.0 + auVar28._12_4_ + auVar258._12_4_ * 0.0;
        auVar238._16_4_ = auVar211._16_4_ * 0.0 + auVar28._16_4_ + auVar258._16_4_ * 0.0;
        auVar238._20_4_ = auVar211._20_4_ * 0.0 + auVar28._20_4_ + auVar258._20_4_ * 0.0;
        auVar238._24_4_ = auVar211._24_4_ * 0.0 + auVar28._24_4_ + auVar258._24_4_ * 0.0;
        auVar238._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar258._28_4_;
        auVar258 = vmaxps_avx(auVar172,auVar238);
        auVar258 = vcmpps_avx(auVar258,ZEXT832(0) << 0x20,2);
        auVar21 = vpackssdw_avx(auVar258._0_16_,auVar258._16_16_);
        auVar207 = vpand_avx(auVar21,auVar207);
        auVar21 = vpmovsxwd_avx(auVar207);
        auVar188 = vpunpckhwd_avx(auVar207,auVar207);
        auVar212._16_16_ = auVar188;
        auVar212._0_16_ = auVar21;
        if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar212 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar212 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar212 >> 0x7f,0) == '\0') &&
              (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar188 >> 0x3f,0) == '\0') &&
            (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar188[0xf]) {
LAB_01088b73:
          auVar332 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar216 = ZEXT3264(auVar212);
          auVar306 = ZEXT3264(local_660);
        }
        else {
          auVar54._4_4_ = fVar243 * fVar217;
          auVar54._0_4_ = fVar201 * fVar329;
          auVar54._8_4_ = fVar262 * fVar246;
          auVar54._12_4_ = fVar225 * fVar263;
          auVar54._16_4_ = fVar328 * fVar327;
          auVar54._20_4_ = fVar158 * fVar297;
          auVar54._24_4_ = fVar163 * fVar159;
          auVar54._28_4_ = auVar188._12_4_;
          auVar338._0_4_ = fVar228 * fVar300;
          auVar338._4_4_ = fVar264 * fVar307;
          auVar338._8_4_ = fVar290 * fVar308;
          auVar338._12_4_ = fVar292 * fVar309;
          auVar338._16_4_ = fVar294 * fVar310;
          auVar338._20_4_ = fVar296 * fVar311;
          auVar338._24_4_ = fVar298 * fVar313;
          auVar338._28_4_ = 0;
          auVar258 = vsubps_avx(auVar338,auVar54);
          auVar55._4_4_ = fVar273 * fVar307;
          auVar55._0_4_ = fVar361 * fVar300;
          auVar55._8_4_ = fVar282 * fVar308;
          auVar55._12_4_ = fVar283 * fVar309;
          auVar55._16_4_ = fVar284 * fVar310;
          auVar55._20_4_ = fVar165 * fVar311;
          auVar55._24_4_ = fVar180 * fVar313;
          auVar55._28_4_ = auVar287._28_4_;
          auVar56._4_4_ = fVar243 * fVar230;
          auVar56._0_4_ = fVar201 * fVar223;
          auVar56._8_4_ = fVar262 * fVar261;
          auVar56._12_4_ = fVar225 * fVar291;
          auVar56._16_4_ = fVar328 * fVar227;
          auVar56._20_4_ = fVar158 * fVar200;
          auVar56._24_4_ = fVar163 * fVar162;
          auVar56._28_4_ = auVar32._28_4_;
          auVar239 = vsubps_avx(auVar56,auVar55);
          auVar57._4_4_ = fVar264 * fVar230;
          auVar57._0_4_ = fVar228 * fVar223;
          auVar57._8_4_ = fVar290 * fVar261;
          auVar57._12_4_ = fVar292 * fVar291;
          auVar57._16_4_ = fVar294 * fVar227;
          auVar57._20_4_ = fVar296 * fVar200;
          auVar57._24_4_ = fVar298 * fVar162;
          auVar57._28_4_ = auVar172._28_4_;
          auVar58._4_4_ = fVar273 * fVar217;
          auVar58._0_4_ = fVar361 * fVar329;
          auVar58._8_4_ = fVar282 * fVar246;
          auVar58._12_4_ = fVar283 * fVar263;
          auVar58._16_4_ = fVar284 * fVar327;
          auVar58._20_4_ = fVar165 * fVar297;
          auVar58._24_4_ = fVar180 * fVar159;
          auVar58._28_4_ = auVar29._28_4_;
          auVar20 = vsubps_avx(auVar58,auVar57);
          auVar280._0_4_ = auVar258._0_4_ * 0.0 + auVar20._0_4_ + auVar239._0_4_ * 0.0;
          auVar280._4_4_ = auVar258._4_4_ * 0.0 + auVar20._4_4_ + auVar239._4_4_ * 0.0;
          auVar280._8_4_ = auVar258._8_4_ * 0.0 + auVar20._8_4_ + auVar239._8_4_ * 0.0;
          auVar280._12_4_ = auVar258._12_4_ * 0.0 + auVar20._12_4_ + auVar239._12_4_ * 0.0;
          auVar280._16_4_ = auVar258._16_4_ * 0.0 + auVar20._16_4_ + auVar239._16_4_ * 0.0;
          auVar280._20_4_ = auVar258._20_4_ * 0.0 + auVar20._20_4_ + auVar239._20_4_ * 0.0;
          auVar280._24_4_ = auVar258._24_4_ * 0.0 + auVar20._24_4_ + auVar239._24_4_ * 0.0;
          auVar280._28_4_ = auVar29._28_4_ + auVar20._28_4_ + auVar172._28_4_;
          auVar28 = vrcpps_avx(auVar280);
          fVar329 = auVar28._0_4_;
          fVar223 = auVar28._4_4_;
          auVar59._4_4_ = auVar280._4_4_ * fVar223;
          auVar59._0_4_ = auVar280._0_4_ * fVar329;
          fVar201 = auVar28._8_4_;
          auVar59._8_4_ = auVar280._8_4_ * fVar201;
          fVar217 = auVar28._12_4_;
          auVar59._12_4_ = auVar280._12_4_ * fVar217;
          fVar230 = auVar28._16_4_;
          auVar59._16_4_ = auVar280._16_4_ * fVar230;
          fVar243 = auVar28._20_4_;
          auVar59._20_4_ = auVar280._20_4_ * fVar243;
          fVar246 = auVar28._24_4_;
          auVar59._24_4_ = auVar280._24_4_ * fVar246;
          auVar59._28_4_ = auVar32._28_4_;
          auVar339._8_4_ = 0x3f800000;
          auVar339._0_8_ = &DAT_3f8000003f800000;
          auVar339._12_4_ = 0x3f800000;
          auVar339._16_4_ = 0x3f800000;
          auVar339._20_4_ = 0x3f800000;
          auVar339._24_4_ = 0x3f800000;
          auVar339._28_4_ = 0x3f800000;
          auVar211 = vsubps_avx(auVar339,auVar59);
          fVar329 = auVar211._0_4_ * fVar329 + fVar329;
          fVar223 = auVar211._4_4_ * fVar223 + fVar223;
          fVar201 = auVar211._8_4_ * fVar201 + fVar201;
          fVar217 = auVar211._12_4_ * fVar217 + fVar217;
          fVar230 = auVar211._16_4_ * fVar230 + fVar230;
          fVar243 = auVar211._20_4_ * fVar243 + fVar243;
          fVar246 = auVar211._24_4_ * fVar246 + fVar246;
          auVar60._4_4_ =
               (auVar258._4_4_ * fVar221 + auVar239._4_4_ * fVar219 + auVar20._4_4_ * fVar252) *
               fVar223;
          auVar60._0_4_ =
               (auVar258._0_4_ * fVar333 + auVar239._0_4_ * fVar218 + auVar20._0_4_ * fVar164) *
               fVar329;
          auVar60._8_4_ =
               (auVar258._8_4_ * fVar253 + auVar239._8_4_ * fVar249 + auVar20._8_4_ * fVar272) *
               fVar201;
          auVar60._12_4_ =
               (auVar258._12_4_ * fVar289 + auVar239._12_4_ * fVar326 + auVar20._12_4_ * fVar220) *
               fVar217;
          auVar60._16_4_ =
               (auVar258._16_4_ * fVar295 + auVar239._16_4_ * fVar293 + auVar20._16_4_ * fVar222) *
               fVar230;
          auVar60._20_4_ =
               (auVar258._20_4_ * fVar229 + auVar239._20_4_ * fVar299 + auVar20._20_4_ * fVar224) *
               fVar243;
          auVar60._24_4_ =
               (auVar258._24_4_ * fVar161 + auVar239._24_4_ * fVar160 + auVar20._24_4_ * fVar226) *
               fVar246;
          auVar60._28_4_ = auVar177._28_4_ + auVar210._28_4_ + auVar27._28_4_;
          auVar21 = vpermilps_avx(ZEXT416(uVar134),0);
          auVar213._16_16_ = auVar21;
          auVar213._0_16_ = auVar21;
          auVar177 = vcmpps_avx(auVar213,auVar60,2);
          uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar256._4_4_ = uVar10;
          auVar256._0_4_ = uVar10;
          auVar256._8_4_ = uVar10;
          auVar256._12_4_ = uVar10;
          auVar256._16_4_ = uVar10;
          auVar256._20_4_ = uVar10;
          auVar256._24_4_ = uVar10;
          auVar256._28_4_ = uVar10;
          auVar258 = vcmpps_avx(auVar60,auVar256,2);
          auVar177 = vandps_avx(auVar258,auVar177);
          auVar21 = vpackssdw_avx(auVar177._0_16_,auVar177._16_16_);
          auVar207 = vpand_avx(auVar207,auVar21);
          auVar21 = vpmovsxwd_avx(auVar207);
          auVar188 = vpshufd_avx(auVar207,0xee);
          auVar188 = vpmovsxwd_avx(auVar188);
          auVar212._16_16_ = auVar188;
          auVar212._0_16_ = auVar21;
          if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar212 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar212 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar212 >> 0x7f,0) == '\0') &&
                (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar188 >> 0x3f,0) == '\0') &&
              (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar188[0xf]) goto LAB_01088b73;
          auVar177 = vcmpps_avx(ZEXT832(0) << 0x20,auVar280,4);
          auVar21 = vpackssdw_avx(auVar177._0_16_,auVar177._16_16_);
          auVar207 = vpand_avx(auVar207,auVar21);
          auVar21 = vpmovsxwd_avx(auVar207);
          auVar207 = vpunpckhwd_avx(auVar207,auVar207);
          auVar216 = ZEXT1664(auVar207);
          auVar270._16_16_ = auVar207;
          auVar270._0_16_ = auVar21;
          auVar332 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar306 = ZEXT3264(local_660);
          if ((((((((auVar270 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar270 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar270 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar270 >> 0x7f,0) != '\0') ||
                (auVar270 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar207 >> 0x3f,0) != '\0') ||
              (auVar270 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar207[0xf] < '\0') {
            auVar214._0_4_ = auVar172._0_4_ * fVar329;
            auVar214._4_4_ = auVar172._4_4_ * fVar223;
            auVar214._8_4_ = auVar172._8_4_ * fVar201;
            auVar214._12_4_ = auVar172._12_4_ * fVar217;
            auVar214._16_4_ = auVar172._16_4_ * fVar230;
            auVar214._20_4_ = auVar172._20_4_ * fVar243;
            auVar214._24_4_ = auVar172._24_4_ * fVar246;
            auVar214._28_4_ = 0;
            auVar61._4_4_ = auVar238._4_4_ * fVar223;
            auVar61._0_4_ = auVar238._0_4_ * fVar329;
            auVar61._8_4_ = auVar238._8_4_ * fVar201;
            auVar61._12_4_ = auVar238._12_4_ * fVar217;
            auVar61._16_4_ = auVar238._16_4_ * fVar230;
            auVar61._20_4_ = auVar238._20_4_ * fVar243;
            auVar61._24_4_ = auVar238._24_4_ * fVar246;
            auVar61._28_4_ = auVar211._28_4_ + auVar28._28_4_;
            auVar257._8_4_ = 0x3f800000;
            auVar257._0_8_ = &DAT_3f8000003f800000;
            auVar257._12_4_ = 0x3f800000;
            auVar257._16_4_ = 0x3f800000;
            auVar257._20_4_ = 0x3f800000;
            auVar257._24_4_ = 0x3f800000;
            auVar257._28_4_ = 0x3f800000;
            auVar177 = vsubps_avx(auVar257,auVar214);
            auVar177 = vblendvps_avx(auVar177,auVar214,auVar302);
            auVar306 = ZEXT3264(auVar177);
            auVar177 = vsubps_avx(auVar257,auVar61);
            auVar216 = ZEXT3264(auVar177);
            _local_4c0 = vblendvps_avx(auVar177,auVar61,auVar302);
            auVar332 = ZEXT3264(auVar270);
            local_2c0 = auVar60;
          }
        }
        auVar177 = auVar306._0_32_;
        auVar258 = auVar332._0_32_;
        if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar258 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar258 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar258 >> 0x7f,0) != '\0') ||
              (auVar332 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar258 >> 0xbf,0) != '\0') ||
            (auVar332 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar332[0x1f] < '\0') {
          auVar27 = vsubps_avx(auVar318,auVar145);
          fVar218 = auVar145._0_4_ + auVar306._0_4_ * auVar27._0_4_;
          fVar333 = auVar145._4_4_ + auVar306._4_4_ * auVar27._4_4_;
          fVar223 = auVar145._8_4_ + auVar306._8_4_ * auVar27._8_4_;
          fVar201 = auVar145._12_4_ + auVar306._12_4_ * auVar27._12_4_;
          fVar217 = auVar145._16_4_ + auVar306._16_4_ * auVar27._16_4_;
          fVar219 = auVar145._20_4_ + auVar306._20_4_ * auVar27._20_4_;
          fVar221 = auVar145._24_4_ + auVar306._24_4_ * auVar27._24_4_;
          fVar230 = auVar27._28_4_ + 0.0;
          fVar329 = *(float *)((long)local_738->ray_space + k * 4 + -0x20);
          auVar62._4_4_ = (fVar333 + fVar333) * fVar329;
          auVar62._0_4_ = (fVar218 + fVar218) * fVar329;
          auVar62._8_4_ = (fVar223 + fVar223) * fVar329;
          auVar62._12_4_ = (fVar201 + fVar201) * fVar329;
          auVar62._16_4_ = (fVar217 + fVar217) * fVar329;
          auVar62._20_4_ = (fVar219 + fVar219) * fVar329;
          auVar62._24_4_ = (fVar221 + fVar221) * fVar329;
          auVar62._28_4_ = fVar230 + fVar230;
          auVar216 = ZEXT3264(local_2c0);
          auVar27 = vcmpps_avx(local_2c0,auVar62,6);
          auVar28 = auVar258 & auVar27;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0x7f,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0xbf,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar28[0x1f] < '\0') {
            local_340 = vandps_avx(auVar27,auVar258);
            local_3e0._0_4_ = (float)local_4c0._0_4_ + (float)local_4c0._0_4_ + -1.0;
            local_3e0._4_4_ = (float)local_4c0._4_4_ + (float)local_4c0._4_4_ + -1.0;
            fStack_3d8 = fStack_4b8 + fStack_4b8 + -1.0;
            fStack_3d4 = fStack_4b4 + fStack_4b4 + -1.0;
            fStack_3d0 = (float)uStack_4b0 + (float)uStack_4b0 + -1.0;
            fStack_3cc = uStack_4b0._4_4_ + uStack_4b0._4_4_ + -1.0;
            fStack_3c8 = (float)uStack_4a8 + (float)uStack_4a8 + -1.0;
            fStack_3c4 = uStack_4a8._4_4_ + uStack_4a8._4_4_ + -1.0;
            local_3c0 = local_2c0;
            local_3a0 = 0;
            uStack_388 = uStack_758;
            local_550._8_8_ = auVar362._8_8_;
            uStack_378 = local_550._8_8_;
            uStack_368 = local_560._8_8_;
            local_570._8_8_ = auVar337._8_8_;
            uStack_358 = local_570._8_8_;
            local_4c0._4_4_ = local_3e0._4_4_;
            local_4c0._0_4_ = local_3e0._0_4_;
            fStack_4b8 = fStack_3d8;
            fStack_4b4 = fStack_3d4;
            uStack_4b0._0_4_ = fStack_3d0;
            uStack_4b0._4_4_ = fStack_3cc;
            uStack_4a8._0_4_ = fStack_3c8;
            uStack_4a8._4_4_ = fStack_3c4;
            auVar258 = _local_4c0;
            if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              _local_4c0 = auVar258;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar136 = true, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar187._0_4_ = 1.0 / auVar205._0_4_;
                auVar187._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar207 = vshufps_avx(auVar187,auVar187,0);
                local_320[0] = auVar207._0_4_ * (auVar306._0_4_ + 0.0);
                local_320[1] = auVar207._4_4_ * (auVar306._4_4_ + 1.0);
                local_320[2] = auVar207._8_4_ * (auVar306._8_4_ + 2.0);
                local_320[3] = auVar207._12_4_ * (auVar306._12_4_ + 3.0);
                fStack_310 = auVar207._0_4_ * (auVar306._16_4_ + 4.0);
                fStack_30c = auVar207._4_4_ * (auVar306._20_4_ + 5.0);
                fStack_308 = auVar207._8_4_ * (auVar306._24_4_ + 6.0);
                fStack_304 = auVar306._28_4_ + 7.0;
                uStack_4a8 = auVar258._24_8_;
                local_300._16_8_ = uStack_4b0;
                local_300._0_16_ = _local_4c0;
                local_300._24_8_ = uStack_4a8;
                local_2e0 = local_2c0;
                iVar131 = vmovmskps_avx(local_340);
                uVar138 = CONCAT44((int)((ulong)lVar137 >> 0x20),iVar131);
                uVar132 = 0;
                if (uVar138 != 0) {
                  for (; (uVar138 >> uVar132 & 1) == 0; uVar132 = uVar132 + 1) {
                  }
                }
                bVar136 = iVar131 != 0;
                if (bVar136) {
                  auVar207 = vshufps_avx(ZEXT416(uVar12),ZEXT416(uVar12),0);
                  auVar21 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
                  _auStack_6d0 = auVar146._16_16_;
                  uStack_6d8 = local_560._8_8_;
                  local_6e0 = (undefined1  [8])local_560._0_8_;
                  local_680 = (float)*(undefined8 *)*local_748;
                  fStack_67c = (float)((ulong)*(undefined8 *)*local_748 >> 0x20);
                  fStack_678 = (float)*(undefined8 *)(*local_748 + 8);
                  fStack_674 = (float)((ulong)*(undefined8 *)(*local_748 + 8) >> 0x20);
                  fStack_670 = (float)*local_750;
                  fStack_66c = (float)((ulong)*local_750 >> 0x20);
                  fStack_668 = (float)local_750[1];
                  fStack_664 = (float)((ulong)local_750[1] >> 0x20);
                  fStack_6f8 = auVar337._8_4_;
                  fStack_6f4 = auVar337._12_4_;
                  local_660 = auVar177;
                  local_400 = auVar177;
                  local_39c = uVar14;
                  local_390 = local_760;
                  local_380 = auVar362._0_8_;
                  local_370 = local_560._0_8_;
                  local_360 = auVar337._0_8_;
                  do {
                    uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_1a0 = local_320[uVar132];
                    local_180 = *(undefined4 *)(local_300 + uVar132 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar132 * 4);
                    fVar218 = 1.0 - local_1a0;
                    fVar329 = local_1a0 * 3.0;
                    auVar188 = ZEXT416((uint)((fVar218 * -2.0 * local_1a0 + local_1a0 * local_1a0) *
                                             0.5));
                    auVar188 = vshufps_avx(auVar188,auVar188,0);
                    auVar206 = ZEXT416((uint)(((fVar218 + fVar218) * (fVar329 + 2.0) +
                                              fVar218 * fVar218 * -3.0) * 0.5));
                    auVar206 = vshufps_avx(auVar206,auVar206,0);
                    auVar208 = ZEXT416((uint)(((local_1a0 + local_1a0) * (fVar329 + -5.0) +
                                              local_1a0 * fVar329) * 0.5));
                    auVar208 = vshufps_avx(auVar208,auVar208,0);
                    local_730.context = context->user;
                    auVar209 = ZEXT416((uint)((local_1a0 * (fVar218 + fVar218) - fVar218 * fVar218)
                                             * 0.5));
                    auVar209 = vshufps_avx(auVar209,auVar209,0);
                    auVar189._0_4_ =
                         auVar209._0_4_ * (float)local_760._0_4_ +
                         auVar208._0_4_ * fVar359 +
                         auVar188._0_4_ * local_700 + auVar206._0_4_ * (float)local_6e0._0_4_;
                    auVar189._4_4_ =
                         auVar209._4_4_ * (float)local_760._4_4_ +
                         auVar208._4_4_ * fVar364 +
                         auVar188._4_4_ * fStack_6fc + auVar206._4_4_ * (float)local_6e0._4_4_;
                    auVar189._8_4_ =
                         auVar209._8_4_ * (float)uStack_758 +
                         auVar208._8_4_ * auVar362._8_4_ +
                         auVar188._8_4_ * fStack_6f8 + auVar206._8_4_ * (float)uStack_6d8;
                    auVar189._12_4_ =
                         auVar209._12_4_ * uStack_758._4_4_ +
                         auVar208._12_4_ * auVar362._12_4_ +
                         auVar188._12_4_ * fStack_6f4 + auVar206._12_4_ * uStack_6d8._4_4_;
                    local_1f0 = vshufps_avx(auVar189,auVar189,0);
                    local_200[0] = (RTCHitN)local_1f0[0];
                    local_200[1] = (RTCHitN)local_1f0[1];
                    local_200[2] = (RTCHitN)local_1f0[2];
                    local_200[3] = (RTCHitN)local_1f0[3];
                    local_200[4] = (RTCHitN)local_1f0[4];
                    local_200[5] = (RTCHitN)local_1f0[5];
                    local_200[6] = (RTCHitN)local_1f0[6];
                    local_200[7] = (RTCHitN)local_1f0[7];
                    local_200[8] = (RTCHitN)local_1f0[8];
                    local_200[9] = (RTCHitN)local_1f0[9];
                    local_200[10] = (RTCHitN)local_1f0[10];
                    local_200[0xb] = (RTCHitN)local_1f0[0xb];
                    local_200[0xc] = (RTCHitN)local_1f0[0xc];
                    local_200[0xd] = (RTCHitN)local_1f0[0xd];
                    local_200[0xe] = (RTCHitN)local_1f0[0xe];
                    local_200[0xf] = (RTCHitN)local_1f0[0xf];
                    local_1d0 = vshufps_avx(auVar189,auVar189,0x55);
                    auVar216 = ZEXT1664(local_1d0);
                    local_1e0 = local_1d0;
                    local_1b0 = vshufps_avx(auVar189,auVar189,0xaa);
                    local_1c0 = local_1b0;
                    fStack_19c = local_1a0;
                    fStack_198 = local_1a0;
                    fStack_194 = local_1a0;
                    fStack_190 = local_1a0;
                    fStack_18c = local_1a0;
                    fStack_188 = local_1a0;
                    fStack_184 = local_1a0;
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_8a0 = auVar21._0_8_;
                    uStack_898 = auVar21._8_8_;
                    local_160 = local_8a0;
                    uStack_158 = uStack_898;
                    uStack_150 = local_8a0;
                    uStack_148 = uStack_898;
                    local_840 = auVar207._0_8_;
                    uStack_838 = auVar207._8_8_;
                    local_140 = local_840;
                    uStack_138 = uStack_838;
                    uStack_130 = local_840;
                    uStack_128 = uStack_838;
                    auVar177 = vcmpps_avx(auVar179._0_32_,auVar179._0_32_,0xf);
                    local_740[1] = auVar177;
                    *local_740 = auVar177;
                    local_120 = (local_730.context)->instID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_100 = (local_730.context)->instPrimID[0];
                    uStack_fc = local_100;
                    uStack_f8 = local_100;
                    uStack_f4 = local_100;
                    uStack_f0 = local_100;
                    uStack_ec = local_100;
                    uStack_e8 = local_100;
                    uStack_e4 = local_100;
                    local_780 = CONCAT44(fStack_67c,local_680);
                    uStack_778 = CONCAT44(fStack_674,fStack_678);
                    uStack_770 = CONCAT44(fStack_66c,fStack_670);
                    uStack_768 = CONCAT44(fStack_664,fStack_668);
                    local_730.valid = (int *)&local_780;
                    local_730.geometryUserPtr = pGVar15->userPtr;
                    local_730.hit = local_200;
                    local_730.N = 8;
                    local_730.ray = (RTCRayN *)ray;
                    if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar216 = ZEXT1664(local_1d0);
                      (*pGVar15->occlusionFilterN)(&local_730);
                      auVar306 = ZEXT3264(local_660);
                      auVar179 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar109._8_8_ = uStack_778;
                    auVar109._0_8_ = local_780;
                    auVar188 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar109);
                    auVar113._8_8_ = uStack_768;
                    auVar113._0_8_ = uStack_770;
                    auVar206 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar113);
                    auVar150._16_16_ = auVar206;
                    auVar150._0_16_ = auVar188;
                    auVar258 = auVar177 & ~auVar150;
                    if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar258 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar258 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar258 >> 0x7f,0) == '\0') &&
                          (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar258 >> 0xbf,0) == '\0') &&
                        (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar258[0x1f]) {
                      auVar151._0_4_ = auVar188._0_4_ ^ auVar177._0_4_;
                      auVar151._4_4_ = auVar188._4_4_ ^ auVar177._4_4_;
                      auVar151._8_4_ = auVar188._8_4_ ^ auVar177._8_4_;
                      auVar151._12_4_ = auVar188._12_4_ ^ auVar177._12_4_;
                      auVar151._16_4_ = auVar206._0_4_ ^ auVar177._16_4_;
                      auVar151._20_4_ = auVar206._4_4_ ^ auVar177._20_4_;
                      auVar151._24_4_ = auVar206._8_4_ ^ auVar177._24_4_;
                      auVar151._28_4_ = auVar206._12_4_ ^ auVar177._28_4_;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar216 = ZEXT1664(auVar216._0_16_);
                        (*p_Var18)(&local_730);
                        auVar306 = ZEXT3264(local_660);
                        auVar179 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar110._8_8_ = uStack_778;
                      auVar110._0_8_ = local_780;
                      auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,auVar110);
                      auVar114._8_8_ = uStack_768;
                      auVar114._0_8_ = uStack_770;
                      auVar206 = vpcmpeqd_avx((undefined1  [16])0x0,auVar114);
                      auVar173._16_16_ = auVar206;
                      auVar173._0_16_ = auVar188;
                      auVar151._0_4_ = auVar188._0_4_ ^ auVar177._0_4_;
                      auVar151._4_4_ = auVar188._4_4_ ^ auVar177._4_4_;
                      auVar151._8_4_ = auVar188._8_4_ ^ auVar177._8_4_;
                      auVar151._12_4_ = auVar188._12_4_ ^ auVar177._12_4_;
                      auVar151._16_4_ = auVar206._0_4_ ^ auVar177._16_4_;
                      auVar151._20_4_ = auVar206._4_4_ ^ auVar177._20_4_;
                      auVar151._24_4_ = auVar206._8_4_ ^ auVar177._24_4_;
                      auVar151._28_4_ = auVar206._12_4_ ^ auVar177._28_4_;
                      auVar194._8_4_ = 0xff800000;
                      auVar194._0_8_ = 0xff800000ff800000;
                      auVar194._12_4_ = 0xff800000;
                      auVar194._16_4_ = 0xff800000;
                      auVar194._20_4_ = 0xff800000;
                      auVar194._24_4_ = 0xff800000;
                      auVar194._28_4_ = 0xff800000;
                      auVar177 = vblendvps_avx(auVar194,*(undefined1 (*) [32])
                                                         (local_730.ray + 0x100),auVar173);
                      *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar177;
                    }
                    auVar177 = auVar306._0_32_;
                    if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar151 >> 0x7f,0) != '\0') ||
                          (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar151 >> 0xbf,0) != '\0') ||
                        (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar151[0x1f] < '\0') break;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar10;
                    uVar138 = uVar138 ^ 1L << (uVar132 & 0x3f);
                    uVar132 = 0;
                    if (uVar138 != 0) {
                      for (; (uVar138 >> uVar132 & 1) == 0; uVar132 = uVar132 + 1) {
                      }
                    }
                    bVar136 = uVar138 != 0;
                  } while (bVar136);
                }
              }
              goto LAB_010875d8;
            }
          }
        }
        bVar136 = false;
      }
LAB_010875d8:
      auVar332 = ZEXT3264(auVar192);
      auVar179 = ZEXT1664(auVar190);
      local_660 = auVar177;
      if (8 < (int)uVar14) {
        auVar207 = vpshufd_avx(ZEXT416(uVar14),0);
        local_700 = auVar207._0_4_;
        fStack_6fc = auVar207._4_4_;
        fStack_6f8 = auVar207._8_4_;
        fStack_6f4 = auVar207._12_4_;
        auVar190 = vshufps_avx(auVar190,auVar190,0);
        local_4a0._16_16_ = auVar190;
        local_4a0._0_16_ = auVar190;
        auVar190 = vpermilps_avx(ZEXT416(uVar134),0);
        local_c0._16_16_ = auVar190;
        local_c0._0_16_ = auVar190;
        auVar144._0_4_ = 1.0 / (float)local_500._0_4_;
        auVar144._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar190 = vshufps_avx(auVar144,auVar144,0);
        register0x00001210 = auVar190;
        _local_e0 = auVar190;
        auVar190 = vshufps_avx(ZEXT416(uVar12),ZEXT416(uVar12),0);
        local_500._16_16_ = auVar190;
        local_500._0_16_ = auVar190;
        auVar190 = vshufps_avx(ZEXT416((uint)local_520._0_4_),ZEXT416((uint)local_520._0_4_),0);
        local_520._16_16_ = auVar190;
        local_520._0_16_ = auVar190;
        auVar157 = ZEXT3264(local_520);
        lVar139 = 8;
        auVar344 = ZEXT3264(local_6c0);
        auVar306 = ZEXT3264(local_6a0);
        do {
          auVar206 = local_550;
          auVar188 = local_560;
          auVar21 = local_570;
          auVar239 = auVar306._0_32_;
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar139 * 4 + lVar19);
          fVar329 = *(float *)*pauVar9;
          fVar218 = *(float *)(*pauVar9 + 4);
          fVar333 = *(float *)(*pauVar9 + 8);
          fVar223 = *(float *)(*pauVar9 + 0xc);
          fVar201 = *(float *)(*pauVar9 + 0x10);
          fVar217 = *(float *)(*pauVar9 + 0x14);
          fVar219 = *(float *)(*pauVar9 + 0x18);
          auVar126 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar19 + 0x22307f0 + lVar139 * 4);
          fVar221 = *(float *)*pauVar9;
          fVar230 = *(float *)(*pauVar9 + 4);
          fVar243 = *(float *)(*pauVar9 + 8);
          fVar246 = *(float *)(*pauVar9 + 0xc);
          fVar249 = *(float *)(*pauVar9 + 0x10);
          fVar253 = *(float *)(*pauVar9 + 0x14);
          fVar261 = *(float *)(*pauVar9 + 0x18);
          auVar125 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar19 + 0x2230c74 + lVar139 * 4);
          fVar262 = *(float *)*pauVar9;
          fVar263 = *(float *)(*pauVar9 + 4);
          fVar326 = *(float *)(*pauVar9 + 8);
          fVar289 = *(float *)(*pauVar9 + 0xc);
          fVar291 = *(float *)(*pauVar9 + 0x10);
          fVar225 = *(float *)(*pauVar9 + 0x14);
          fVar327 = *(float *)(*pauVar9 + 0x18);
          auVar124 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar19 + 0x22310f8 + lVar139 * 4);
          fVar293 = *(float *)*pauVar9;
          fVar295 = *(float *)(*pauVar9 + 4);
          fVar227 = *(float *)(*pauVar9 + 8);
          fVar328 = *(float *)(*pauVar9 + 0xc);
          fVar297 = *(float *)(*pauVar9 + 0x10);
          fVar299 = *(float *)(*pauVar9 + 0x14);
          fVar229 = *(float *)(*pauVar9 + 0x18);
          auVar123 = *pauVar9;
          fVar158 = auVar216._28_4_;
          fVar220 = auVar332._0_4_;
          fVar222 = auVar332._4_4_;
          fVar224 = auVar332._8_4_;
          fVar226 = auVar332._12_4_;
          fVar228 = auVar332._16_4_;
          fVar264 = auVar332._20_4_;
          fVar290 = auVar332._24_4_;
          fVar200 = fVar158 + *(float *)pauVar9[1];
          fVar164 = fVar158 + fVar158 + auVar157._28_4_;
          fVar252 = fVar158 + fVar200;
          auVar215._0_4_ =
               (float)local_220._0_4_ * fVar329 +
               auVar344._0_4_ * fVar221 +
               fVar262 * (float)local_5a0._0_4_ + (float)local_5c0._0_4_ * fVar293;
          auVar215._4_4_ =
               (float)local_220._4_4_ * fVar218 +
               auVar344._4_4_ * fVar230 +
               fVar263 * (float)local_5a0._4_4_ + (float)local_5c0._4_4_ * fVar295;
          auVar215._8_4_ =
               fStack_218 * fVar333 +
               auVar344._8_4_ * fVar243 + fVar326 * fStack_598 + fStack_5b8 * fVar227;
          auVar215._12_4_ =
               fStack_214 * fVar223 +
               auVar344._12_4_ * fVar246 + fVar289 * fStack_594 + fStack_5b4 * fVar328;
          auVar215._16_4_ =
               fStack_210 * fVar201 +
               auVar344._16_4_ * fVar249 + fVar291 * fStack_590 + fStack_5b0 * fVar297;
          auVar215._20_4_ =
               fStack_20c * fVar217 +
               auVar344._20_4_ * fVar253 + fVar225 * fStack_58c + fStack_5ac * fVar299;
          auVar215._24_4_ =
               fStack_208 * fVar219 +
               auVar344._24_4_ * fVar261 + fVar327 * fStack_588 + fStack_5a8 * fVar229;
          auVar215._28_4_ = fVar200 + fVar164;
          auVar216 = ZEXT3264(auVar215);
          auVar195._0_4_ =
               (float)local_480._0_4_ * fVar329 +
               (float)local_280._0_4_ * fVar221 + fVar220 * fVar262 + fVar348 * fVar293;
          auVar195._4_4_ =
               (float)local_480._4_4_ * fVar218 +
               (float)local_280._4_4_ * fVar230 + fVar222 * fVar263 + fVar353 * fVar295;
          auVar195._8_4_ =
               fStack_478 * fVar333 + fStack_278 * fVar243 + fVar224 * fVar326 + fVar355 * fVar227;
          auVar195._12_4_ =
               fStack_474 * fVar223 + fStack_274 * fVar246 + fVar226 * fVar289 + fVar357 * fVar328;
          auVar195._16_4_ =
               fStack_470 * fVar201 + fStack_270 * fVar249 + fVar228 * fVar291 + fVar348 * fVar297;
          auVar195._20_4_ =
               fStack_46c * fVar217 + fStack_26c * fVar253 + fVar264 * fVar225 + fVar353 * fVar299;
          auVar195._24_4_ =
               fStack_468 * fVar219 + fStack_268 * fVar261 + fVar290 * fVar327 + fVar355 * fVar229;
          auVar195._28_4_ = fVar164 + fVar158 + fVar158 + auVar179._28_4_;
          fVar200 = fVar329 * (float)local_260._0_4_ +
                    fVar221 * (float)local_240._0_4_ +
                    (float)local_80._0_4_ * fVar262 + (float)local_a0._0_4_ * fVar293;
          fVar158 = fVar218 * (float)local_260._4_4_ +
                    fVar230 * (float)local_240._4_4_ +
                    (float)local_80._4_4_ * fVar263 + (float)local_a0._4_4_ * fVar295;
          fVar159 = fVar333 * fStack_258 +
                    fVar243 * fStack_238 + fStack_78 * fVar326 + fStack_98 * fVar227;
          fVar160 = fVar223 * fStack_254 +
                    fVar246 * fStack_234 + fStack_74 * fVar289 + fStack_94 * fVar328;
          fVar161 = fVar201 * fStack_250 +
                    fVar249 * fStack_230 + fStack_70 * fVar291 + fStack_90 * fVar297;
          fVar162 = fVar217 * fStack_24c +
                    fVar253 * fStack_22c + fStack_6c * fVar225 + fStack_8c * fVar299;
          fVar163 = fVar219 * fStack_248 +
                    fVar261 * fStack_228 + fStack_68 * fVar327 + fStack_88 * fVar229;
          fVar164 = fVar164 + fVar252;
          pfVar1 = (float *)(catmullrom_basis1 + lVar139 * 4 + lVar19);
          fVar329 = *pfVar1;
          fVar218 = pfVar1[1];
          fVar333 = pfVar1[2];
          fVar223 = pfVar1[3];
          fVar201 = pfVar1[4];
          fVar217 = pfVar1[5];
          fVar219 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar19 + 0x2232c10 + lVar139 * 4);
          fVar221 = *(float *)*pauVar9;
          fVar230 = *(float *)(*pauVar9 + 4);
          fVar243 = *(float *)(*pauVar9 + 8);
          fVar246 = *(float *)(*pauVar9 + 0xc);
          fVar249 = *(float *)(*pauVar9 + 0x10);
          fVar253 = *(float *)(*pauVar9 + 0x14);
          fVar261 = *(float *)(*pauVar9 + 0x18);
          auVar129 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar19 + 0x2233094 + lVar139 * 4);
          fVar262 = *(float *)*pauVar9;
          fVar263 = *(float *)(*pauVar9 + 4);
          fVar326 = *(float *)(*pauVar9 + 8);
          fVar289 = *(float *)(*pauVar9 + 0xc);
          fVar291 = *(float *)(*pauVar9 + 0x10);
          fVar225 = *(float *)(*pauVar9 + 0x14);
          fVar327 = *(float *)(*pauVar9 + 0x18);
          auVar128 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar19 + 0x2233518 + lVar139 * 4);
          fVar293 = *(float *)*pauVar9;
          fVar295 = *(float *)(*pauVar9 + 4);
          fVar227 = *(float *)(*pauVar9 + 8);
          fVar328 = *(float *)(*pauVar9 + 0xc);
          fVar297 = *(float *)(*pauVar9 + 0x10);
          fVar299 = *(float *)(*pauVar9 + 0x14);
          fVar229 = *(float *)(*pauVar9 + 0x18);
          auVar127 = *pauVar9;
          fVar272 = fStack_584 + fStack_84;
          fVar292 = local_6c0._0_4_;
          fVar294 = local_6c0._4_4_;
          fVar296 = local_6c0._8_4_;
          fVar298 = local_6c0._12_4_;
          fVar300 = local_6c0._16_4_;
          fVar307 = local_6c0._20_4_;
          fVar308 = local_6c0._24_4_;
          fVar252 = fStack_584 + fStack_584 + fVar252;
          auVar340._0_4_ =
               (float)local_220._0_4_ * fVar329 +
               fVar292 * fVar221 +
               (float)local_5a0._0_4_ * fVar262 + (float)local_5c0._0_4_ * fVar293;
          auVar340._4_4_ =
               (float)local_220._4_4_ * fVar218 +
               fVar294 * fVar230 +
               (float)local_5a0._4_4_ * fVar263 + (float)local_5c0._4_4_ * fVar295;
          auVar340._8_4_ =
               fStack_218 * fVar333 +
               fVar296 * fVar243 + fStack_598 * fVar326 + fStack_5b8 * fVar227;
          auVar340._12_4_ =
               fStack_214 * fVar223 +
               fVar298 * fVar246 + fStack_594 * fVar289 + fStack_5b4 * fVar328;
          auVar340._16_4_ =
               fStack_210 * fVar201 +
               fVar300 * fVar249 + fStack_590 * fVar291 + fStack_5b0 * fVar297;
          auVar340._20_4_ =
               fStack_20c * fVar217 +
               fVar307 * fVar253 + fStack_58c * fVar225 + fStack_5ac * fVar299;
          auVar340._24_4_ =
               fStack_208 * fVar219 +
               fVar308 * fVar261 + fStack_588 * fVar327 + fStack_5a8 * fVar229;
          auVar340._28_4_ = fVar272 + fVar252;
          auVar259._0_4_ =
               (float)local_480._0_4_ * fVar329 +
               fVar348 * fVar293 + fVar220 * fVar262 + (float)local_280._0_4_ * fVar221;
          auVar259._4_4_ =
               (float)local_480._4_4_ * fVar218 +
               fVar353 * fVar295 + fVar222 * fVar263 + (float)local_280._4_4_ * fVar230;
          auVar259._8_4_ =
               fStack_478 * fVar333 + fVar355 * fVar227 + fVar224 * fVar326 + fStack_278 * fVar243;
          auVar259._12_4_ =
               fStack_474 * fVar223 + fVar357 * fVar328 + fVar226 * fVar289 + fStack_274 * fVar246;
          auVar259._16_4_ =
               fStack_470 * fVar201 + fVar348 * fVar297 + fVar228 * fVar291 + fStack_270 * fVar249;
          auVar259._20_4_ =
               fStack_46c * fVar217 + fVar353 * fVar299 + fVar264 * fVar225 + fStack_26c * fVar253;
          auVar259._24_4_ =
               fStack_468 * fVar219 + fVar355 * fVar229 + fVar290 * fVar327 + fStack_268 * fVar261;
          auVar259._28_4_ = fVar252 + fStack_5a4 + fStack_584 + fStack_584;
          auVar281._0_4_ =
               fVar221 * (float)local_240._0_4_ +
               (float)local_80._0_4_ * fVar262 + (float)local_a0._0_4_ * fVar293 +
               fVar329 * (float)local_260._0_4_;
          auVar281._4_4_ =
               fVar230 * (float)local_240._4_4_ +
               (float)local_80._4_4_ * fVar263 + (float)local_a0._4_4_ * fVar295 +
               fVar218 * (float)local_260._4_4_;
          auVar281._8_4_ =
               fVar243 * fStack_238 + fStack_78 * fVar326 + fStack_98 * fVar227 +
               fVar333 * fStack_258;
          auVar281._12_4_ =
               fVar246 * fStack_234 + fStack_74 * fVar289 + fStack_94 * fVar328 +
               fVar223 * fStack_254;
          auVar281._16_4_ =
               fVar249 * fStack_230 + fStack_70 * fVar291 + fStack_90 * fVar297 +
               fVar201 * fStack_250;
          auVar281._20_4_ =
               fVar253 * fStack_22c + fStack_6c * fVar225 + fStack_8c * fVar299 +
               fVar217 * fStack_24c;
          auVar281._24_4_ =
               fVar261 * fStack_228 + fStack_68 * fVar327 + fStack_88 * fVar229 +
               fVar219 * fStack_248;
          auVar281._28_4_ = fStack_584 + fVar272 + fVar252;
          auVar258 = vsubps_avx(auVar340,auVar215);
          auVar27 = vsubps_avx(auVar259,auVar195);
          fVar262 = auVar258._0_4_;
          fVar263 = auVar258._4_4_;
          auVar63._4_4_ = fVar263 * auVar195._4_4_;
          auVar63._0_4_ = fVar262 * auVar195._0_4_;
          fVar326 = auVar258._8_4_;
          auVar63._8_4_ = fVar326 * auVar195._8_4_;
          fVar289 = auVar258._12_4_;
          auVar63._12_4_ = fVar289 * auVar195._12_4_;
          fVar291 = auVar258._16_4_;
          auVar63._16_4_ = fVar291 * auVar195._16_4_;
          fVar225 = auVar258._20_4_;
          auVar63._20_4_ = fVar225 * auVar195._20_4_;
          fVar327 = auVar258._24_4_;
          auVar63._24_4_ = fVar327 * auVar195._24_4_;
          auVar63._28_4_ = fVar252;
          fVar221 = auVar27._0_4_;
          fVar230 = auVar27._4_4_;
          auVar64._4_4_ = fVar230 * auVar215._4_4_;
          auVar64._0_4_ = fVar221 * auVar215._0_4_;
          fVar243 = auVar27._8_4_;
          auVar64._8_4_ = fVar243 * auVar215._8_4_;
          fVar246 = auVar27._12_4_;
          auVar64._12_4_ = fVar246 * auVar215._12_4_;
          fVar249 = auVar27._16_4_;
          auVar64._16_4_ = fVar249 * auVar215._16_4_;
          fVar253 = auVar27._20_4_;
          auVar64._20_4_ = fVar253 * auVar215._20_4_;
          fVar261 = auVar27._24_4_;
          auVar64._24_4_ = fVar261 * auVar215._24_4_;
          auVar64._28_4_ = auVar259._28_4_;
          auVar28 = vsubps_avx(auVar63,auVar64);
          auVar108._4_4_ = fVar158;
          auVar108._0_4_ = fVar200;
          auVar108._8_4_ = fVar159;
          auVar108._12_4_ = fVar160;
          auVar108._16_4_ = fVar161;
          auVar108._20_4_ = fVar162;
          auVar108._24_4_ = fVar163;
          auVar108._28_4_ = fVar164;
          auVar157 = ZEXT3264(auVar108);
          auVar177 = vmaxps_avx(auVar108,auVar281);
          auVar65._4_4_ = auVar177._4_4_ * auVar177._4_4_ * (fVar263 * fVar263 + fVar230 * fVar230);
          auVar65._0_4_ = auVar177._0_4_ * auVar177._0_4_ * (fVar262 * fVar262 + fVar221 * fVar221);
          auVar65._8_4_ = auVar177._8_4_ * auVar177._8_4_ * (fVar326 * fVar326 + fVar243 * fVar243);
          auVar65._12_4_ =
               auVar177._12_4_ * auVar177._12_4_ * (fVar289 * fVar289 + fVar246 * fVar246);
          auVar65._16_4_ =
               auVar177._16_4_ * auVar177._16_4_ * (fVar291 * fVar291 + fVar249 * fVar249);
          auVar65._20_4_ =
               auVar177._20_4_ * auVar177._20_4_ * (fVar225 * fVar225 + fVar253 * fVar253);
          auVar65._24_4_ =
               auVar177._24_4_ * auVar177._24_4_ * (fVar327 * fVar327 + fVar261 * fVar261);
          auVar65._28_4_ = fVar272 + auVar259._28_4_;
          auVar66._4_4_ = auVar28._4_4_ * auVar28._4_4_;
          auVar66._0_4_ = auVar28._0_4_ * auVar28._0_4_;
          auVar66._8_4_ = auVar28._8_4_ * auVar28._8_4_;
          auVar66._12_4_ = auVar28._12_4_ * auVar28._12_4_;
          auVar66._16_4_ = auVar28._16_4_ * auVar28._16_4_;
          auVar66._20_4_ = auVar28._20_4_ * auVar28._20_4_;
          auVar66._24_4_ = auVar28._24_4_ * auVar28._24_4_;
          auVar66._28_4_ = auVar28._28_4_;
          auVar177 = vcmpps_avx(auVar66,auVar65,2);
          local_3a0 = (uint)lVar139;
          auVar207 = vpshufd_avx(ZEXT416(local_3a0),0);
          auVar190 = vpor_avx(auVar207,_DAT_01ff0cf0);
          auVar207 = vpor_avx(auVar207,_DAT_02020ea0);
          auVar117._4_4_ = fStack_6fc;
          auVar117._0_4_ = local_700;
          auVar117._8_4_ = fStack_6f8;
          auVar117._12_4_ = fStack_6f4;
          auVar190 = vpcmpgtd_avx(auVar117,auVar190);
          auVar207 = vpcmpgtd_avx(auVar117,auVar207);
          auVar174._16_16_ = auVar207;
          auVar174._0_16_ = auVar190;
          auVar179 = ZEXT3264(auVar174);
          auVar28 = auVar174 & auVar177;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0x7f,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0xbf,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar28[0x1f]) {
            auVar242 = ZEXT3264(auVar239);
            auVar332 = ZEXT3264(auVar332._0_32_);
            auVar344 = ZEXT3264(local_6c0);
          }
          else {
            local_8a0._0_4_ = auVar129._0_4_;
            local_8a0._4_4_ = auVar129._4_4_;
            uStack_898._0_4_ = auVar129._8_4_;
            uStack_898._4_4_ = auVar129._12_4_;
            fStack_890 = auVar129._16_4_;
            fStack_88c = auVar129._20_4_;
            fStack_888 = auVar129._24_4_;
            local_7c0._0_4_ = auVar128._0_4_;
            local_7c0._4_4_ = auVar128._4_4_;
            fStack_7b8 = auVar128._8_4_;
            fStack_7b4 = auVar128._12_4_;
            fStack_7b0 = auVar128._16_4_;
            fStack_7ac = auVar128._20_4_;
            fStack_7a8 = auVar128._24_4_;
            local_6e0._0_4_ = auVar127._0_4_;
            local_6e0._4_4_ = auVar127._4_4_;
            uStack_6d8._0_4_ = auVar127._8_4_;
            uStack_6d8._4_4_ = auVar127._12_4_;
            auStack_6d0._0_4_ = auVar127._16_4_;
            auStack_6d0._4_4_ = auVar127._20_4_;
            uStack_6c8._0_4_ = auVar127._24_4_;
            local_6e0._0_4_ =
                 fVar329 * (float)local_2a0._0_4_ +
                 (float)local_5e0._0_4_ * (float)local_8a0._0_4_ +
                 (float)local_440._0_4_ * (float)local_7c0._0_4_ +
                 (float)local_460._0_4_ * (float)local_6e0._0_4_;
            local_6e0._4_4_ =
                 fVar218 * (float)local_2a0._4_4_ +
                 (float)local_5e0._4_4_ * (float)local_8a0._4_4_ +
                 (float)local_440._4_4_ * (float)local_7c0._4_4_ +
                 (float)local_460._4_4_ * (float)local_6e0._4_4_;
            uStack_6d8._0_4_ =
                 fVar333 * fStack_298 +
                 fStack_5d8 * (float)uStack_898 +
                 fStack_438 * fStack_7b8 + fStack_458 * (float)uStack_6d8;
            uStack_6d8._4_4_ =
                 fVar223 * fStack_294 +
                 fStack_5d4 * uStack_898._4_4_ +
                 fStack_434 * fStack_7b4 + fStack_454 * uStack_6d8._4_4_;
            auStack_6d0._0_4_ =
                 fVar201 * fStack_290 +
                 fStack_5d0 * fStack_890 +
                 fStack_430 * fStack_7b0 + fStack_450 * (float)auStack_6d0._0_4_;
            auStack_6d0._4_4_ =
                 fVar217 * fStack_28c +
                 fStack_5cc * fStack_88c +
                 fStack_42c * fStack_7ac + fStack_44c * (float)auStack_6d0._4_4_;
            uStack_6c8._0_4_ =
                 fVar219 * fStack_288 +
                 fStack_5c8 * fStack_888 + fStack_428 * fStack_7a8 + fStack_448 * (float)uStack_6c8;
            uStack_6c8._4_4_ = fStack_464 + fVar164 + auVar207._12_4_ + 0.0;
            local_860 = auVar125._0_4_;
            fStack_85c = auVar125._4_4_;
            fStack_858 = auVar125._8_4_;
            fStack_854 = auVar125._12_4_;
            fStack_850 = auVar125._16_4_;
            fStack_84c = auVar125._20_4_;
            fStack_848 = auVar125._24_4_;
            local_880 = auVar124._0_4_;
            auStack_87c._0_4_ = auVar124._4_4_;
            auStack_87c._4_4_ = auVar124._8_4_;
            fStack_874 = auVar124._12_4_;
            fStack_870 = auVar124._16_4_;
            fStack_86c = auVar124._20_4_;
            fStack_868 = auVar124._24_4_;
            local_840._0_4_ = auVar123._0_4_;
            local_840._4_4_ = auVar123._4_4_;
            uStack_838._0_4_ = auVar123._8_4_;
            uStack_838._4_4_ = auVar123._12_4_;
            fStack_830 = auVar123._16_4_;
            fStack_82c = auVar123._20_4_;
            fStack_828 = auVar123._24_4_;
            pfVar1 = (float *)(lVar19 + 0x2231e84 + lVar139 * 4);
            fVar329 = *pfVar1;
            fVar218 = pfVar1[1];
            fVar333 = pfVar1[2];
            fVar223 = pfVar1[3];
            fVar201 = pfVar1[4];
            fVar217 = pfVar1[5];
            fVar219 = pfVar1[6];
            pfVar2 = (float *)(lVar19 + 0x2232308 + lVar139 * 4);
            fVar221 = *pfVar2;
            fVar230 = pfVar2[1];
            fVar243 = pfVar2[2];
            fVar246 = pfVar2[3];
            fVar249 = pfVar2[4];
            fVar253 = pfVar2[5];
            fVar261 = pfVar2[6];
            pfVar3 = (float *)(lVar19 + 0x2231a00 + lVar139 * 4);
            fVar262 = *pfVar3;
            fVar263 = pfVar3[1];
            fVar326 = pfVar3[2];
            fVar289 = pfVar3[3];
            fVar291 = pfVar3[4];
            fVar225 = pfVar3[5];
            fVar327 = pfVar3[6];
            fVar252 = pfVar1[7] + pfVar2[7];
            fStack_5e4 = pfVar2[7] + fStack_204 + 0.0;
            fVar272 = fStack_204 + fStack_464 + fStack_204 + 0.0;
            pfVar1 = (float *)(lVar19 + 0x223157c + lVar139 * 4);
            fVar293 = *pfVar1;
            fVar295 = pfVar1[1];
            fVar227 = pfVar1[2];
            fVar328 = pfVar1[3];
            fVar297 = pfVar1[4];
            fVar299 = pfVar1[5];
            fVar229 = pfVar1[6];
            local_680 = (float)local_220._0_4_ * fVar293 +
                        fVar292 * fVar262 +
                        fVar329 * (float)local_5a0._0_4_ + (float)local_5c0._0_4_ * fVar221;
            fStack_67c = (float)local_220._4_4_ * fVar295 +
                         fVar294 * fVar263 +
                         fVar218 * (float)local_5a0._4_4_ + (float)local_5c0._4_4_ * fVar230;
            fStack_678 = fStack_218 * fVar227 +
                         fVar296 * fVar326 + fVar333 * fStack_598 + fStack_5b8 * fVar243;
            fStack_674 = fStack_214 * fVar328 +
                         fVar298 * fVar289 + fVar223 * fStack_594 + fStack_5b4 * fVar246;
            fStack_670 = fStack_210 * fVar297 +
                         fVar300 * fVar291 + fVar201 * fStack_590 + fStack_5b0 * fVar249;
            fStack_66c = fStack_20c * fVar299 +
                         fVar307 * fVar225 + fVar217 * fStack_58c + fStack_5ac * fVar253;
            fStack_668 = fStack_208 * fVar229 +
                         fVar308 * fVar327 + fVar219 * fStack_588 + fStack_5a8 * fVar261;
            fStack_664 = fVar252 + fStack_5e4;
            local_600 = fVar293 * (float)local_480._0_4_ +
                        fVar220 * fVar329 + fVar348 * fVar221 + (float)local_280._0_4_ * fVar262;
            fStack_5fc = fVar295 * (float)local_480._4_4_ +
                         fVar222 * fVar218 + fVar353 * fVar230 + (float)local_280._4_4_ * fVar263;
            fStack_5f8 = fVar227 * fStack_478 +
                         fVar224 * fVar333 + fVar355 * fVar243 + fStack_278 * fVar326;
            fStack_5f4 = fVar328 * fStack_474 +
                         fVar226 * fVar223 + fVar357 * fVar246 + fStack_274 * fVar289;
            fStack_5f0 = fVar297 * fStack_470 +
                         fVar228 * fVar201 + fVar348 * fVar249 + fStack_270 * fVar291;
            fStack_5ec = fVar299 * fStack_46c +
                         fVar264 * fVar217 + fVar353 * fVar253 + fStack_26c * fVar225;
            fStack_5e8 = fVar229 * fStack_468 +
                         fVar290 * fVar219 + fVar355 * fVar261 + fStack_268 * fVar327;
            fStack_5e4 = fStack_5e4 + fVar272;
            auVar351._0_4_ =
                 fVar262 * (float)local_5e0._0_4_ +
                 (float)local_440._0_4_ * fVar329 + (float)local_460._0_4_ * fVar221 +
                 fVar293 * (float)local_2a0._0_4_;
            auVar351._4_4_ =
                 fVar263 * (float)local_5e0._4_4_ +
                 (float)local_440._4_4_ * fVar218 + (float)local_460._4_4_ * fVar230 +
                 fVar295 * (float)local_2a0._4_4_;
            auVar351._8_4_ =
                 fVar326 * fStack_5d8 + fStack_438 * fVar333 + fStack_458 * fVar243 +
                 fVar227 * fStack_298;
            auVar351._12_4_ =
                 fVar289 * fStack_5d4 + fStack_434 * fVar223 + fStack_454 * fVar246 +
                 fVar328 * fStack_294;
            auVar351._16_4_ =
                 fVar291 * fStack_5d0 + fStack_430 * fVar201 + fStack_450 * fVar249 +
                 fVar297 * fStack_290;
            auVar351._20_4_ =
                 fVar225 * fStack_5cc + fStack_42c * fVar217 + fStack_44c * fVar253 +
                 fVar299 * fStack_28c;
            auVar351._24_4_ =
                 fVar327 * fStack_5c8 + fStack_428 * fVar219 + fStack_448 * fVar261 +
                 fVar229 * fStack_288;
            auVar351._28_4_ = pfVar3[7] + fVar252 + fVar272;
            pfVar1 = (float *)(lVar19 + 0x22342a4 + lVar139 * 4);
            fVar218 = *pfVar1;
            fVar333 = pfVar1[1];
            fVar223 = pfVar1[2];
            fVar201 = pfVar1[3];
            fVar217 = pfVar1[4];
            fVar219 = pfVar1[5];
            fVar221 = pfVar1[6];
            pfVar2 = (float *)(lVar19 + 0x2234728 + lVar139 * 4);
            fVar230 = *pfVar2;
            fVar243 = pfVar2[1];
            fVar246 = pfVar2[2];
            fVar249 = pfVar2[3];
            fVar253 = pfVar2[4];
            fVar261 = pfVar2[5];
            fVar262 = pfVar2[6];
            fVar329 = local_6c0._28_4_;
            pfVar3 = (float *)(lVar19 + 0x2233e20 + lVar139 * 4);
            fVar263 = *pfVar3;
            fVar326 = pfVar3[1];
            fVar289 = pfVar3[2];
            fVar291 = pfVar3[3];
            fVar225 = pfVar3[4];
            fVar327 = pfVar3[5];
            fVar293 = pfVar3[6];
            pfVar4 = (float *)(lVar19 + 0x223399c + lVar139 * 4);
            fVar295 = *pfVar4;
            fVar227 = pfVar4[1];
            fVar328 = pfVar4[2];
            fVar297 = pfVar4[3];
            fVar299 = pfVar4[4];
            fVar229 = pfVar4[5];
            fVar252 = pfVar4[6];
            auVar304._0_4_ =
                 (float)local_220._0_4_ * fVar295 +
                 fVar263 * fVar292 +
                 fVar218 * (float)local_5a0._0_4_ + fVar230 * (float)local_5c0._0_4_;
            auVar304._4_4_ =
                 (float)local_220._4_4_ * fVar227 +
                 fVar326 * fVar294 +
                 fVar333 * (float)local_5a0._4_4_ + fVar243 * (float)local_5c0._4_4_;
            auVar304._8_4_ =
                 fStack_218 * fVar328 +
                 fVar289 * fVar296 + fVar223 * fStack_598 + fVar246 * fStack_5b8;
            auVar304._12_4_ =
                 fStack_214 * fVar297 +
                 fVar291 * fVar298 + fVar201 * fStack_594 + fVar249 * fStack_5b4;
            auVar304._16_4_ =
                 fStack_210 * fVar299 +
                 fVar225 * fVar300 + fVar217 * fStack_590 + fVar253 * fStack_5b0;
            auVar304._20_4_ =
                 fStack_20c * fVar229 +
                 fVar327 * fVar307 + fVar219 * fStack_58c + fVar261 * fStack_5ac;
            auVar304._24_4_ =
                 fStack_208 * fVar252 +
                 fVar293 * fVar308 + fVar221 * fStack_588 + fVar262 * fStack_5a8;
            auVar304._28_4_ = fVar329 + fVar329 + fStack_464 + fVar329;
            auVar341._0_4_ =
                 fVar295 * (float)local_480._0_4_ +
                 fVar263 * (float)local_280._0_4_ + fVar218 * fVar183 + fVar230 * fVar348;
            auVar341._4_4_ =
                 fVar227 * (float)local_480._4_4_ +
                 fVar326 * (float)local_280._4_4_ + fVar333 * fVar197 + fVar243 * fVar353;
            auVar341._8_4_ =
                 fVar328 * fStack_478 + fVar289 * fStack_278 + fVar223 * fVar198 + fVar246 * fVar355
            ;
            auVar341._12_4_ =
                 fVar297 * fStack_474 + fVar291 * fStack_274 + fVar201 * fVar199 + fVar249 * fVar357
            ;
            auVar341._16_4_ =
                 fVar299 * fStack_470 + fVar225 * fStack_270 + fVar217 * fVar183 + fVar253 * fVar348
            ;
            auVar341._20_4_ =
                 fVar229 * fStack_46c + fVar327 * fStack_26c + fVar219 * fVar197 + fVar261 * fVar353
            ;
            auVar341._24_4_ =
                 fVar252 * fStack_468 + fVar293 * fStack_268 + fVar221 * fVar198 + fVar262 * fVar355
            ;
            auVar341._28_4_ = fVar329 + fVar329 + fStack_264 + fVar329;
            auVar260._8_4_ = 0x7fffffff;
            auVar260._0_8_ = 0x7fffffff7fffffff;
            auVar260._12_4_ = 0x7fffffff;
            auVar260._16_4_ = 0x7fffffff;
            auVar260._20_4_ = 0x7fffffff;
            auVar260._24_4_ = 0x7fffffff;
            auVar260._28_4_ = 0x7fffffff;
            auVar120._4_4_ = fStack_67c;
            auVar120._0_4_ = local_680;
            auVar120._8_4_ = fStack_678;
            auVar120._12_4_ = fStack_674;
            auVar120._16_4_ = fStack_670;
            auVar120._20_4_ = fStack_66c;
            auVar120._24_4_ = fStack_668;
            auVar120._28_4_ = fStack_664;
            auVar28 = vandps_avx(auVar120,auVar260);
            auVar122._4_4_ = fStack_5fc;
            auVar122._0_4_ = local_600;
            auVar122._8_4_ = fStack_5f8;
            auVar122._12_4_ = fStack_5f4;
            auVar122._16_4_ = fStack_5f0;
            auVar122._20_4_ = fStack_5ec;
            auVar122._24_4_ = fStack_5e8;
            auVar122._28_4_ = fStack_5e4;
            auVar20 = vandps_avx(auVar122,auVar260);
            auVar20 = vmaxps_avx(auVar28,auVar20);
            auVar28 = vandps_avx(auVar351,auVar260);
            auVar20 = vmaxps_avx(auVar20,auVar28);
            auVar20 = vcmpps_avx(auVar20,local_4a0,1);
            auVar145 = vblendvps_avx(auVar120,auVar258,auVar20);
            auVar152._0_4_ =
                 fVar295 * (float)local_2a0._0_4_ +
                 fVar263 * (float)local_5e0._0_4_ +
                 fVar230 * (float)local_460._0_4_ + (float)local_440._0_4_ * fVar218;
            auVar152._4_4_ =
                 fVar227 * (float)local_2a0._4_4_ +
                 fVar326 * (float)local_5e0._4_4_ +
                 fVar243 * (float)local_460._4_4_ + (float)local_440._4_4_ * fVar333;
            auVar152._8_4_ =
                 fVar328 * fStack_298 +
                 fVar289 * fStack_5d8 + fVar246 * fStack_458 + fStack_438 * fVar223;
            auVar152._12_4_ =
                 fVar297 * fStack_294 +
                 fVar291 * fStack_5d4 + fVar249 * fStack_454 + fStack_434 * fVar201;
            auVar152._16_4_ =
                 fVar299 * fStack_290 +
                 fVar225 * fStack_5d0 + fVar253 * fStack_450 + fStack_430 * fVar217;
            auVar152._20_4_ =
                 fVar229 * fStack_28c +
                 fVar327 * fStack_5cc + fVar261 * fStack_44c + fStack_42c * fVar219;
            auVar152._24_4_ =
                 fVar252 * fStack_288 +
                 fVar293 * fStack_5c8 + fVar262 * fStack_448 + fStack_428 * fVar221;
            auVar152._28_4_ = auVar28._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar146 = vblendvps_avx(auVar122,auVar27,auVar20);
            auVar28 = vandps_avx(auVar304,auVar260);
            auVar20 = vandps_avx(auVar341,auVar260);
            auVar210 = vmaxps_avx(auVar28,auVar20);
            auVar28 = vandps_avx(auVar152,auVar260);
            auVar28 = vmaxps_avx(auVar210,auVar28);
            local_820._0_4_ = auVar126._0_4_;
            local_820._4_4_ = auVar126._4_4_;
            fStack_818 = auVar126._8_4_;
            fStack_814 = auVar126._12_4_;
            fStack_810 = auVar126._16_4_;
            fStack_80c = auVar126._20_4_;
            fStack_808 = auVar126._24_4_;
            auVar20 = vcmpps_avx(auVar28,local_4a0,1);
            auVar28 = vblendvps_avx(auVar304,auVar258,auVar20);
            auVar153._0_4_ =
                 (float)local_2a0._0_4_ * (float)local_820._0_4_ +
                 (float)local_5e0._0_4_ * local_860 +
                 (float)local_440._0_4_ * local_880 +
                 (float)local_460._0_4_ * (float)local_840._0_4_;
            auVar153._4_4_ =
                 (float)local_2a0._4_4_ * (float)local_820._4_4_ +
                 (float)local_5e0._4_4_ * fStack_85c +
                 (float)local_440._4_4_ * (float)auStack_87c._0_4_ +
                 (float)local_460._4_4_ * (float)local_840._4_4_;
            auVar153._8_4_ =
                 fStack_298 * fStack_818 +
                 fStack_5d8 * fStack_858 +
                 fStack_438 * (float)auStack_87c._4_4_ + fStack_458 * (float)uStack_838;
            auVar153._12_4_ =
                 fStack_294 * fStack_814 +
                 fStack_5d4 * fStack_854 + fStack_434 * fStack_874 + fStack_454 * uStack_838._4_4_;
            auVar153._16_4_ =
                 fStack_290 * fStack_810 +
                 fStack_5d0 * fStack_850 + fStack_430 * fStack_870 + fStack_450 * fStack_830;
            auVar153._20_4_ =
                 fStack_28c * fStack_80c +
                 fStack_5cc * fStack_84c + fStack_42c * fStack_86c + fStack_44c * fStack_82c;
            auVar153._24_4_ =
                 fStack_288 * fStack_808 +
                 fStack_5c8 * fStack_848 + fStack_428 * fStack_868 + fStack_448 * fStack_828;
            auVar153._28_4_ = auVar210._28_4_ + uStack_6c8._4_4_ + auVar207._12_4_ + 0.0;
            auVar20 = vblendvps_avx(auVar341,auVar27,auVar20);
            fVar264 = auVar145._0_4_;
            fVar290 = auVar145._4_4_;
            fVar292 = auVar145._8_4_;
            fVar294 = auVar145._12_4_;
            fVar296 = auVar145._16_4_;
            fVar298 = auVar145._20_4_;
            fVar300 = auVar145._24_4_;
            fVar307 = auVar145._28_4_;
            fVar262 = auVar28._0_4_;
            fVar326 = auVar28._4_4_;
            fVar291 = auVar28._8_4_;
            fVar327 = auVar28._12_4_;
            fVar295 = auVar28._16_4_;
            fVar328 = auVar28._20_4_;
            fVar299 = auVar28._24_4_;
            fVar329 = auVar146._0_4_;
            fVar333 = auVar146._4_4_;
            fVar201 = auVar146._8_4_;
            fVar219 = auVar146._12_4_;
            fVar230 = auVar146._16_4_;
            fVar246 = auVar146._20_4_;
            fVar253 = auVar146._24_4_;
            auVar320._0_4_ = fVar329 * fVar329 + fVar264 * fVar264;
            auVar320._4_4_ = fVar333 * fVar333 + fVar290 * fVar290;
            auVar320._8_4_ = fVar201 * fVar201 + fVar292 * fVar292;
            auVar320._12_4_ = fVar219 * fVar219 + fVar294 * fVar294;
            auVar320._16_4_ = fVar230 * fVar230 + fVar296 * fVar296;
            auVar320._20_4_ = fVar246 * fVar246 + fVar298 * fVar298;
            auVar320._24_4_ = fVar253 * fVar253 + fVar300 * fVar300;
            auVar320._28_4_ = auVar258._28_4_ + auVar27._28_4_;
            auVar258 = vrsqrtps_avx(auVar320);
            fVar218 = auVar258._0_4_;
            fVar223 = auVar258._4_4_;
            auVar67._4_4_ = fVar223 * 1.5;
            auVar67._0_4_ = fVar218 * 1.5;
            fVar217 = auVar258._8_4_;
            auVar67._8_4_ = fVar217 * 1.5;
            fVar221 = auVar258._12_4_;
            auVar67._12_4_ = fVar221 * 1.5;
            fVar243 = auVar258._16_4_;
            auVar67._16_4_ = fVar243 * 1.5;
            fVar249 = auVar258._20_4_;
            auVar67._20_4_ = fVar249 * 1.5;
            fVar261 = auVar258._24_4_;
            auVar67._24_4_ = fVar261 * 1.5;
            auVar67._28_4_ = auVar341._28_4_;
            auVar68._4_4_ = fVar223 * fVar223 * fVar223 * auVar320._4_4_ * 0.5;
            auVar68._0_4_ = fVar218 * fVar218 * fVar218 * auVar320._0_4_ * 0.5;
            auVar68._8_4_ = fVar217 * fVar217 * fVar217 * auVar320._8_4_ * 0.5;
            auVar68._12_4_ = fVar221 * fVar221 * fVar221 * auVar320._12_4_ * 0.5;
            auVar68._16_4_ = fVar243 * fVar243 * fVar243 * auVar320._16_4_ * 0.5;
            auVar68._20_4_ = fVar249 * fVar249 * fVar249 * auVar320._20_4_ * 0.5;
            auVar68._24_4_ = fVar261 * fVar261 * fVar261 * auVar320._24_4_ * 0.5;
            auVar68._28_4_ = auVar320._28_4_;
            auVar27 = vsubps_avx(auVar67,auVar68);
            fVar252 = auVar27._0_4_;
            fVar272 = auVar27._4_4_;
            fVar220 = auVar27._8_4_;
            fVar222 = auVar27._12_4_;
            fVar224 = auVar27._16_4_;
            fVar226 = auVar27._20_4_;
            fVar228 = auVar27._24_4_;
            fVar218 = auVar20._0_4_;
            fVar223 = auVar20._4_4_;
            fVar217 = auVar20._8_4_;
            fVar221 = auVar20._12_4_;
            fVar243 = auVar20._16_4_;
            fVar249 = auVar20._20_4_;
            fVar261 = auVar20._24_4_;
            auVar288._0_4_ = fVar218 * fVar218 + fVar262 * fVar262;
            auVar288._4_4_ = fVar223 * fVar223 + fVar326 * fVar326;
            auVar288._8_4_ = fVar217 * fVar217 + fVar291 * fVar291;
            auVar288._12_4_ = fVar221 * fVar221 + fVar327 * fVar327;
            auVar288._16_4_ = fVar243 * fVar243 + fVar295 * fVar295;
            auVar288._20_4_ = fVar249 * fVar249 + fVar328 * fVar328;
            auVar288._24_4_ = fVar261 * fVar261 + fVar299 * fVar299;
            auVar288._28_4_ = auVar258._28_4_ + auVar28._28_4_;
            auVar258 = vrsqrtps_avx(auVar288);
            fVar263 = auVar258._0_4_;
            fVar289 = auVar258._4_4_;
            auVar69._4_4_ = fVar289 * 1.5;
            auVar69._0_4_ = fVar263 * 1.5;
            fVar225 = auVar258._8_4_;
            auVar69._8_4_ = fVar225 * 1.5;
            fVar293 = auVar258._12_4_;
            auVar69._12_4_ = fVar293 * 1.5;
            fVar227 = auVar258._16_4_;
            auVar69._16_4_ = fVar227 * 1.5;
            fVar297 = auVar258._20_4_;
            auVar69._20_4_ = fVar297 * 1.5;
            fVar229 = auVar258._24_4_;
            auVar69._24_4_ = fVar229 * 1.5;
            auVar69._28_4_ = auVar341._28_4_;
            auVar70._4_4_ = fVar289 * fVar289 * fVar289 * auVar288._4_4_ * 0.5;
            auVar70._0_4_ = fVar263 * fVar263 * fVar263 * auVar288._0_4_ * 0.5;
            auVar70._8_4_ = fVar225 * fVar225 * fVar225 * auVar288._8_4_ * 0.5;
            auVar70._12_4_ = fVar293 * fVar293 * fVar293 * auVar288._12_4_ * 0.5;
            auVar70._16_4_ = fVar227 * fVar227 * fVar227 * auVar288._16_4_ * 0.5;
            auVar70._20_4_ = fVar297 * fVar297 * fVar297 * auVar288._20_4_ * 0.5;
            auVar70._24_4_ = fVar229 * fVar229 * fVar229 * auVar288._24_4_ * 0.5;
            auVar70._28_4_ = auVar288._28_4_;
            auVar27 = vsubps_avx(auVar69,auVar70);
            fVar263 = auVar27._0_4_;
            fVar289 = auVar27._4_4_;
            fVar225 = auVar27._8_4_;
            fVar293 = auVar27._12_4_;
            fVar227 = auVar27._16_4_;
            fVar297 = auVar27._20_4_;
            fVar229 = auVar27._24_4_;
            fVar329 = fVar200 * fVar252 * fVar329;
            fVar333 = fVar158 * fVar272 * fVar333;
            auVar71._4_4_ = fVar333;
            auVar71._0_4_ = fVar329;
            fVar201 = fVar159 * fVar220 * fVar201;
            auVar71._8_4_ = fVar201;
            fVar219 = fVar160 * fVar222 * fVar219;
            auVar71._12_4_ = fVar219;
            fVar230 = fVar161 * fVar224 * fVar230;
            auVar71._16_4_ = fVar230;
            fVar246 = fVar162 * fVar226 * fVar246;
            auVar71._20_4_ = fVar246;
            fVar253 = fVar163 * fVar228 * fVar253;
            auVar71._24_4_ = fVar253;
            auVar71._28_4_ = auVar258._28_4_;
            local_820._4_4_ = fVar333 + auVar215._4_4_;
            local_820._0_4_ = fVar329 + auVar215._0_4_;
            fStack_818 = fVar201 + auVar215._8_4_;
            fStack_814 = fVar219 + auVar215._12_4_;
            fStack_810 = fVar230 + auVar215._16_4_;
            fStack_80c = fVar246 + auVar215._20_4_;
            fStack_808 = fVar253 + auVar215._24_4_;
            fStack_804 = auVar258._28_4_ + auVar215._28_4_;
            fVar329 = fVar200 * fVar252 * -fVar264;
            fVar333 = fVar158 * fVar272 * -fVar290;
            auVar72._4_4_ = fVar333;
            auVar72._0_4_ = fVar329;
            fVar201 = fVar159 * fVar220 * -fVar292;
            auVar72._8_4_ = fVar201;
            fVar219 = fVar160 * fVar222 * -fVar294;
            auVar72._12_4_ = fVar219;
            fVar230 = fVar161 * fVar224 * -fVar296;
            auVar72._16_4_ = fVar230;
            fVar246 = fVar162 * fVar226 * -fVar298;
            auVar72._20_4_ = fVar246;
            fVar253 = fVar163 * fVar228 * -fVar300;
            auVar72._24_4_ = fVar253;
            auVar72._28_4_ = -fVar307;
            local_840._4_4_ = auVar195._4_4_ + fVar333;
            local_840._0_4_ = auVar195._0_4_ + fVar329;
            uStack_838._0_4_ = auVar195._8_4_ + fVar201;
            uStack_838._4_4_ = auVar195._12_4_ + fVar219;
            fStack_830 = auVar195._16_4_ + fVar230;
            fStack_82c = auVar195._20_4_ + fVar246;
            fStack_828 = auVar195._24_4_ + fVar253;
            fStack_824 = auVar195._28_4_ + -fVar307;
            fVar329 = fVar252 * 0.0 * fVar200;
            fVar333 = fVar272 * 0.0 * fVar158;
            auVar73._4_4_ = fVar333;
            auVar73._0_4_ = fVar329;
            fVar201 = fVar220 * 0.0 * fVar159;
            auVar73._8_4_ = fVar201;
            fVar219 = fVar222 * 0.0 * fVar160;
            auVar73._12_4_ = fVar219;
            fVar230 = fVar224 * 0.0 * fVar161;
            auVar73._16_4_ = fVar230;
            fVar246 = fVar226 * 0.0 * fVar162;
            auVar73._20_4_ = fVar246;
            fVar253 = fVar228 * 0.0 * fVar163;
            auVar73._24_4_ = fVar253;
            auVar73._28_4_ = fVar307;
            auVar210 = vsubps_avx(auVar215,auVar71);
            auVar370._0_4_ = fVar329 + auVar153._0_4_;
            auVar370._4_4_ = fVar333 + auVar153._4_4_;
            auVar370._8_4_ = fVar201 + auVar153._8_4_;
            auVar370._12_4_ = fVar219 + auVar153._12_4_;
            auVar370._16_4_ = fVar230 + auVar153._16_4_;
            auVar370._20_4_ = fVar246 + auVar153._20_4_;
            auVar370._24_4_ = fVar253 + auVar153._24_4_;
            auVar370._28_4_ = fVar307 + auVar153._28_4_;
            fVar329 = auVar281._0_4_ * fVar263 * fVar218;
            fVar218 = auVar281._4_4_ * fVar289 * fVar223;
            auVar74._4_4_ = fVar218;
            auVar74._0_4_ = fVar329;
            fVar333 = auVar281._8_4_ * fVar225 * fVar217;
            auVar74._8_4_ = fVar333;
            fVar223 = auVar281._12_4_ * fVar293 * fVar221;
            auVar74._12_4_ = fVar223;
            fVar201 = auVar281._16_4_ * fVar227 * fVar243;
            auVar74._16_4_ = fVar201;
            fVar217 = auVar281._20_4_ * fVar297 * fVar249;
            auVar74._20_4_ = fVar217;
            fVar219 = auVar281._24_4_ * fVar229 * fVar261;
            auVar74._24_4_ = fVar219;
            auVar74._28_4_ = fVar164;
            auVar318 = vsubps_avx(auVar195,auVar72);
            auVar352._0_4_ = auVar340._0_4_ + fVar329;
            auVar352._4_4_ = auVar340._4_4_ + fVar218;
            auVar352._8_4_ = auVar340._8_4_ + fVar333;
            auVar352._12_4_ = auVar340._12_4_ + fVar223;
            auVar352._16_4_ = auVar340._16_4_ + fVar201;
            auVar352._20_4_ = auVar340._20_4_ + fVar217;
            auVar352._24_4_ = auVar340._24_4_ + fVar219;
            auVar352._28_4_ = auVar340._28_4_ + fVar164;
            fVar329 = fVar263 * -fVar262 * auVar281._0_4_;
            fVar218 = fVar289 * -fVar326 * auVar281._4_4_;
            auVar75._4_4_ = fVar218;
            auVar75._0_4_ = fVar329;
            fVar333 = fVar225 * -fVar291 * auVar281._8_4_;
            auVar75._8_4_ = fVar333;
            fVar223 = fVar293 * -fVar327 * auVar281._12_4_;
            auVar75._12_4_ = fVar223;
            fVar201 = fVar227 * -fVar295 * auVar281._16_4_;
            auVar75._16_4_ = fVar201;
            fVar217 = fVar297 * -fVar328 * auVar281._20_4_;
            auVar75._20_4_ = fVar217;
            fVar219 = fVar229 * -fVar299 * auVar281._24_4_;
            auVar75._24_4_ = fVar219;
            auVar75._28_4_ = auVar215._28_4_;
            auVar29 = vsubps_avx(auVar153,auVar73);
            auVar240._0_4_ = auVar259._0_4_ + fVar329;
            auVar240._4_4_ = auVar259._4_4_ + fVar218;
            auVar240._8_4_ = auVar259._8_4_ + fVar333;
            auVar240._12_4_ = auVar259._12_4_ + fVar223;
            auVar240._16_4_ = auVar259._16_4_ + fVar201;
            auVar240._20_4_ = auVar259._20_4_ + fVar217;
            auVar240._24_4_ = auVar259._24_4_ + fVar219;
            auVar240._28_4_ = auVar259._28_4_ + auVar215._28_4_;
            fVar329 = fVar263 * 0.0 * auVar281._0_4_;
            fVar218 = fVar289 * 0.0 * auVar281._4_4_;
            auVar76._4_4_ = fVar218;
            auVar76._0_4_ = fVar329;
            fVar333 = fVar225 * 0.0 * auVar281._8_4_;
            auVar76._8_4_ = fVar333;
            fVar223 = fVar293 * 0.0 * auVar281._12_4_;
            auVar76._12_4_ = fVar223;
            fVar201 = fVar227 * 0.0 * auVar281._16_4_;
            auVar76._16_4_ = fVar201;
            fVar217 = fVar297 * 0.0 * auVar281._20_4_;
            auVar76._20_4_ = fVar217;
            fVar219 = fVar229 * 0.0 * auVar281._24_4_;
            auVar76._24_4_ = fVar219;
            auVar76._28_4_ = auVar153._28_4_;
            auVar258 = vsubps_avx(auVar340,auVar74);
            auVar305._0_4_ = (float)local_6e0._0_4_ + fVar329;
            auVar305._4_4_ = (float)local_6e0._4_4_ + fVar218;
            auVar305._8_4_ = (float)uStack_6d8 + fVar333;
            auVar305._12_4_ = uStack_6d8._4_4_ + fVar223;
            auVar305._16_4_ = (float)auStack_6d0._0_4_ + fVar201;
            auVar305._20_4_ = (float)auStack_6d0._4_4_ + fVar217;
            auVar305._24_4_ = (float)uStack_6c8 + fVar219;
            auVar305._28_4_ = uStack_6c8._4_4_ + auVar153._28_4_;
            auVar28 = vsubps_avx(auVar259,auVar75);
            auVar20 = vsubps_avx(_local_6e0,auVar76);
            auVar145 = vsubps_avx(auVar240,auVar318);
            auVar146 = vsubps_avx(auVar305,auVar29);
            auVar77._4_4_ = auVar29._4_4_ * auVar145._4_4_;
            auVar77._0_4_ = auVar29._0_4_ * auVar145._0_4_;
            auVar77._8_4_ = auVar29._8_4_ * auVar145._8_4_;
            auVar77._12_4_ = auVar29._12_4_ * auVar145._12_4_;
            auVar77._16_4_ = auVar29._16_4_ * auVar145._16_4_;
            auVar77._20_4_ = auVar29._20_4_ * auVar145._20_4_;
            auVar77._24_4_ = auVar29._24_4_ * auVar145._24_4_;
            auVar77._28_4_ = auVar341._28_4_;
            auVar78._4_4_ = auVar318._4_4_ * auVar146._4_4_;
            auVar78._0_4_ = auVar318._0_4_ * auVar146._0_4_;
            auVar78._8_4_ = auVar318._8_4_ * auVar146._8_4_;
            auVar78._12_4_ = auVar318._12_4_ * auVar146._12_4_;
            auVar78._16_4_ = auVar318._16_4_ * auVar146._16_4_;
            auVar78._20_4_ = auVar318._20_4_ * auVar146._20_4_;
            auVar78._24_4_ = auVar318._24_4_ * auVar146._24_4_;
            auVar78._28_4_ = auVar259._28_4_;
            auVar211 = vsubps_avx(auVar78,auVar77);
            auVar79._4_4_ = auVar210._4_4_ * auVar146._4_4_;
            auVar79._0_4_ = auVar210._0_4_ * auVar146._0_4_;
            auVar79._8_4_ = auVar210._8_4_ * auVar146._8_4_;
            auVar79._12_4_ = auVar210._12_4_ * auVar146._12_4_;
            auVar79._16_4_ = auVar210._16_4_ * auVar146._16_4_;
            auVar79._20_4_ = auVar210._20_4_ * auVar146._20_4_;
            auVar79._24_4_ = auVar210._24_4_ * auVar146._24_4_;
            auVar79._28_4_ = auVar146._28_4_;
            auVar146 = vsubps_avx(auVar352,auVar210);
            auVar80._4_4_ = auVar29._4_4_ * auVar146._4_4_;
            auVar80._0_4_ = auVar29._0_4_ * auVar146._0_4_;
            auVar80._8_4_ = auVar29._8_4_ * auVar146._8_4_;
            auVar80._12_4_ = auVar29._12_4_ * auVar146._12_4_;
            auVar80._16_4_ = auVar29._16_4_ * auVar146._16_4_;
            auVar80._20_4_ = auVar29._20_4_ * auVar146._20_4_;
            auVar80._24_4_ = auVar29._24_4_ * auVar146._24_4_;
            auVar80._28_4_ = auVar27._28_4_;
            auVar287 = vsubps_avx(auVar80,auVar79);
            auVar81._4_4_ = auVar318._4_4_ * auVar146._4_4_;
            auVar81._0_4_ = auVar318._0_4_ * auVar146._0_4_;
            auVar81._8_4_ = auVar318._8_4_ * auVar146._8_4_;
            auVar81._12_4_ = auVar318._12_4_ * auVar146._12_4_;
            auVar81._16_4_ = auVar318._16_4_ * auVar146._16_4_;
            auVar81._20_4_ = auVar318._20_4_ * auVar146._20_4_;
            auVar81._24_4_ = auVar318._24_4_ * auVar146._24_4_;
            auVar81._28_4_ = auVar27._28_4_;
            auVar82._4_4_ = auVar210._4_4_ * auVar145._4_4_;
            auVar82._0_4_ = auVar210._0_4_ * auVar145._0_4_;
            auVar82._8_4_ = auVar210._8_4_ * auVar145._8_4_;
            auVar82._12_4_ = auVar210._12_4_ * auVar145._12_4_;
            auVar82._16_4_ = auVar210._16_4_ * auVar145._16_4_;
            auVar82._20_4_ = auVar210._20_4_ * auVar145._20_4_;
            auVar82._24_4_ = auVar210._24_4_ * auVar145._24_4_;
            auVar82._28_4_ = auVar145._28_4_;
            auVar27 = vsubps_avx(auVar82,auVar81);
            auVar175._0_4_ = auVar211._0_4_ * 0.0 + auVar27._0_4_ + auVar287._0_4_ * 0.0;
            auVar175._4_4_ = auVar211._4_4_ * 0.0 + auVar27._4_4_ + auVar287._4_4_ * 0.0;
            auVar175._8_4_ = auVar211._8_4_ * 0.0 + auVar27._8_4_ + auVar287._8_4_ * 0.0;
            auVar175._12_4_ = auVar211._12_4_ * 0.0 + auVar27._12_4_ + auVar287._12_4_ * 0.0;
            auVar175._16_4_ = auVar211._16_4_ * 0.0 + auVar27._16_4_ + auVar287._16_4_ * 0.0;
            auVar175._20_4_ = auVar211._20_4_ * 0.0 + auVar27._20_4_ + auVar287._20_4_ * 0.0;
            auVar175._24_4_ = auVar211._24_4_ * 0.0 + auVar27._24_4_ + auVar287._24_4_ * 0.0;
            auVar175._28_4_ = auVar211._28_4_ + auVar27._28_4_ + auVar287._28_4_;
            auVar302 = vcmpps_avx(auVar175,ZEXT832(0) << 0x20,2);
            auVar258 = vblendvps_avx(auVar258,_local_820,auVar302);
            auVar216 = ZEXT3264(auVar258);
            auVar27 = vblendvps_avx(auVar28,_local_840,auVar302);
            auVar28 = vblendvps_avx(auVar20,auVar370,auVar302);
            auVar20 = vblendvps_avx(auVar210,auVar352,auVar302);
            auVar145 = vblendvps_avx(auVar318,auVar240,auVar302);
            auVar146 = vblendvps_avx(auVar29,auVar305,auVar302);
            auVar210 = vblendvps_avx(auVar352,auVar210,auVar302);
            auVar211 = vblendvps_avx(auVar240,auVar318,auVar302);
            auVar287 = vblendvps_avx(auVar305,auVar29,auVar302);
            auVar177 = vandps_avx(auVar177,auVar174);
            auVar210 = vsubps_avx(auVar210,auVar258);
            auVar30 = vsubps_avx(auVar211,auVar27);
            auVar287 = vsubps_avx(auVar287,auVar28);
            auVar31 = vsubps_avx(auVar27,auVar145);
            fVar329 = auVar30._0_4_;
            fVar273 = auVar28._0_4_;
            fVar221 = auVar30._4_4_;
            fVar282 = auVar28._4_4_;
            auVar83._4_4_ = fVar282 * fVar221;
            auVar83._0_4_ = fVar273 * fVar329;
            fVar262 = auVar30._8_4_;
            fVar283 = auVar28._8_4_;
            auVar83._8_4_ = fVar283 * fVar262;
            fVar293 = auVar30._12_4_;
            fVar284 = auVar28._12_4_;
            auVar83._12_4_ = fVar284 * fVar293;
            fVar252 = auVar30._16_4_;
            fVar165 = auVar28._16_4_;
            auVar83._16_4_ = fVar165 * fVar252;
            fVar264 = auVar30._20_4_;
            fVar180 = auVar28._20_4_;
            auVar83._20_4_ = fVar180 * fVar264;
            fVar307 = auVar30._24_4_;
            fVar181 = auVar28._24_4_;
            auVar83._24_4_ = fVar181 * fVar307;
            auVar83._28_4_ = auVar211._28_4_;
            fVar218 = auVar27._0_4_;
            fVar182 = auVar287._0_4_;
            fVar230 = auVar27._4_4_;
            fVar231 = auVar287._4_4_;
            auVar84._4_4_ = fVar231 * fVar230;
            auVar84._0_4_ = fVar182 * fVar218;
            fVar263 = auVar27._8_4_;
            fVar244 = auVar287._8_4_;
            auVar84._8_4_ = fVar244 * fVar263;
            fVar295 = auVar27._12_4_;
            fVar247 = auVar287._12_4_;
            auVar84._12_4_ = fVar247 * fVar295;
            fVar272 = auVar27._16_4_;
            fVar250 = auVar287._16_4_;
            auVar84._16_4_ = fVar250 * fVar272;
            fVar290 = auVar27._20_4_;
            fVar312 = auVar287._20_4_;
            auVar84._20_4_ = fVar312 * fVar290;
            fVar308 = auVar27._24_4_;
            fVar314 = auVar287._24_4_;
            uVar10 = auVar318._28_4_;
            auVar84._24_4_ = fVar314 * fVar308;
            auVar84._28_4_ = uVar10;
            auVar211 = vsubps_avx(auVar84,auVar83);
            fVar333 = auVar258._0_4_;
            fVar243 = auVar258._4_4_;
            auVar85._4_4_ = fVar231 * fVar243;
            auVar85._0_4_ = fVar182 * fVar333;
            fVar326 = auVar258._8_4_;
            auVar85._8_4_ = fVar244 * fVar326;
            fVar227 = auVar258._12_4_;
            auVar85._12_4_ = fVar247 * fVar227;
            fVar220 = auVar258._16_4_;
            auVar85._16_4_ = fVar250 * fVar220;
            fVar292 = auVar258._20_4_;
            auVar85._20_4_ = fVar312 * fVar292;
            fVar309 = auVar258._24_4_;
            auVar85._24_4_ = fVar314 * fVar309;
            auVar85._28_4_ = uVar10;
            fVar223 = auVar210._0_4_;
            fVar246 = auVar210._4_4_;
            auVar86._4_4_ = fVar282 * fVar246;
            auVar86._0_4_ = fVar273 * fVar223;
            fVar289 = auVar210._8_4_;
            auVar86._8_4_ = fVar283 * fVar289;
            fVar328 = auVar210._12_4_;
            auVar86._12_4_ = fVar284 * fVar328;
            fVar222 = auVar210._16_4_;
            auVar86._16_4_ = fVar165 * fVar222;
            fVar294 = auVar210._20_4_;
            auVar86._20_4_ = fVar180 * fVar294;
            fVar310 = auVar210._24_4_;
            auVar86._24_4_ = fVar181 * fVar310;
            auVar86._28_4_ = auVar352._28_4_;
            auVar318 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = fVar230 * fVar246;
            auVar87._0_4_ = fVar218 * fVar223;
            auVar87._8_4_ = fVar263 * fVar289;
            auVar87._12_4_ = fVar295 * fVar328;
            auVar87._16_4_ = fVar272 * fVar222;
            auVar87._20_4_ = fVar290 * fVar294;
            auVar87._24_4_ = fVar308 * fVar310;
            auVar87._28_4_ = uVar10;
            auVar88._4_4_ = fVar243 * fVar221;
            auVar88._0_4_ = fVar333 * fVar329;
            auVar88._8_4_ = fVar326 * fVar262;
            auVar88._12_4_ = fVar227 * fVar293;
            auVar88._16_4_ = fVar220 * fVar252;
            auVar88._20_4_ = fVar292 * fVar264;
            auVar88._24_4_ = fVar309 * fVar307;
            auVar88._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar88,auVar87);
            auVar32 = vsubps_avx(auVar28,auVar146);
            fVar217 = auVar29._28_4_ + auVar318._28_4_;
            auVar321._0_4_ = auVar29._0_4_ + auVar318._0_4_ * 0.0 + auVar211._0_4_ * 0.0;
            auVar321._4_4_ = auVar29._4_4_ + auVar318._4_4_ * 0.0 + auVar211._4_4_ * 0.0;
            auVar321._8_4_ = auVar29._8_4_ + auVar318._8_4_ * 0.0 + auVar211._8_4_ * 0.0;
            auVar321._12_4_ = auVar29._12_4_ + auVar318._12_4_ * 0.0 + auVar211._12_4_ * 0.0;
            auVar321._16_4_ = auVar29._16_4_ + auVar318._16_4_ * 0.0 + auVar211._16_4_ * 0.0;
            auVar321._20_4_ = auVar29._20_4_ + auVar318._20_4_ * 0.0 + auVar211._20_4_ * 0.0;
            auVar321._24_4_ = auVar29._24_4_ + auVar318._24_4_ * 0.0 + auVar211._24_4_ * 0.0;
            auVar321._28_4_ = fVar217 + auVar211._28_4_;
            fVar201 = auVar31._0_4_;
            fVar249 = auVar31._4_4_;
            auVar89._4_4_ = auVar146._4_4_ * fVar249;
            auVar89._0_4_ = auVar146._0_4_ * fVar201;
            fVar291 = auVar31._8_4_;
            auVar89._8_4_ = auVar146._8_4_ * fVar291;
            fVar297 = auVar31._12_4_;
            auVar89._12_4_ = auVar146._12_4_ * fVar297;
            fVar224 = auVar31._16_4_;
            auVar89._16_4_ = auVar146._16_4_ * fVar224;
            fVar296 = auVar31._20_4_;
            auVar89._20_4_ = auVar146._20_4_ * fVar296;
            fVar311 = auVar31._24_4_;
            auVar89._24_4_ = auVar146._24_4_ * fVar311;
            auVar89._28_4_ = fVar217;
            fVar217 = auVar32._0_4_;
            fVar253 = auVar32._4_4_;
            auVar90._4_4_ = auVar145._4_4_ * fVar253;
            auVar90._0_4_ = auVar145._0_4_ * fVar217;
            fVar225 = auVar32._8_4_;
            auVar90._8_4_ = auVar145._8_4_ * fVar225;
            fVar299 = auVar32._12_4_;
            auVar90._12_4_ = auVar145._12_4_ * fVar299;
            fVar226 = auVar32._16_4_;
            auVar90._16_4_ = auVar145._16_4_ * fVar226;
            fVar298 = auVar32._20_4_;
            auVar90._20_4_ = auVar145._20_4_ * fVar298;
            fVar313 = auVar32._24_4_;
            auVar90._24_4_ = auVar145._24_4_ * fVar313;
            auVar90._28_4_ = auVar29._28_4_;
            auVar318 = vsubps_avx(auVar90,auVar89);
            auVar29 = vsubps_avx(auVar258,auVar20);
            fVar219 = auVar29._0_4_;
            fVar261 = auVar29._4_4_;
            auVar91._4_4_ = auVar146._4_4_ * fVar261;
            auVar91._0_4_ = auVar146._0_4_ * fVar219;
            fVar327 = auVar29._8_4_;
            auVar91._8_4_ = auVar146._8_4_ * fVar327;
            fVar229 = auVar29._12_4_;
            auVar91._12_4_ = auVar146._12_4_ * fVar229;
            fVar228 = auVar29._16_4_;
            auVar91._16_4_ = auVar146._16_4_ * fVar228;
            fVar300 = auVar29._20_4_;
            auVar91._20_4_ = auVar146._20_4_ * fVar300;
            fVar361 = auVar29._24_4_;
            auVar91._24_4_ = auVar146._24_4_ * fVar361;
            auVar91._28_4_ = auVar146._28_4_;
            auVar92._4_4_ = fVar253 * auVar20._4_4_;
            auVar92._0_4_ = fVar217 * auVar20._0_4_;
            auVar92._8_4_ = fVar225 * auVar20._8_4_;
            auVar92._12_4_ = fVar299 * auVar20._12_4_;
            auVar92._16_4_ = fVar226 * auVar20._16_4_;
            auVar92._20_4_ = fVar298 * auVar20._20_4_;
            auVar92._24_4_ = fVar313 * auVar20._24_4_;
            auVar92._28_4_ = auVar211._28_4_;
            auVar146 = vsubps_avx(auVar91,auVar92);
            auVar93._4_4_ = auVar145._4_4_ * fVar261;
            auVar93._0_4_ = auVar145._0_4_ * fVar219;
            auVar93._8_4_ = auVar145._8_4_ * fVar327;
            auVar93._12_4_ = auVar145._12_4_ * fVar229;
            auVar93._16_4_ = auVar145._16_4_ * fVar228;
            auVar93._20_4_ = auVar145._20_4_ * fVar300;
            auVar93._24_4_ = auVar145._24_4_ * fVar361;
            auVar93._28_4_ = auVar145._28_4_;
            auVar94._4_4_ = fVar249 * auVar20._4_4_;
            auVar94._0_4_ = fVar201 * auVar20._0_4_;
            auVar94._8_4_ = fVar291 * auVar20._8_4_;
            auVar94._12_4_ = fVar297 * auVar20._12_4_;
            auVar94._16_4_ = fVar224 * auVar20._16_4_;
            auVar94._20_4_ = fVar296 * auVar20._20_4_;
            auVar94._24_4_ = fVar311 * auVar20._24_4_;
            auVar94._28_4_ = auVar20._28_4_;
            auVar20 = vsubps_avx(auVar94,auVar93);
            auVar154._0_4_ = auVar318._0_4_ * 0.0 + auVar20._0_4_ + auVar146._0_4_ * 0.0;
            auVar154._4_4_ = auVar318._4_4_ * 0.0 + auVar20._4_4_ + auVar146._4_4_ * 0.0;
            auVar154._8_4_ = auVar318._8_4_ * 0.0 + auVar20._8_4_ + auVar146._8_4_ * 0.0;
            auVar154._12_4_ = auVar318._12_4_ * 0.0 + auVar20._12_4_ + auVar146._12_4_ * 0.0;
            auVar154._16_4_ = auVar318._16_4_ * 0.0 + auVar20._16_4_ + auVar146._16_4_ * 0.0;
            auVar154._20_4_ = auVar318._20_4_ * 0.0 + auVar20._20_4_ + auVar146._20_4_ * 0.0;
            auVar154._24_4_ = auVar318._24_4_ * 0.0 + auVar20._24_4_ + auVar146._24_4_ * 0.0;
            auVar154._28_4_ = auVar146._28_4_ + auVar20._28_4_ + auVar146._28_4_;
            auVar157 = ZEXT3264(auVar154);
            auVar20 = vmaxps_avx(auVar321,auVar154);
            auVar20 = vcmpps_avx(auVar20,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar145 = auVar177 & auVar20;
            if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar145 >> 0x7f,0) == '\0') &&
                  (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar145 >> 0xbf,0) == '\0') &&
                (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar145[0x1f]) {
LAB_01088b22:
              auVar179 = ZEXT3264(CONCAT824(uStack_608,
                                            CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
              auVar242 = ZEXT3264(auVar239);
              auVar343._4_4_ = fVar158;
              auVar343._0_4_ = fVar200;
              auVar343._8_4_ = fVar159;
              auVar343._12_4_ = fVar160;
              auVar343._16_4_ = fVar161;
              auVar343._20_4_ = fVar162;
              auVar343._24_4_ = fVar163;
              auVar343._28_4_ = fVar164;
            }
            else {
              auVar145 = vandps_avx(auVar20,auVar177);
              auVar95._4_4_ = fVar253 * fVar221;
              auVar95._0_4_ = fVar217 * fVar329;
              auVar95._8_4_ = fVar225 * fVar262;
              auVar95._12_4_ = fVar299 * fVar293;
              auVar95._16_4_ = fVar226 * fVar252;
              auVar95._20_4_ = fVar298 * fVar264;
              auVar95._24_4_ = fVar313 * fVar307;
              auVar95._28_4_ = auVar177._28_4_;
              auVar96._4_4_ = fVar249 * fVar231;
              auVar96._0_4_ = fVar201 * fVar182;
              auVar96._8_4_ = fVar291 * fVar244;
              auVar96._12_4_ = fVar297 * fVar247;
              auVar96._16_4_ = fVar224 * fVar250;
              auVar96._20_4_ = fVar296 * fVar312;
              auVar96._24_4_ = fVar311 * fVar314;
              auVar96._28_4_ = auVar20._28_4_;
              auVar20 = vsubps_avx(auVar96,auVar95);
              auVar97._4_4_ = fVar261 * fVar231;
              auVar97._0_4_ = fVar219 * fVar182;
              auVar97._8_4_ = fVar327 * fVar244;
              auVar97._12_4_ = fVar229 * fVar247;
              auVar97._16_4_ = fVar228 * fVar250;
              auVar97._20_4_ = fVar300 * fVar312;
              auVar97._24_4_ = fVar361 * fVar314;
              auVar97._28_4_ = auVar287._28_4_;
              auVar98._4_4_ = fVar253 * fVar246;
              auVar98._0_4_ = fVar217 * fVar223;
              auVar98._8_4_ = fVar225 * fVar289;
              auVar98._12_4_ = fVar299 * fVar328;
              auVar98._16_4_ = fVar226 * fVar222;
              auVar98._20_4_ = fVar298 * fVar294;
              auVar98._24_4_ = fVar313 * fVar310;
              auVar98._28_4_ = auVar32._28_4_;
              auVar146 = vsubps_avx(auVar98,auVar97);
              auVar99._4_4_ = fVar249 * fVar246;
              auVar99._0_4_ = fVar201 * fVar223;
              auVar99._8_4_ = fVar291 * fVar289;
              auVar99._12_4_ = fVar297 * fVar328;
              auVar99._16_4_ = fVar224 * fVar222;
              auVar99._20_4_ = fVar296 * fVar294;
              auVar99._24_4_ = fVar311 * fVar310;
              auVar99._28_4_ = auVar210._28_4_;
              auVar100._4_4_ = fVar261 * fVar221;
              auVar100._0_4_ = fVar219 * fVar329;
              auVar100._8_4_ = fVar327 * fVar262;
              auVar100._12_4_ = fVar229 * fVar293;
              auVar100._16_4_ = fVar228 * fVar252;
              auVar100._20_4_ = fVar300 * fVar264;
              auVar100._24_4_ = fVar361 * fVar307;
              auVar100._28_4_ = auVar30._28_4_;
              auVar211 = vsubps_avx(auVar100,auVar99);
              auVar176._0_4_ = auVar20._0_4_ * 0.0 + auVar211._0_4_ + auVar146._0_4_ * 0.0;
              auVar176._4_4_ = auVar20._4_4_ * 0.0 + auVar211._4_4_ + auVar146._4_4_ * 0.0;
              auVar176._8_4_ = auVar20._8_4_ * 0.0 + auVar211._8_4_ + auVar146._8_4_ * 0.0;
              auVar176._12_4_ = auVar20._12_4_ * 0.0 + auVar211._12_4_ + auVar146._12_4_ * 0.0;
              auVar176._16_4_ = auVar20._16_4_ * 0.0 + auVar211._16_4_ + auVar146._16_4_ * 0.0;
              auVar176._20_4_ = auVar20._20_4_ * 0.0 + auVar211._20_4_ + auVar146._20_4_ * 0.0;
              auVar176._24_4_ = auVar20._24_4_ * 0.0 + auVar211._24_4_ + auVar146._24_4_ * 0.0;
              auVar176._28_4_ = auVar30._28_4_ + auVar211._28_4_ + auVar210._28_4_;
              auVar177 = vrcpps_avx(auVar176);
              fVar329 = auVar177._0_4_;
              fVar223 = auVar177._4_4_;
              auVar101._4_4_ = auVar176._4_4_ * fVar223;
              auVar101._0_4_ = auVar176._0_4_ * fVar329;
              fVar201 = auVar177._8_4_;
              auVar101._8_4_ = auVar176._8_4_ * fVar201;
              fVar217 = auVar177._12_4_;
              auVar101._12_4_ = auVar176._12_4_ * fVar217;
              fVar219 = auVar177._16_4_;
              auVar101._16_4_ = auVar176._16_4_ * fVar219;
              fVar221 = auVar177._20_4_;
              auVar101._20_4_ = auVar176._20_4_ * fVar221;
              fVar246 = auVar177._24_4_;
              auVar101._24_4_ = auVar176._24_4_ * fVar246;
              auVar101._28_4_ = auVar32._28_4_;
              auVar342._8_4_ = 0x3f800000;
              auVar342._0_8_ = &DAT_3f8000003f800000;
              auVar342._12_4_ = 0x3f800000;
              auVar342._16_4_ = 0x3f800000;
              auVar342._20_4_ = 0x3f800000;
              auVar342._24_4_ = 0x3f800000;
              auVar342._28_4_ = 0x3f800000;
              auVar177 = vsubps_avx(auVar342,auVar101);
              fVar329 = auVar177._0_4_ * fVar329 + fVar329;
              fVar223 = auVar177._4_4_ * fVar223 + fVar223;
              fVar201 = auVar177._8_4_ * fVar201 + fVar201;
              fVar217 = auVar177._12_4_ * fVar217 + fVar217;
              fVar219 = auVar177._16_4_ * fVar219 + fVar219;
              fVar221 = auVar177._20_4_ * fVar221 + fVar221;
              fVar246 = auVar177._24_4_ * fVar246 + fVar246;
              auVar102._4_4_ =
                   (fVar243 * auVar20._4_4_ + auVar146._4_4_ * fVar230 + auVar211._4_4_ * fVar282) *
                   fVar223;
              auVar102._0_4_ =
                   (fVar333 * auVar20._0_4_ + auVar146._0_4_ * fVar218 + auVar211._0_4_ * fVar273) *
                   fVar329;
              auVar102._8_4_ =
                   (fVar326 * auVar20._8_4_ + auVar146._8_4_ * fVar263 + auVar211._8_4_ * fVar283) *
                   fVar201;
              auVar102._12_4_ =
                   (fVar227 * auVar20._12_4_ + auVar146._12_4_ * fVar295 + auVar211._12_4_ * fVar284
                   ) * fVar217;
              auVar102._16_4_ =
                   (fVar220 * auVar20._16_4_ + auVar146._16_4_ * fVar272 + auVar211._16_4_ * fVar165
                   ) * fVar219;
              auVar102._20_4_ =
                   (fVar292 * auVar20._20_4_ + auVar146._20_4_ * fVar290 + auVar211._20_4_ * fVar180
                   ) * fVar221;
              auVar102._24_4_ =
                   (fVar309 * auVar20._24_4_ + auVar146._24_4_ * fVar308 + auVar211._24_4_ * fVar181
                   ) * fVar246;
              auVar102._28_4_ = auVar258._28_4_ + auVar27._28_4_ + auVar28._28_4_;
              auVar216 = ZEXT3264(auVar102);
              uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar241._4_4_ = uVar10;
              auVar241._0_4_ = uVar10;
              auVar241._8_4_ = uVar10;
              auVar241._12_4_ = uVar10;
              auVar241._16_4_ = uVar10;
              auVar241._20_4_ = uVar10;
              auVar241._24_4_ = uVar10;
              auVar241._28_4_ = uVar10;
              auVar177 = vcmpps_avx(local_c0,auVar102,2);
              auVar258 = vcmpps_avx(auVar102,auVar241,2);
              auVar177 = vandps_avx(auVar177,auVar258);
              auVar258 = auVar145 & auVar177;
              if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar258 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar258 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar258 >> 0x7f,0) == '\0') &&
                    (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar258 >> 0xbf,0) == '\0') &&
                  (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar258[0x1f]) goto LAB_01088b22;
              auVar177 = vandps_avx(auVar145,auVar177);
              auVar258 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar176,4);
              auVar27 = auVar177 & auVar258;
              auVar179 = ZEXT3264(CONCAT824(uStack_608,
                                            CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
              auVar242 = ZEXT3264(auVar239);
              auVar343._4_4_ = fVar158;
              auVar343._0_4_ = fVar200;
              auVar343._8_4_ = fVar159;
              auVar343._12_4_ = fVar160;
              auVar343._16_4_ = fVar161;
              auVar343._20_4_ = fVar162;
              auVar343._24_4_ = fVar163;
              auVar343._28_4_ = fVar164;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar177 = vandps_avx(auVar258,auVar177);
                auVar179 = ZEXT3264(auVar177);
                auVar103._4_4_ = fVar223 * auVar321._4_4_;
                auVar103._0_4_ = fVar329 * auVar321._0_4_;
                auVar103._8_4_ = fVar201 * auVar321._8_4_;
                auVar103._12_4_ = fVar217 * auVar321._12_4_;
                auVar103._16_4_ = fVar219 * auVar321._16_4_;
                auVar103._20_4_ = fVar221 * auVar321._20_4_;
                auVar103._24_4_ = fVar246 * auVar321._24_4_;
                auVar103._28_4_ = auVar306._28_4_;
                auVar104._4_4_ = auVar154._4_4_ * fVar223;
                auVar104._0_4_ = auVar154._0_4_ * fVar329;
                auVar104._8_4_ = auVar154._8_4_ * fVar201;
                auVar104._12_4_ = auVar154._12_4_ * fVar217;
                auVar104._16_4_ = auVar154._16_4_ * fVar219;
                auVar104._20_4_ = auVar154._20_4_ * fVar221;
                auVar104._24_4_ = auVar154._24_4_ * fVar246;
                auVar104._28_4_ = auVar154._28_4_;
                auVar271._8_4_ = 0x3f800000;
                auVar271._0_8_ = &DAT_3f8000003f800000;
                auVar271._12_4_ = 0x3f800000;
                auVar271._16_4_ = 0x3f800000;
                auVar271._20_4_ = 0x3f800000;
                auVar271._24_4_ = 0x3f800000;
                auVar271._28_4_ = 0x3f800000;
                auVar177 = vsubps_avx(auVar271,auVar103);
                local_540 = vblendvps_avx(auVar177,auVar103,auVar302);
                auVar177 = vsubps_avx(auVar271,auVar104);
                _local_4e0 = vblendvps_avx(auVar177,auVar104,auVar302);
                auVar157 = ZEXT3264(_local_4e0);
                auVar242 = ZEXT3264(auVar102);
              }
            }
            auVar332 = ZEXT3264(auVar192);
            auVar177 = auVar179._0_32_;
            if ((((((((auVar177 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar177 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar177 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar177 >> 0x7f,0) == '\0') &&
                  (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar177 >> 0xbf,0) == '\0') &&
                (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar179[0x1f]) {
              auVar344 = ZEXT3264(local_6c0);
            }
            else {
              auVar258 = vsubps_avx(auVar281,auVar343);
              fVar218 = auVar343._0_4_ + local_540._0_4_ * auVar258._0_4_;
              fVar333 = auVar343._4_4_ + local_540._4_4_ * auVar258._4_4_;
              fVar223 = auVar343._8_4_ + local_540._8_4_ * auVar258._8_4_;
              fVar201 = auVar343._12_4_ + local_540._12_4_ * auVar258._12_4_;
              fVar217 = auVar343._16_4_ + local_540._16_4_ * auVar258._16_4_;
              fVar219 = auVar343._20_4_ + local_540._20_4_ * auVar258._20_4_;
              fVar221 = auVar343._24_4_ + local_540._24_4_ * auVar258._24_4_;
              fVar230 = auVar343._28_4_ + auVar258._28_4_;
              fVar329 = *(float *)((long)local_738->ray_space + k * 4 + -0x20);
              auVar105._4_4_ = (fVar333 + fVar333) * fVar329;
              auVar105._0_4_ = (fVar218 + fVar218) * fVar329;
              auVar105._8_4_ = (fVar223 + fVar223) * fVar329;
              auVar105._12_4_ = (fVar201 + fVar201) * fVar329;
              auVar105._16_4_ = (fVar217 + fVar217) * fVar329;
              auVar105._20_4_ = (fVar219 + fVar219) * fVar329;
              auVar105._24_4_ = (fVar221 + fVar221) * fVar329;
              auVar105._28_4_ = fVar230 + fVar230;
              local_6a0 = auVar242._0_32_;
              auVar258 = vcmpps_avx(local_6a0,auVar105,6);
              auVar157 = ZEXT3264(auVar258);
              auVar27 = auVar177 & auVar258;
              auVar344 = ZEXT3264(local_6c0);
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                local_340 = vandps_avx(auVar258,auVar177);
                auVar157 = ZEXT3264(local_340);
                local_4e0._0_4_ = (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0;
                local_4e0._4_4_ = (float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0;
                fStack_4d8 = fStack_4d8 + fStack_4d8 + -1.0;
                fStack_4d4 = fStack_4d4 + fStack_4d4 + -1.0;
                fStack_4d0 = fStack_4d0 + fStack_4d0 + -1.0;
                fStack_4cc = fStack_4cc + fStack_4cc + -1.0;
                fStack_4c8 = fStack_4c8 + fStack_4c8 + -1.0;
                fStack_4c4 = fStack_4c4 + fStack_4c4 + -1.0;
                auVar179 = ZEXT3264(_local_4e0);
                local_390 = local_760;
                uStack_388 = uStack_758;
                local_380 = local_550._0_8_;
                uStack_378 = local_550._8_8_;
                local_370 = local_560._0_8_;
                uStack_368 = local_560._8_8_;
                local_360 = local_570._0_8_;
                uStack_358 = local_570._8_8_;
                pGVar15 = (context->scene->geometries).items[uVar12].ptr;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  pRVar133 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar133 = context->args;
                  if ((pRVar133->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar133 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar133 >> 8),1),
                     pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar170._0_4_ = (float)(int)local_3a0;
                    auVar170._4_8_ = SUB128(ZEXT812(0),4);
                    auVar170._12_4_ = 0;
                    auVar190 = vshufps_avx(auVar170,auVar170,0);
                    local_320[0] = (auVar190._0_4_ + local_540._0_4_ + 0.0) * (float)local_e0._0_4_;
                    local_320[1] = (auVar190._4_4_ + local_540._4_4_ + 1.0) * (float)local_e0._4_4_;
                    local_320[2] = (auVar190._8_4_ + local_540._8_4_ + 2.0) * fStack_d8;
                    local_320[3] = (auVar190._12_4_ + local_540._12_4_ + 3.0) * fStack_d4;
                    fStack_310 = (auVar190._0_4_ + local_540._16_4_ + 4.0) * fStack_d0;
                    fStack_30c = (auVar190._4_4_ + local_540._20_4_ + 5.0) * fStack_cc;
                    fStack_308 = (auVar190._8_4_ + local_540._24_4_ + 6.0) * fStack_c8;
                    fStack_304 = auVar190._12_4_ + (float)local_540._28_4_ + 7.0;
                    auVar179 = ZEXT3264(_local_4e0);
                    local_300 = _local_4e0;
                    local_2e0 = local_6a0;
                    iVar131 = vmovmskps_avx(local_340);
                    local_800 = CONCAT44((int)((ulong)pRVar133 >> 0x20),iVar131);
                    lVar17 = 0;
                    if (local_800 != 0) {
                      for (; (local_800 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                      }
                    }
                    local_8e0 = (uint)lVar17;
                    uStack_8dc = (undefined4)((ulong)lVar17 >> 0x20);
                    local_880._1_3_ = 0;
                    local_880._0_1_ = iVar131 != 0;
                    _auStack_87c = auVar340._4_28_;
                    if (iVar131 != 0) {
                      auStack_6d0 = (undefined1  [8])*local_750;
                      _local_6e0 = *local_748;
                      uStack_6c8 = local_750[1];
                      local_400 = local_540;
                      _local_3e0 = _local_4e0;
                      local_3c0 = local_6a0;
                      local_39c = uVar14;
                      do {
                        auVar258 = _local_880;
                        uVar134 = *(uint *)(ray + k * 4 + 0x100);
                        lVar17 = CONCAT44(uStack_8dc,local_8e0);
                        local_1a0 = local_320[lVar17];
                        local_180 = *(undefined4 *)(local_300 + lVar17 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + lVar17 * 4);
                        fVar218 = 1.0 - local_1a0;
                        fVar329 = local_1a0 * 3.0;
                        auVar190 = ZEXT416((uint)((fVar218 * -2.0 * local_1a0 +
                                                  local_1a0 * local_1a0) * 0.5));
                        auVar190 = vshufps_avx(auVar190,auVar190,0);
                        local_7c0._0_4_ = auVar21._0_4_;
                        local_7c0._4_4_ = auVar21._4_4_;
                        fStack_7b8 = auVar21._8_4_;
                        fStack_7b4 = auVar21._12_4_;
                        auVar207 = ZEXT416((uint)(((fVar218 + fVar218) * (fVar329 + 2.0) +
                                                  fVar218 * fVar218 * -3.0) * 0.5));
                        auVar207 = vshufps_avx(auVar207,auVar207,0);
                        local_8a0._0_4_ = auVar188._0_4_;
                        local_8a0._4_4_ = auVar188._4_4_;
                        uStack_898._0_4_ = auVar188._8_4_;
                        uStack_898._4_4_ = auVar188._12_4_;
                        auVar208 = ZEXT416((uint)(((local_1a0 + local_1a0) * (fVar329 + -5.0) +
                                                  local_1a0 * fVar329) * 0.5));
                        auVar208 = vshufps_avx(auVar208,auVar208,0);
                        local_840._0_4_ = auVar206._0_4_;
                        local_840._4_4_ = auVar206._4_4_;
                        uStack_838._0_4_ = auVar206._8_4_;
                        uStack_838._4_4_ = auVar206._12_4_;
                        local_730.context = context->user;
                        auVar209 = ZEXT416((uint)((local_1a0 * (fVar218 + fVar218) -
                                                  fVar218 * fVar218) * 0.5));
                        auVar209 = vshufps_avx(auVar209,auVar209,0);
                        auVar191._0_4_ =
                             auVar209._0_4_ * (float)local_760._0_4_ +
                             auVar208._0_4_ * (float)local_840._0_4_ +
                             auVar190._0_4_ * (float)local_7c0._0_4_ +
                             auVar207._0_4_ * (float)local_8a0._0_4_;
                        auVar191._4_4_ =
                             auVar209._4_4_ * (float)local_760._4_4_ +
                             auVar208._4_4_ * (float)local_840._4_4_ +
                             auVar190._4_4_ * (float)local_7c0._4_4_ +
                             auVar207._4_4_ * (float)local_8a0._4_4_;
                        auVar191._8_4_ =
                             auVar209._8_4_ * (float)uStack_758 +
                             auVar208._8_4_ * (float)uStack_838 +
                             auVar190._8_4_ * fStack_7b8 + auVar207._8_4_ * (float)uStack_898;
                        auVar191._12_4_ =
                             auVar209._12_4_ * uStack_758._4_4_ +
                             auVar208._12_4_ * uStack_838._4_4_ +
                             auVar190._12_4_ * fStack_7b4 + auVar207._12_4_ * uStack_898._4_4_;
                        local_1f0 = vshufps_avx(auVar191,auVar191,0);
                        local_200[0] = (RTCHitN)local_1f0[0];
                        local_200[1] = (RTCHitN)local_1f0[1];
                        local_200[2] = (RTCHitN)local_1f0[2];
                        local_200[3] = (RTCHitN)local_1f0[3];
                        local_200[4] = (RTCHitN)local_1f0[4];
                        local_200[5] = (RTCHitN)local_1f0[5];
                        local_200[6] = (RTCHitN)local_1f0[6];
                        local_200[7] = (RTCHitN)local_1f0[7];
                        local_200[8] = (RTCHitN)local_1f0[8];
                        local_200[9] = (RTCHitN)local_1f0[9];
                        local_200[10] = (RTCHitN)local_1f0[10];
                        local_200[0xb] = (RTCHitN)local_1f0[0xb];
                        local_200[0xc] = (RTCHitN)local_1f0[0xc];
                        local_200[0xd] = (RTCHitN)local_1f0[0xd];
                        local_200[0xe] = (RTCHitN)local_1f0[0xe];
                        local_200[0xf] = (RTCHitN)local_1f0[0xf];
                        local_1d0 = vshufps_avx(auVar191,auVar191,0x55);
                        auVar216 = ZEXT1664(local_1d0);
                        local_1e0 = local_1d0;
                        local_1b0 = vshufps_avx(auVar191,auVar191,0xaa);
                        local_1c0 = local_1b0;
                        fStack_19c = local_1a0;
                        fStack_198 = local_1a0;
                        fStack_194 = local_1a0;
                        fStack_190 = local_1a0;
                        fStack_18c = local_1a0;
                        fStack_188 = local_1a0;
                        fStack_184 = local_1a0;
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_160 = local_520._0_8_;
                        uStack_158 = local_520._8_8_;
                        uStack_150 = local_520._16_8_;
                        uStack_148 = local_520._24_8_;
                        local_140 = local_500._0_8_;
                        uStack_138 = local_500._8_8_;
                        uStack_130 = local_500._16_8_;
                        uStack_128 = local_500._24_8_;
                        auVar177 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        local_740[1] = auVar177;
                        *local_740 = auVar177;
                        local_120 = (local_730.context)->instID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_100 = (local_730.context)->instPrimID[0];
                        uStack_fc = local_100;
                        uStack_f8 = local_100;
                        uStack_f4 = local_100;
                        uStack_f0 = local_100;
                        uStack_ec = local_100;
                        uStack_e8 = local_100;
                        uStack_e4 = local_100;
                        local_780 = local_6e0;
                        uStack_778 = uStack_6d8;
                        uStack_770 = auStack_6d0;
                        uStack_768 = uStack_6c8;
                        local_730.valid = (int *)&local_780;
                        local_730.geometryUserPtr = pGVar15->userPtr;
                        local_730.hit = local_200;
                        local_730.N = 8;
                        local_730.ray = (RTCRayN *)ray;
                        if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar216 = ZEXT1664(local_1d0);
                          (*pGVar15->occlusionFilterN)(&local_730);
                        }
                        auVar111._8_8_ = uStack_778;
                        auVar111._0_8_ = local_780;
                        auVar190 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar111);
                        auVar115._8_8_ = uStack_768;
                        auVar115._0_8_ = uStack_770;
                        auVar207 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar115);
                        auVar179 = ZEXT1664(auVar207);
                        auVar155._16_16_ = auVar207;
                        auVar155._0_16_ = auVar190;
                        auVar27 = auVar177 & ~auVar155;
                        local_900 = auVar177._0_4_;
                        uStack_8fc = auVar177._4_4_;
                        uStack_8f8 = auVar177._8_4_;
                        uStack_8f4 = auVar177._12_4_;
                        uStack_8f0 = auVar177._16_4_;
                        uStack_8ec = auVar177._20_4_;
                        uStack_8e8 = auVar177._24_4_;
                        uStack_8e4 = auVar177._28_4_;
                        if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar27 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar27 >> 0x7f,0) == '\0') &&
                              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar27 >> 0xbf,0) == '\0') &&
                            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar27[0x1f]) {
                          auVar156._0_4_ = auVar190._0_4_ ^ local_900;
                          auVar156._4_4_ = auVar190._4_4_ ^ uStack_8fc;
                          auVar156._8_4_ = auVar190._8_4_ ^ uStack_8f8;
                          auVar156._12_4_ = auVar190._12_4_ ^ uStack_8f4;
                          auVar156._16_4_ = auVar207._0_4_ ^ uStack_8f0;
                          auVar156._20_4_ = auVar207._4_4_ ^ uStack_8ec;
                          auVar156._24_4_ = auVar207._8_4_ ^ uStack_8e8;
                          auVar156._28_4_ = auVar207._12_4_ ^ uStack_8e4;
                        }
                        else {
                          p_Var18 = context->args->filter;
                          if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar216 = ZEXT1664(auVar216._0_16_);
                            (*p_Var18)(&local_730);
                          }
                          auVar112._8_8_ = uStack_778;
                          auVar112._0_8_ = local_780;
                          auVar190 = vpcmpeqd_avx((undefined1  [16])0x0,auVar112);
                          auVar116._8_8_ = uStack_768;
                          auVar116._0_8_ = uStack_770;
                          auVar207 = vpcmpeqd_avx((undefined1  [16])0x0,auVar116);
                          auVar178._16_16_ = auVar207;
                          auVar178._0_16_ = auVar190;
                          auVar156._0_4_ = auVar190._0_4_ ^ local_900;
                          auVar156._4_4_ = auVar190._4_4_ ^ uStack_8fc;
                          auVar156._8_4_ = auVar190._8_4_ ^ uStack_8f8;
                          auVar156._12_4_ = auVar190._12_4_ ^ uStack_8f4;
                          auVar156._16_4_ = auVar207._0_4_ ^ uStack_8f0;
                          auVar156._20_4_ = auVar207._4_4_ ^ uStack_8ec;
                          auVar156._24_4_ = auVar207._8_4_ ^ uStack_8e8;
                          auVar156._28_4_ = auVar207._12_4_ ^ uStack_8e4;
                          auVar196._8_4_ = 0xff800000;
                          auVar196._0_8_ = 0xff800000ff800000;
                          auVar196._12_4_ = 0xff800000;
                          auVar196._16_4_ = 0xff800000;
                          auVar196._20_4_ = 0xff800000;
                          auVar196._24_4_ = 0xff800000;
                          auVar196._28_4_ = 0xff800000;
                          auVar177 = vblendvps_avx(auVar196,*(undefined1 (*) [32])
                                                             (local_730.ray + 0x100),auVar178);
                          auVar179 = ZEXT3264(auVar177);
                          *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar177;
                        }
                        auVar157 = ZEXT3264(auVar156);
                        if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar156 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar156 >> 0x7f,0) != '\0')
                              || (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar156 >> 0xbf,0) != '\0') ||
                            (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar156[0x1f] < '\0') break;
                        auVar157 = ZEXT464(uVar134);
                        *(uint *)(ray + k * 4 + 0x100) = uVar134;
                        local_800 = local_800 ^ 1L << ((ulong)local_8e0 & 0x3f);
                        lVar17 = 0;
                        if (local_800 != 0) {
                          for (; (local_800 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                          }
                        }
                        local_8e0 = (uint)lVar17;
                        uStack_8dc = (undefined4)((ulong)lVar17 >> 0x20);
                        local_880._1_3_ = 0;
                        local_880._0_1_ = local_800 != 0;
                        _auStack_87c = auVar258._4_28_;
                      } while (local_800 != 0);
                    }
                    pRVar133 = (RTCIntersectArguments *)(ulong)local_880._0_1_;
                    auVar242 = ZEXT3264(local_6a0);
                    auVar344 = ZEXT3264(local_6c0);
                  }
                }
                auVar332 = ZEXT3264(auVar192);
                bVar136 = (bool)(bVar136 | (byte)pRVar133);
              }
            }
          }
          local_6a0 = auVar242._0_32_;
          lVar139 = lVar139 + 8;
          auVar306 = auVar242;
        } while ((int)lVar139 < (int)uVar14);
      }
      if (bVar136 != false) {
        return local_92d;
      }
      uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar143._4_4_ = uVar10;
      auVar143._0_4_ = uVar10;
      auVar143._8_4_ = uVar10;
      auVar143._12_4_ = uVar10;
      auVar190 = vcmpps_avx(local_410,auVar143,2);
      uVar134 = vmovmskps_avx(auVar190);
      uVar130 = uVar130 & uVar130 + 0xf & uVar134;
      local_92d = uVar130 != 0;
    } while (local_92d);
  }
  return local_92d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }